

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 (*pauVar6) [12];
  undefined8 *puVar7;
  ulong *puVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  float *pfVar48;
  float *pfVar49;
  undefined4 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  int iVar54;
  int *piVar55;
  size_t sVar56;
  Layer *pLVar57;
  undefined4 *puVar58;
  undefined1 auVar59 [32];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined8 uVar268;
  undefined8 uVar269;
  undefined8 uVar270;
  undefined8 uVar271;
  undefined8 uVar272;
  undefined8 uVar273;
  undefined8 uVar274;
  undefined1 auVar275 [12];
  undefined1 auVar276 [12];
  undefined1 auVar277 [12];
  undefined1 auVar278 [12];
  undefined1 auVar279 [12];
  undefined1 auVar280 [12];
  undefined1 auVar281 [12];
  undefined1 auVar282 [12];
  Allocator *pAVar283;
  int iVar284;
  int iVar285;
  int iVar286;
  size_t sVar287;
  byte bVar288;
  int iVar289;
  int iVar290;
  void *pvVar291;
  ulong uVar292;
  int iVar293;
  uint uVar294;
  uint uVar295;
  ulong uVar296;
  int iVar297;
  void *pvVar298;
  float *pfVar299;
  ulong uVar300;
  float *pfVar301;
  long lVar302;
  int i_1;
  uint uVar303;
  int iVar304;
  int iVar305;
  long lVar306;
  void *pvVar307;
  long lVar308;
  int j;
  int iVar309;
  ulong uVar310;
  undefined1 (*pauVar311) [16];
  undefined1 (*pauVar312) [32];
  undefined1 (*pauVar313) [16];
  float *pfVar314;
  void *pvVar315;
  void *pvVar316;
  pointer piVar317;
  long lVar318;
  float *pfVar319;
  long lVar320;
  int j_2;
  size_t _elemsize;
  pointer piVar321;
  void *pvVar322;
  float *pfVar323;
  pointer piVar324;
  float *pfVar325;
  pointer piVar326;
  ulong uVar327;
  pointer piVar328;
  bool bVar329;
  float fVar330;
  undefined8 uVar331;
  undefined8 uVar344;
  float fVar343;
  float fVar345;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float fVar346;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [64];
  float fVar347;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar366;
  undefined1 auVar358 [16];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  float fVar367;
  undefined1 auVar362 [32];
  float fVar364;
  float fVar365;
  undefined1 auVar363 [64];
  float fVar368;
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  float fVar383;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  float fVar384;
  float fVar385;
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  float fVar381;
  float fVar382;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  undefined1 in_ZMM2 [64];
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  float fVar411;
  float fVar415;
  undefined1 auVar404 [32];
  float fVar419;
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  float fVar420;
  undefined1 auVar407 [32];
  float fVar412;
  float fVar414;
  float fVar416;
  undefined1 auVar394 [16];
  float fVar421;
  undefined1 auVar408 [32];
  float fVar410;
  float fVar413;
  float fVar417;
  float fVar418;
  undefined1 in_ZMM3 [64];
  undefined1 auVar409 [64];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  float in_register_0000131c;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  undefined1 auVar429 [16];
  float in_register_0000135c;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  undefined1 auVar435 [16];
  float in_register_0000139c;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar452;
  float fVar454;
  float fVar455;
  float fVar456;
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  float fVar451;
  float fVar453;
  float fVar457;
  float fVar458;
  float fVar459;
  float fVar460;
  float fVar461;
  float fVar462;
  float fVar463;
  float fVar464;
  float fVar465;
  float fVar466;
  undefined1 in_ZMM7 [64];
  undefined1 auVar467 [16];
  float in_register_0000141c;
  float fVar468;
  float fVar469;
  float fVar470;
  float fVar471;
  float fVar472;
  float fVar473;
  float fVar474;
  float fVar475;
  float fVar476;
  float fVar477;
  float fVar478;
  float fVar479;
  float fVar480;
  float fVar481;
  float fVar482;
  float fVar483;
  undefined1 in_ZMM9 [64];
  float fVar484;
  float fVar485;
  float fVar486;
  float fVar487;
  undefined8 uVar488;
  float in_register_0000149c;
  float fVar490;
  undefined8 uVar489;
  float fVar491;
  float fVar492;
  float fVar493;
  float in_register_000014dc;
  float fVar494;
  float fVar495;
  float fVar496;
  float in_register_0000151c;
  float fVar497;
  float fVar498;
  float fVar499;
  float in_register_0000155c;
  float fVar500;
  float fVar501;
  float fVar502;
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  float in_register_0000159c;
  float fVar505;
  float fVar506;
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  float fVar511;
  float fVar512;
  float fVar513;
  float fVar514;
  float fVar515;
  undefined8 local_3d8;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  Mat local_368;
  undefined8 local_318;
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  float fStack_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  float fStack_290;
  float fStack_28c;
  undefined8 uStack_288;
  undefined8 uStack_280;
  ulong local_278;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  Option opt_p;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  vector<int,_std::allocator<int>_> _space_ofs;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar289 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar289;
  }
  uVar303 = bottom_blob->c;
  uVar327 = bottom_blob->elemsize;
  iVar289 = bottom_blob->elempack;
  iVar304 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar309 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar293 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar290 = (this->super_ConvolutionDepthWise).dilation_h;
  local_368.cstep = 0;
  local_368.data = (pointer)0x0;
  local_368.refcount._0_4_ = 0;
  local_368.refcount._4_4_ = 0;
  local_368.elemsize._0_4_ = 0;
  local_368.elemsize._4_4_ = 0;
  local_368.elempack = 0;
  local_368.allocator = (Allocator *)0x0;
  local_368.dims = 0;
  local_368.w = 0;
  local_368.h = 0;
  local_368.d = 0;
  local_368.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_368,opt);
  iVar284 = local_368.w;
  iVar297 = -100;
  local_318 = CONCAT44(local_318._4_4_,(float)local_318);
  local_2e8 = (pointer)CONCAT44(local_2e8._4_4_,(float)local_2e8);
  local_298 = CONCAT44(local_298._4_4_,(float)local_298);
  local_268 = CONCAT44(local_268._4_4_,(float)local_268);
  if (((pointer)local_368.data == (pointer)0x0) ||
     (local_318 = CONCAT44(local_318._4_4_,(float)local_318),
     local_2e8 = (pointer)CONCAT44(local_2e8._4_4_,(float)local_2e8),
     local_298 = CONCAT44(local_298._4_4_,(float)local_298),
     local_268 = CONCAT44(local_268._4_4_,(float)local_268),
     (long)local_368.c * local_368.cstep == 0)) goto LAB_003b666a;
  iVar304 = (~((iVar304 + -1) * iVar293) + local_368.w) /
            (this->super_ConvolutionDepthWise).stride_w;
  iVar309 = (~((iVar309 + -1) * iVar290) + local_368.h) /
            (this->super_ConvolutionDepthWise).stride_h;
  uVar295 = (this->super_ConvolutionDepthWise).num_output;
  if (opt->use_packing_layout == true) {
    lVar308 = (ulong)((uVar295 & 3) == 0) * 3 + 1;
    if ((uVar295 & 7) == 0) {
      lVar308 = 8;
    }
  }
  else {
    lVar308 = 1;
  }
  local_298._0_4_ = (float)lVar308;
  local_298._4_4_ = 0.0;
  _elemsize = (uVar327 / (ulong)(long)iVar289) * lVar308;
  local_2c8._0_4_ = iVar304 + 1;
  local_258._0_4_ = iVar309 + 1;
  local_308 = (pointer)(ulong)uVar303;
  Mat::create(top_blob,iVar304 + 1,iVar309 + 1,(int)uVar295 / (int)(float)local_298,_elemsize,
              (int)(float)local_298,opt->blob_allocator);
  fVar347 = (float)local_298;
  sVar287 = local_368.cstep;
  iVar286 = local_368.c;
  iVar285 = local_368.d;
  iVar305 = local_368.h;
  iVar290 = local_368.w;
  pAVar283 = local_368.allocator;
  iVar293 = local_368.elempack;
  pvVar315 = top_blob->data;
  if ((pvVar315 == (void *)0x0) ||
     (local_2e8 = (pointer)top_blob->cstep, (long)top_blob->c * (long)local_2e8 == 0))
  goto LAB_003b666a;
  iVar297 = (this->super_ConvolutionDepthWise).num_output;
  iVar54 = (this->super_ConvolutionDepthWise).group;
  if (iVar54 != iVar297 || iVar289 * (int)(float)local_308 != iVar54) {
LAB_003b4089:
    uVar327 = (long)(iVar289 * (int)(float)local_308) / (long)iVar54;
    uVar310 = (long)iVar297 / (long)iVar54;
    if (opt->use_packing_layout == true) {
      fVar364 = (float)((uint)((uVar327 & 3) == 0) * 3 + 1);
      if ((uVar327 & 7) == 0) {
        fVar364 = 1.12104e-44;
      }
      fVar365 = (float)((uint)((uVar310 & 3) == 0) * 3 + 1);
      if ((uVar310 & 7) == 0) {
        fVar365 = 1.12104e-44;
      }
    }
    else {
      fVar364 = 1.4013e-45;
      fVar365 = fVar364;
    }
    uVar296 = CONCAT44(local_298._4_4_,(float)local_298);
    piVar55 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_368.data;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
    uVar331._4_4_ = local_368.w;
    uVar331._0_4_ = local_368.dims;
    uVar344._4_4_ = local_368.d;
    uVar344._0_4_ = local_368.h;
    if (piVar55 != (int *)0x0) {
      LOCK();
      *piVar55 = *piVar55 + 1;
      UNLOCK();
    }
    local_3d8 = uVar327 & 0xffffffff;
    uVar300 = uVar327;
    if ((int)fVar364 < iVar289) {
      opt_p.lightmode = opt->lightmode;
      opt_p.use_shader_pack8 = opt->use_shader_pack8;
      opt_p.use_subgroup_ops = opt->use_subgroup_ops;
      opt_p.use_reserved_0 = opt->use_reserved_0;
      opt_p.num_threads = opt->num_threads;
      opt_p.workspace_allocator = opt->workspace_allocator;
      opt_p.openmp_blocktime = opt->openmp_blocktime;
      opt_p.use_winograd_convolution = opt->use_winograd_convolution;
      opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_p.use_int8_inference = opt->use_int8_inference;
      opt_p.use_vulkan_compute = opt->use_vulkan_compute;
      opt_p.use_bf16_storage = opt->use_bf16_storage;
      opt_p.use_fp16_packed = opt->use_fp16_packed;
      opt_p.use_fp16_storage = opt->use_fp16_storage;
      opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_p.use_int8_packed = opt->use_int8_packed;
      opt_p.use_int8_storage = opt->use_int8_storage;
      opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_p.use_packing_layout = opt->use_packing_layout;
      opt_p.vulkan_device_index = opt->vulkan_device_index;
      opt_p.use_reserved_1 = opt->use_reserved_1;
      opt_p.use_image_storage = opt->use_image_storage;
      opt_p.use_tensor_storage = opt->use_tensor_storage;
      opt_p.use_reserved_2 = opt->use_reserved_2;
      opt_p.flush_denormals = opt->flush_denormals;
      opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_p.use_shader_local_memory = opt->use_shader_local_memory;
      opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_p.use_fp16_uniform = opt->use_fp16_uniform;
      opt_p.use_int8_uniform = opt->use_int8_uniform;
      opt_p.use_reserved_9 = opt->use_reserved_9;
      opt_p.use_reserved_10 = opt->use_reserved_10;
      opt_p.use_reserved_11 = opt->use_reserved_11;
      opt_p.blob_allocator = opt->workspace_allocator;
      convert_packing(&local_368,(Mat *)&_space_ofs,(int)fVar364,&opt_p);
      if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        uVar300 = uVar327 & 0xffffffff;
        if ((long)iVar286 * sVar287 != 0) goto LAB_003b41f5;
      }
      iVar297 = -100;
    }
    else {
LAB_003b41f5:
      piVar55 = top_blob->refcount;
      opt_p._0_8_ = top_blob->data;
      opt_p.blob_allocator = (Allocator *)top_blob->refcount;
      opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
      opt_p.openmp_blocktime = top_blob->elempack;
      opt_p._32_8_ = top_blob->allocator;
      opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
      opt_p._48_8_ = *(undefined8 *)&top_blob->h;
      opt_p._56_4_ = top_blob->c;
      sVar56 = top_blob->cstep;
      if (piVar55 != (int *)0x0) {
        LOCK();
        *piVar55 = *piVar55 + 1;
        UNLOCK();
      }
      if ((uint)fVar365 < (uint)fVar347) {
        Mat::create((Mat *)&opt_p,local_2c8._0_4_,local_258._0_4_,
                    (this->super_ConvolutionDepthWise).num_output / (int)fVar365,
                    (ulong)(uint)fVar365 * (_elemsize / uVar296),(int)fVar365,
                    opt->workspace_allocator);
        iVar297 = -100;
        if (opt_p._0_8_ != 0) {
          uVar300 = uVar327 & 0xffffffff;
          if ((long)(int)opt_p._56_4_ * sVar56 != 0) goto LAB_003b42d3;
        }
      }
      else {
LAB_003b42d3:
        iVar304 = 0;
        iVar289 = 0;
        lVar308 = 0;
        do {
          if ((this->super_ConvolutionDepthWise).group <= lVar308) {
            if ((uint)fVar365 < (uint)(float)local_298) {
              convert_packing((Mat *)&opt_p,top_blob,(int)(float)local_298,opt);
              iVar297 = -100;
              if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
              break;
            }
            else if ((Mat *)&opt_p != top_blob) {
              if (opt_p.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
                     *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
                UNLOCK();
              }
              piVar55 = top_blob->refcount;
              if (piVar55 != (int *)0x0) {
                LOCK();
                *piVar55 = *piVar55 + -1;
                UNLOCK();
                if (*piVar55 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data = (void *)opt_p._0_8_;
              top_blob->refcount = (int *)opt_p.blob_allocator;
              top_blob->elemsize = (size_t)opt_p.workspace_allocator;
              top_blob->elempack = opt_p.openmp_blocktime;
              top_blob->allocator = (Allocator *)opt_p._32_8_;
              *(undefined8 *)&top_blob->dims = opt_p._40_8_;
              *(undefined8 *)&top_blob->h = opt_p._48_8_;
              top_blob->c = opt_p._56_4_;
              top_blob->cstep = sVar56;
            }
            iVar297 = 0;
            break;
          }
          m.c = (int)uVar300 / (int)fVar364;
          m.data = (void *)((long)(iVar304 / (int)fVar364) * sVar287 *
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
          m.refcount = (int *)0x0;
          m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          m.elempack = iVar293;
          m.allocator = pAVar283;
          m.cstep = ((long)iVar285 *
                     (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage * (long)iVar305 * (long)iVar290
                     + 0xfU & 0xfffffffffffffff0) /
                    (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
          m_1.c = (int)uVar310 / (int)fVar365;
          m_1.data = (void *)((long)(iVar289 / (int)fVar365) * sVar56 *
                              (long)opt_p.workspace_allocator + opt_p._0_8_);
          m_1.refcount = (int *)0x0;
          m_1.elemsize = (size_t)opt_p.workspace_allocator;
          m_1.elempack = opt_p.openmp_blocktime;
          m_1.allocator = (Allocator *)opt_p._32_8_;
          m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                       (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                      0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
          m_1._40_8_ = opt_p._40_8_;
          m_1._48_8_ = opt_p._48_8_;
          pLVar57 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar308];
          opt_g.lightmode = opt->lightmode;
          opt_g.use_shader_pack8 = opt->use_shader_pack8;
          opt_g.use_subgroup_ops = opt->use_subgroup_ops;
          opt_g.use_reserved_0 = opt->use_reserved_0;
          opt_g.num_threads = opt->num_threads;
          opt_g.workspace_allocator = opt->workspace_allocator;
          opt_g.openmp_blocktime = opt->openmp_blocktime;
          opt_g.use_winograd_convolution = opt->use_winograd_convolution;
          opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
          opt_g.use_int8_inference = opt->use_int8_inference;
          opt_g.use_vulkan_compute = opt->use_vulkan_compute;
          opt_g.use_bf16_storage = opt->use_bf16_storage;
          opt_g.use_fp16_packed = opt->use_fp16_packed;
          opt_g.use_fp16_storage = opt->use_fp16_storage;
          opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_g.use_int8_packed = opt->use_int8_packed;
          opt_g.use_int8_storage = opt->use_int8_storage;
          opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_g.use_packing_layout = opt->use_packing_layout;
          opt_g.vulkan_device_index = opt->vulkan_device_index;
          opt_g.use_reserved_1 = opt->use_reserved_1;
          opt_g.use_image_storage = opt->use_image_storage;
          opt_g.use_tensor_storage = opt->use_tensor_storage;
          opt_g.use_reserved_2 = opt->use_reserved_2;
          opt_g.flush_denormals = opt->flush_denormals;
          opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
          opt_g.use_shader_local_memory = opt->use_shader_local_memory;
          opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
          opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
          opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
          opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
          opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          opt_g.use_fp16_uniform = opt->use_fp16_uniform;
          opt_g.use_int8_uniform = opt->use_int8_uniform;
          opt_g.use_reserved_9 = opt->use_reserved_9;
          opt_g.use_reserved_10 = opt->use_reserved_10;
          opt_g.use_reserved_11 = opt->use_reserved_11;
          opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
          m._40_8_ = uVar331;
          m._48_8_ = uVar344;
          iVar297 = (*pLVar57->_vptr_Layer[7])(pLVar57,&m,&m_1,&opt_g);
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (m.refcount != (int *)0x0) {
            LOCK();
            *m.refcount = *m.refcount + -1;
            UNLOCK();
            if (*m.refcount == 0) {
              if (m.allocator == (Allocator *)0x0) {
                free(m.data);
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          lVar308 = lVar308 + 1;
          iVar289 = iVar289 + (int)uVar310;
          iVar304 = iVar304 + (int)uVar327;
          uVar300 = local_3d8;
        } while (iVar297 == 0);
      }
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
          if (opt_p._32_8_ == 0) {
            free((void *)opt_p._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
          }
        }
      }
    }
    local_318 = CONCAT44(local_318._4_4_,(float)local_318);
    local_298 = CONCAT44(local_298._4_4_,(float)local_298);
    local_268 = CONCAT44(local_268._4_4_,(float)local_268);
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      LOCK();
      *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      UNLOCK();
      local_318 = CONCAT44(local_318._4_4_,(float)local_318);
      local_298 = CONCAT44(local_298._4_4_,(float)local_298);
      local_268 = CONCAT44(local_268._4_4_,(float)local_268);
      if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish == 0) {
        if (pAVar283 == (Allocator *)0x0) {
          free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
        else {
          (*pAVar283->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_003b666a;
  }
  if (iVar289 == 1) {
    auVar443._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar443._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar443._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar443._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar443 = vpcmpeqd_avx(auVar443,_DAT_00539f40);
    uVar303 = vmovmskps_avx(auVar443);
    iVar304 = (this->super_ConvolutionDepthWise).stride_w;
    iVar309 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar309 == 1 && (iVar304 == 1 && (uVar303 ^ 0xf) == 0)) {
      lVar306 = (long)local_368.w;
      iVar289 = top_blob->w;
      iVar304 = top_blob->h;
      pvVar322 = (this->super_ConvolutionDepthWise).bias_data.data;
      local_2e8 = (pointer)((long)local_2e8 * top_blob->elemsize);
      pvVar291 = (this->weight_data_tm).data;
      lVar308 = (long)iVar289;
      local_268 = CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) *
                  local_368.cstep;
      local_318 = lVar306 * 2;
      local_2a8 = lVar306 * 3;
      local_298 = (long)local_368.w;
      uVar303 = local_368.c;
      if (local_368.c < 1) {
        uVar303 = 0;
      }
      local_2c8 = (undefined1  [8])CONCAT44(0,uVar303);
      lVar318 = (long)(local_368.w + 2) * 4;
      local_258 = (undefined1  [8])pvVar322;
      piVar321 = (pointer)0x0;
      while (piVar324 = piVar321, piVar324 != (pointer)CONCAT44(0,uVar303)) {
        if (pvVar322 == (void *)0x0) {
          fVar347 = 0.0;
        }
        else {
          fVar347 = *(float *)((long)pvVar322 + (long)piVar324 * 4);
        }
        pvVar307 = (void *)((long)local_2e8 * (long)piVar324 + (long)pvVar315);
        lVar302 = (long)piVar324 * 0x24;
        piVar326 = (pointer)(local_268 * (long)piVar324 + (long)local_368.data);
        piVar321 = piVar326 + local_368.w;
        piVar317 = piVar326 + lVar306 * 2;
        piVar328 = piVar326 + lVar306 * 3;
        pvVar298 = pvVar307;
        for (uVar295 = 0; (int)(uVar295 | 1) < iVar304; uVar295 = uVar295 + 2) {
          lVar320 = 0;
          for (iVar309 = iVar289; 0 < iVar309; iVar309 = iVar309 + -1) {
            auVar348._8_8_ = 0;
            auVar348._0_8_ = *(ulong *)((long)piVar326 + lVar320 + 4);
            auVar443 = vmovlhps_avx(ZEXT416(*(uint *)((long)piVar326 + lVar320)),auVar348);
            auVar443 = vshufps_avx(auVar443,auVar348,0xd8);
            auVar352 = vinsertps_avx(auVar443,ZEXT416((uint)*(float *)((long)piVar321 + lVar320)),
                                     0x30);
            auVar394._8_8_ = 0;
            auVar394._0_8_ = *(ulong *)((long)piVar321 + lVar320 + 4);
            auVar443 = vinsertps_avx(auVar394,ZEXT416(*(uint *)((long)piVar317 + lVar320)),0x20);
            auVar443 = vinsertps_avx(auVar443,ZEXT416(*(uint *)((long)piVar317 + lVar320 + 4)),0x30)
            ;
            pfVar314 = (float *)((long)pvVar291 + lVar302 + 0x10);
            fVar364 = *(float *)((long)pvVar291 + lVar302 + 0x20);
            auVar429._0_4_ = *pfVar314 * auVar443._0_4_;
            auVar429._4_4_ = pfVar314[1] * auVar443._4_4_;
            auVar429._8_4_ = pfVar314[2] * auVar443._8_4_;
            auVar429._12_4_ = pfVar314[3] * auVar443._12_4_;
            auVar504 = vhaddps_avx(auVar429,auVar429);
            auVar443 = *(undefined1 (*) [16])((long)pvVar291 + lVar302);
            auVar504 = vhaddps_avx(auVar504,auVar504);
            auVar369._0_4_ = auVar443._0_4_ * auVar352._0_4_;
            auVar369._4_4_ = auVar443._4_4_ * auVar352._4_4_;
            auVar369._8_4_ = auVar443._8_4_ * auVar352._8_4_;
            auVar369._12_4_ = auVar443._12_4_ * auVar352._12_4_;
            auVar352 = vhaddps_avx(auVar369,auVar369);
            auVar352 = vhaddps_avx(auVar352,auVar352);
            auVar348 = vmovlhps_avx(auVar443,auVar394);
            auVar348 = vshufps_avx(auVar348,auVar394,0xd8);
            auVar369 = vinsertps_avx(auVar348,ZEXT416(*(uint *)((long)piVar317 + lVar320)),0x30);
            auVar422._8_8_ = 0;
            auVar422._0_8_ = *(ulong *)((long)piVar317 + lVar320 + 4);
            auVar348 = vmovhps_avx(auVar422,*(undefined8 *)((long)piVar328 + lVar320));
            fVar365 = *(float *)((long)piVar328 + lVar320 + 8);
            auVar423._0_4_ = auVar348._0_4_ * *pfVar314;
            auVar423._4_4_ = auVar348._4_4_ * pfVar314[1];
            auVar423._8_4_ = auVar348._8_4_ * pfVar314[2];
            auVar423._12_4_ = auVar348._12_4_ * pfVar314[3];
            auVar348 = vhaddps_avx(auVar423,auVar423);
            auVar348 = vhaddps_avx(auVar348,auVar348);
            auVar349._0_4_ = auVar369._0_4_ * *(float *)((long)piVar321 + lVar320);
            auVar349._4_4_ = auVar369._4_4_ * auVar443._4_4_;
            auVar349._8_4_ = auVar369._8_4_ * auVar443._8_4_;
            auVar349._12_4_ = auVar369._12_4_ * auVar443._12_4_;
            auVar443 = vhaddps_avx(auVar349,auVar349);
            auVar443 = vhaddps_avx(auVar443,auVar443);
            *(float *)((long)pvVar298 + lVar320) =
                 auVar504._0_4_ +
                 fVar364 * *(float *)((long)piVar317 + lVar320 + 8) + auVar352._0_4_ + fVar347;
            *(float *)((long)pvVar307 + lVar320 + lVar308 * 4) =
                 auVar348._0_4_ + fVar364 * fVar365 + auVar443._0_4_ + fVar347;
            lVar320 = lVar320 + 4;
          }
          piVar326 = (pointer)((long)piVar326 + lVar320 + lVar318);
          piVar321 = (pointer)((long)piVar321 + lVar320 + lVar318);
          piVar317 = (pointer)((long)piVar317 + lVar320 + lVar318);
          piVar328 = (pointer)((long)piVar328 + lVar320 + lVar318);
          pvVar298 = (void *)((long)pvVar298 + lVar320 + lVar308 * 4);
          pvVar307 = (void *)((long)pvVar307 + lVar320 + lVar308 * 4);
        }
        for (; (int)uVar295 < iVar304; uVar295 = uVar295 + 1) {
          lVar320 = 0;
          for (iVar309 = iVar289; 0 < iVar309; iVar309 = iVar309 + -1) {
            auVar350._8_8_ = 0;
            auVar350._0_8_ = *(ulong *)((long)piVar326 + lVar320);
            auVar443 = vinsertps_avx(auVar350,ZEXT416(*(uint *)((long)piVar326 + lVar320 + 8)),0x20)
            ;
            auVar443 = vinsertps_avx(auVar443,ZEXT416(*(uint *)((long)piVar321 + lVar320)),0x30);
            auVar378._16_8_ = *(undefined8 *)((long)piVar321 + lVar320 + 4);
            auVar378._0_16_ = auVar443;
            auVar378._24_8_ = 0;
            auVar359._16_8_ = *(undefined8 *)((long)piVar317 + lVar320);
            auVar359._0_16_ = auVar443;
            auVar359._24_8_ = 0;
            auVar360 = vshufpd_avx(auVar378,auVar359,2);
            pfVar314 = (float *)((long)pvVar291 + lVar302);
            auVar351._0_4_ = auVar360._0_4_ * *pfVar314;
            auVar351._4_4_ = auVar360._4_4_ * pfVar314[1];
            auVar351._8_4_ = auVar360._8_4_ * pfVar314[2];
            auVar351._12_4_ = auVar360._12_4_ * pfVar314[3];
            auVar59._16_4_ = auVar360._16_4_ * pfVar314[4];
            auVar59._0_16_ = auVar351;
            auVar59._20_4_ = auVar360._20_4_ * pfVar314[5];
            auVar59._24_4_ = auVar360._24_4_ * pfVar314[6];
            auVar59._28_4_ = auVar360._28_4_;
            auVar443 = vhaddps_avx(auVar59._16_16_,auVar351);
            auVar443 = vhaddps_avx(auVar443,auVar443);
            auVar443 = vhaddps_avx(auVar443,auVar443);
            *(float *)((long)pvVar298 + lVar320) =
                 *(float *)((long)pvVar291 + lVar302 + 0x20) *
                 *(float *)((long)piVar317 + lVar320 + 8) + fVar347 + auVar443._0_4_;
            lVar320 = lVar320 + 4;
          }
          piVar326 = (pointer)((long)piVar326 + lVar320 + 8);
          piVar321 = (pointer)((long)piVar321 + lVar320 + 8);
          piVar317 = (pointer)((long)piVar317 + lVar320 + 8);
          pvVar298 = (void *)((long)pvVar298 + lVar320);
        }
        local_308 = piVar324;
        piVar321 = (pointer)((long)piVar324 + 1);
      }
    }
    else {
      if ((iVar309 != 2 || iVar304 != 2) || (char)(uVar303 ^ 0xf) != '\0') goto LAB_003b4089;
      iVar289 = top_blob->w;
      pvVar322 = (this->super_ConvolutionDepthWise).bias_data.data;
      pvVar291 = (this->weight_data_tm).data;
      local_2e8 = (pointer)((long)local_2e8 * top_blob->elemsize);
      local_308 = (pointer)local_368.data;
      local_2c8 = (undefined1  [8])
                  (CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) *
                  local_368.cstep);
      local_298 = (long)local_368.w * 2;
      uVar327 = 0;
      iVar304 = top_blob->h;
      if (top_blob->h < 1) {
        iVar304 = 0;
      }
      uVar310 = (ulong)(uint)local_368.c;
      if (local_368.c < 1) {
        uVar310 = uVar327;
      }
      lVar308 = (long)((local_368.w - iVar289) * 2) * 4;
      for (; uVar327 != uVar310; uVar327 = uVar327 + 1) {
        if (pvVar322 == (void *)0x0) {
          fVar347 = 0.0;
        }
        else {
          fVar347 = *(float *)((long)pvVar322 + uVar327 * 4);
        }
        pfVar314 = (float *)((long)local_2e8 * uVar327 + (long)pvVar315);
        piVar317 = (pointer)((long)local_2c8 * uVar327 + (long)local_368.data);
        piVar321 = piVar317 + local_368.w;
        piVar324 = piVar317 + (long)local_368.w * 2;
        for (iVar309 = 0; iVar309 != iVar304; iVar309 = iVar309 + 1) {
          lVar306 = 0;
          for (iVar293 = iVar289; 0 < iVar293; iVar293 = iVar293 + -1) {
            auVar504._8_8_ = 0;
            auVar504._0_8_ = *(ulong *)((long)piVar317 + lVar306);
            auVar443 = vinsertps_avx(auVar504,ZEXT416(*(uint *)((long)piVar317 + lVar306 + 8)),0x20)
            ;
            auVar443 = vinsertps_avx(auVar443,ZEXT416(*(uint *)((long)piVar321 + lVar306)),0x30);
            auVar379._16_8_ = *(undefined8 *)((long)piVar321 + lVar306 + 4);
            auVar379._0_16_ = auVar443;
            auVar379._24_8_ = 0;
            auVar360._16_8_ = *(undefined8 *)((long)piVar324 + lVar306);
            auVar360._0_16_ = auVar443;
            auVar360._24_8_ = 0;
            auVar360 = vshufpd_avx(auVar379,auVar360,2);
            pfVar319 = (float *)((long)pvVar291 + uVar327 * 0x24);
            auVar352._0_4_ = auVar360._0_4_ * *pfVar319;
            auVar352._4_4_ = auVar360._4_4_ * pfVar319[1];
            auVar352._8_4_ = auVar360._8_4_ * pfVar319[2];
            auVar352._12_4_ = auVar360._12_4_ * pfVar319[3];
            auVar53._16_4_ = auVar360._16_4_ * pfVar319[4];
            auVar53._0_16_ = auVar352;
            auVar53._20_4_ = auVar360._20_4_ * pfVar319[5];
            auVar53._24_4_ = auVar360._24_4_ * pfVar319[6];
            auVar53._28_4_ = auVar360._28_4_;
            auVar443 = vhaddps_avx(auVar53._16_16_,auVar352);
            auVar443 = vhaddps_avx(auVar443,auVar443);
            auVar443 = vhaddps_avx(auVar443,auVar443);
            *pfVar314 = *(float *)((long)pvVar291 + uVar327 * 0x24 + 0x20) *
                        *(float *)((long)piVar324 + lVar306 + 8) + fVar347 + auVar443._0_4_;
            pfVar314 = pfVar314 + 1;
            lVar306 = lVar306 + 8;
          }
          piVar317 = (pointer)((long)piVar317 + lVar306 + lVar308);
          piVar321 = (pointer)((long)piVar321 + lVar306 + lVar308);
          piVar324 = (pointer)((long)piVar324 + lVar306 + lVar308);
        }
      }
    }
LAB_003b5cf8:
    pLVar57 = this->activation;
    if (pLVar57 != (Layer *)0x0) {
      (*pLVar57->_vptr_Layer[9])(pLVar57,top_blob,opt);
    }
  }
  else {
    if (iVar289 != 4) {
      if (iVar289 != 8) goto LAB_003b4089;
      auVar51._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
      auVar51._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
      auVar51._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
      auVar51._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
      auVar342 = ZEXT1664(auVar51);
      auVar443 = vpcmpeqd_avx(auVar51,_DAT_00539f40);
      auVar363 = ZEXT1664(auVar443);
      iVar290 = vmovmskps_avx(auVar443);
      iVar289 = (this->super_ConvolutionDepthWise).stride_w;
      iVar293 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar293 == 1 && (iVar289 == 1 && iVar290 == 0xf)) {
        iVar289 = top_blob->w;
        iVar304 = top_blob->h;
        pvVar315 = (this->super_ConvolutionDepthWise).bias_data.data;
        local_278 = (ulong)(uint)local_368.c;
        if (local_368.c < 1) {
          local_278 = 0;
        }
        local_318 = (long)(iVar289 * 8) * 4;
        lVar308 = (long)(local_368.w * 8 + 0x10) * 4;
        uVar327 = 0;
        while (uVar310 = uVar327, local_268 = CONCAT44(local_268._4_4_,iVar304),
              local_298 = CONCAT44(local_298._4_4_,(float)local_298), uVar310 != local_278) {
          if (pvVar315 == (void *)0x0) {
            fVar347 = 0.0;
            fVar364 = 0.0;
            fVar365 = 0.0;
            fVar366 = 0.0;
            fVar511 = 0.0;
            fVar512 = 0.0;
            fVar513 = 0.0;
            fVar514 = 0.0;
          }
          else {
            pfVar314 = (float *)((long)pvVar315 + uVar310 * 0x20);
            fVar347 = *pfVar314;
            fVar364 = pfVar314[1];
            fVar365 = pfVar314[2];
            fVar366 = pfVar314[3];
            fVar511 = pfVar314[4];
            fVar512 = pfVar314[5];
            fVar513 = pfVar314[6];
            fVar514 = pfVar314[7];
          }
          pvVar316 = (void *)(top_blob->cstep * uVar310 * top_blob->elemsize + (long)top_blob->data)
          ;
          lVar318 = (long)(this->weight_data_tm).w * uVar310 * (this->weight_data_tm).elemsize;
          pvVar291 = (this->weight_data_tm).data;
          pvVar298 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar316);
          piVar324 = (pointer)(local_368.cstep * uVar310 *
                               CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) +
                              (long)local_368.data);
          lVar306 = (long)local_368.w *
                    CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
          piVar321 = (pointer)((long)piVar324 + lVar306);
          pvVar322 = (void *)((long)piVar324 + lVar306 * 2);
          pvVar307 = (void *)(lVar306 * 3 + (long)piVar324);
          for (uVar303 = 0; (int)(uVar303 | 1) < iVar304; uVar303 = uVar303 + 2) {
            lVar306 = 0;
            for (iVar309 = 0; iVar309 + 3 < iVar289; iVar309 = iVar309 + 4) {
              pfVar325 = (float *)((long)piVar324 + lVar306 + 0x20);
              pfVar323 = (float *)((long)piVar324 + lVar306 + 0x40);
              fVar368 = *pfVar323;
              fVar381 = pfVar323[1];
              fVar382 = pfVar323[2];
              fVar383 = pfVar323[3];
              fVar60 = pfVar323[4];
              fVar61 = pfVar323[5];
              fVar62 = pfVar323[6];
              pfVar314 = (float *)((long)piVar324 + lVar306 + 0x60);
              fVar63 = *pfVar314;
              fVar330 = pfVar314[1];
              fVar343 = pfVar314[2];
              fVar64 = pfVar314[3];
              fVar65 = pfVar314[4];
              fVar66 = pfVar314[5];
              fVar67 = pfVar314[6];
              fVar68 = pfVar314[7];
              pfVar9 = (float *)((long)piVar324 + lVar306 + 0x80);
              pfVar314 = (float *)((long)pvVar291 + lVar318);
              fVar502 = *pfVar314;
              fVar506 = pfVar314[1];
              fVar515 = pfVar314[2];
              fVar367 = pfVar314[3];
              fVar426 = pfVar314[4];
              fVar427 = pfVar314[5];
              fVar428 = pfVar314[6];
              pfVar301 = (float *)((long)pvVar291 + lVar318 + 0x20);
              fVar500 = *pfVar301;
              fVar501 = pfVar301[1];
              fVar505 = pfVar301[2];
              fVar386 = pfVar301[3];
              fVar491 = pfVar301[4];
              fVar492 = pfVar301[5];
              fVar493 = pfVar301[6];
              pfVar299 = (float *)((long)pvVar291 + lVar318 + 0x40);
              fVar345 = *pfVar299;
              fVar484 = pfVar299[1];
              fVar485 = pfVar299[2];
              fVar486 = pfVar299[3];
              fVar487 = pfVar299[4];
              fVar69 = pfVar299[5];
              fVar70 = pfVar299[6];
              pfVar2 = (float *)((long)pvVar291 + lVar318 + 0x60);
              fVar71 = *pfVar2;
              fVar72 = pfVar2[1];
              fVar73 = pfVar2[2];
              fVar74 = pfVar2[3];
              fVar75 = pfVar2[4];
              fVar76 = pfVar2[5];
              fVar77 = pfVar2[6];
              pfVar319 = (float *)((long)piVar324 + lVar306);
              fStack_2cc = in_register_0000141c + fVar514 + pfVar325[7] + pfVar323[7];
              fVar346 = in_ZMM9._28_4_ + fVar514 + in_register_0000151c + fStack_2cc;
              pfVar10 = (float *)((long)piVar324 + lVar306 + 0xa0);
              fStack_2ac = in_register_000014dc + fVar514 + in_register_0000159c + pfVar323[7];
              pfVar11 = (float *)((long)pvVar291 + lVar318 + 0x80);
              fVar78 = *pfVar11;
              fVar79 = pfVar11[1];
              fVar80 = pfVar11[2];
              fVar81 = pfVar11[3];
              fVar82 = pfVar11[4];
              fVar83 = pfVar11[5];
              fVar84 = pfVar11[6];
              pfVar323 = (float *)((long)piVar321 + lVar306);
              fVar85 = *pfVar323;
              fVar86 = pfVar323[1];
              fVar87 = pfVar323[2];
              fVar88 = pfVar323[3];
              fVar89 = pfVar323[4];
              fVar90 = pfVar323[5];
              fVar91 = pfVar323[6];
              pfVar3 = (float *)((long)piVar321 + lVar306 + 0x20);
              fVar92 = *pfVar3;
              fVar93 = pfVar3[1];
              fVar94 = pfVar3[2];
              fVar95 = pfVar3[3];
              fVar96 = pfVar3[4];
              fVar97 = pfVar3[5];
              fVar98 = pfVar3[6];
              pfVar4 = (float *)((long)piVar321 + lVar306 + 0x40);
              fVar99 = *pfVar4;
              fVar100 = pfVar4[1];
              fVar101 = pfVar4[2];
              fVar102 = pfVar4[3];
              fVar103 = pfVar4[4];
              fVar104 = pfVar4[5];
              fVar105 = pfVar4[6];
              pfVar5 = (float *)((long)piVar321 + lVar306 + 0x60);
              fVar106 = *pfVar5;
              fVar107 = pfVar5[1];
              fVar108 = pfVar5[2];
              fVar109 = pfVar5[3];
              fVar110 = pfVar5[4];
              fVar111 = pfVar5[5];
              fVar112 = pfVar5[6];
              pfVar12 = (float *)((long)piVar321 + lVar306 + 0x80);
              fVar113 = *pfVar12;
              fVar114 = pfVar12[1];
              fVar115 = pfVar12[2];
              fVar116 = pfVar12[3];
              fVar117 = pfVar12[4];
              fVar118 = pfVar12[5];
              fVar430 = pfVar12[6];
              in_register_0000151c = in_register_0000155c + in_register_0000151c;
              fVar494 = pfVar323[7] + fVar514 + in_register_0000151c;
              fVar495 = fVar494 + in_register_0000151c;
              fVar496 = fVar495 + in_register_0000151c;
              local_298._0_4_ = fVar99 * fVar502 + fVar347 + fVar106 * fVar500 + fVar113 * fVar345;
              local_298._4_4_ = fVar100 * fVar506 + fVar364 + fVar107 * fVar501 + fVar114 * fVar484;
              fStack_290 = fVar101 * fVar515 + fVar365 + fVar108 * fVar505 + fVar115 * fVar485;
              fStack_28c = fVar102 * fVar367 + fVar366 + fVar109 * fVar386 + fVar116 * fVar486;
              fVar457 = fVar103 * fVar426 + fVar511 + fVar110 * fVar491 + fVar117 * fVar487;
              fVar460 = fVar104 * fVar427 + fVar512 + fVar111 * fVar492 + fVar118 * fVar69;
              fVar462 = fVar105 * fVar428 + fVar513 + fVar112 * fVar493 + fVar430 * fVar70;
              fVar463 = in_register_0000151c + fVar514 + fVar496;
              uStack_288 = CONCAT44(fVar460,fVar457);
              uStack_280 = CONCAT44(fVar463,fVar462);
              pfVar323 = (float *)((long)piVar321 + lVar306 + 0xa0);
              fVar465 = *pfVar323;
              fVar119 = pfVar323[1];
              fVar120 = pfVar323[2];
              fVar121 = pfVar323[3];
              fVar122 = pfVar323[4];
              fVar123 = pfVar323[5];
              fVar124 = pfVar323[6];
              fVar425 = pfVar301[7] + pfVar299[7];
              pfVar299 = (float *)((long)pvVar291 + lVar318 + 0xa0);
              fVar125 = *pfVar299;
              fVar126 = pfVar299[1];
              fVar127 = pfVar299[2];
              fVar128 = pfVar299[3];
              fVar129 = pfVar299[4];
              fVar130 = pfVar299[5];
              fVar131 = pfVar299[6];
              fVar391 = fVar92 * fVar78 + fVar85 * fVar71 + fVar99 * fVar125 +
                        fVar502 * *pfVar319 + fVar347 + *pfVar325 * fVar500 + fVar368 * fVar345;
              fVar410 = fVar93 * fVar79 + fVar86 * fVar72 + fVar100 * fVar126 +
                        fVar506 * pfVar319[1] + fVar364 + pfVar325[1] * fVar501 + fVar381 * fVar484;
              local_2e8 = (pointer)CONCAT44(fVar410,fVar391);
              fStack_2e0 = fVar94 * fVar80 + fVar87 * fVar73 + fVar101 * fVar127 +
                           fVar515 * pfVar319[2] + fVar365 +
                           pfVar325[2] * fVar505 + fVar382 * fVar485;
              fStack_2dc = fVar95 * fVar81 + fVar88 * fVar74 + fVar102 * fVar128 +
                           fVar367 * pfVar319[3] + fVar366 +
                           pfVar325[3] * fVar386 + fVar383 * fVar486;
              fStack_2d8 = fVar96 * fVar82 + fVar89 * fVar75 + fVar103 * fVar129 +
                           fVar426 * pfVar319[4] + fVar511 +
                           pfVar325[4] * fVar491 + fVar60 * fVar487;
              fStack_2d4 = fVar97 * fVar83 + fVar90 * fVar76 + fVar104 * fVar130 +
                           fVar427 * pfVar319[5] + fVar512 + pfVar325[5] * fVar492 + fVar61 * fVar69
              ;
              fStack_2d0 = fVar98 * fVar84 + fVar91 * fVar77 + fVar105 * fVar131 +
                           fVar428 * pfVar319[6] + fVar513 + pfVar325[6] * fVar493 + fVar62 * fVar70
              ;
              fStack_2cc = in_register_0000141c + fVar514 + fStack_2ac + fVar425 + fStack_2cc;
              fVar392 = fVar92 * fVar71 + fVar99 * fVar78 + fVar106 * fVar125 +
                        *pfVar325 * fVar502 + fVar347 + fVar368 * fVar500 + fVar63 * fVar345;
              fVar411 = fVar93 * fVar72 + fVar100 * fVar79 + fVar107 * fVar126 +
                        pfVar325[1] * fVar506 + fVar364 + fVar381 * fVar501 + fVar330 * fVar484;
              fVar413 = fVar94 * fVar73 + fVar101 * fVar80 + fVar108 * fVar127 +
                        pfVar325[2] * fVar515 + fVar365 + fVar382 * fVar505 + fVar343 * fVar485;
              fVar415 = fVar95 * fVar74 + fVar102 * fVar81 + fVar109 * fVar128 +
                        pfVar325[3] * fVar367 + fVar366 + fVar383 * fVar386 + fVar64 * fVar486;
              fStack_2f8 = fVar96 * fVar75 + fVar103 * fVar82 + fVar110 * fVar129 +
                           pfVar325[4] * fVar426 + fVar511 + fVar60 * fVar491 + fVar65 * fVar487;
              fStack_2f4 = fVar97 * fVar76 + fVar104 * fVar83 + fVar111 * fVar130 +
                           pfVar325[5] * fVar427 + fVar512 + fVar61 * fVar492 + fVar66 * fVar69;
              fStack_2f0 = fVar98 * fVar77 + fVar105 * fVar84 + fVar112 * fVar131 +
                           pfVar325[6] * fVar428 + fVar513 + fVar62 * fVar493 + fVar67 * fVar70;
              fStack_2ec = fVar68 + fStack_2ac + pfVar301[7] + fVar346;
              local_308 = (pointer)CONCAT44(fVar411,fVar392);
              uStack_300 = CONCAT44(fVar415,fVar413);
              local_258._0_4_ =
                   fVar99 * fVar71 + fVar106 * fVar78 + fVar125 * fVar113 +
                   fVar368 * fVar502 + fVar347 + fVar63 * fVar500 + *pfVar9 * fVar345;
              local_258._4_4_ =
                   fVar100 * fVar72 + fVar107 * fVar79 + fVar126 * fVar114 +
                   fVar381 * fVar506 + fVar364 + fVar330 * fVar501 + pfVar9[1] * fVar484;
              fStack_250 = fVar101 * fVar73 + fVar108 * fVar80 + fVar127 * fVar115 +
                           fVar382 * fVar515 + fVar365 + fVar343 * fVar505 + pfVar9[2] * fVar485;
              fStack_24c = fVar102 * fVar74 + fVar109 * fVar81 + fVar128 * fVar116 +
                           fVar383 * fVar367 + fVar366 + fVar64 * fVar386 + pfVar9[3] * fVar486;
              fStack_248 = fVar103 * fVar75 + fVar110 * fVar82 + fVar129 * fVar117 +
                           fVar60 * fVar426 + fVar511 + fVar65 * fVar491 + pfVar9[4] * fVar487;
              fStack_244 = fVar104 * fVar76 + fVar111 * fVar83 + fVar130 * fVar118 +
                           fVar61 * fVar427 + fVar512 + fVar66 * fVar492 + pfVar9[5] * fVar69;
              fStack_240 = fVar105 * fVar77 + fVar112 * fVar84 + fVar131 * fVar430 +
                           fVar62 * fVar428 + fVar513 + fVar67 * fVar493 + pfVar9[6] * fVar70;
              fStack_23c = fStack_2ac + fVar68 + pfVar12[7] +
                           in_register_0000149c + fVar514 + in_register_0000155c + fVar346;
              local_2c8._0_4_ =
                   fVar113 * fVar78 + fVar106 * fVar71 + fVar465 * fVar125 +
                   fVar63 * fVar502 + fVar347 + *pfVar9 * fVar500 + fVar345 * *pfVar10;
              local_2c8._4_4_ =
                   fVar114 * fVar79 + fVar107 * fVar72 + fVar119 * fVar126 +
                   fVar330 * fVar506 + fVar364 + pfVar9[1] * fVar501 + fVar484 * pfVar10[1];
              fStack_2c0 = fVar115 * fVar80 + fVar108 * fVar73 + fVar120 * fVar127 +
                           fVar343 * fVar515 + fVar365 + pfVar9[2] * fVar505 + fVar485 * pfVar10[2];
              fStack_2bc = fVar116 * fVar81 + fVar109 * fVar74 + fVar121 * fVar128 +
                           fVar64 * fVar367 + fVar366 + pfVar9[3] * fVar386 + fVar486 * pfVar10[3];
              fStack_2b8 = fVar117 * fVar82 + fVar110 * fVar75 + fVar122 * fVar129 +
                           fVar65 * fVar426 + fVar511 + pfVar9[4] * fVar491 + fVar487 * pfVar10[4];
              fStack_2b4 = fVar118 * fVar83 + fVar111 * fVar76 + fVar123 * fVar130 +
                           fVar66 * fVar427 + fVar512 + pfVar9[5] * fVar492 + fVar69 * pfVar10[5];
              fStack_2b0 = fVar430 * fVar84 + fVar112 * fVar77 + fVar124 * fVar131 +
                           fVar67 * fVar428 + fVar513 + pfVar9[6] * fVar493 + fVar70 * pfVar10[6];
              fStack_2ac = in_register_0000155c + fVar68 + fStack_23c + fStack_2ac;
              pfVar319 = (float *)((long)pvVar322 + lVar306);
              fVar368 = *pfVar319;
              fVar381 = pfVar319[1];
              fVar382 = pfVar319[2];
              fVar383 = pfVar319[3];
              fVar60 = pfVar319[4];
              fVar61 = pfVar319[5];
              fVar62 = pfVar319[6];
              fVar63 = pfVar319[7];
              pfVar319 = (float *)((long)pvVar322 + lVar306 + 0x20);
              fVar330 = *pfVar319;
              fVar343 = pfVar319[1];
              fVar64 = pfVar319[2];
              fVar65 = pfVar319[3];
              fVar66 = pfVar319[4];
              fVar67 = pfVar319[5];
              fVar68 = pfVar319[6];
              fVar346 = pfVar319[7];
              pfVar319 = (float *)((long)pvVar322 + lVar306 + 0x40);
              fVar132 = *pfVar319;
              fVar133 = pfVar319[1];
              fVar134 = pfVar319[2];
              fVar135 = pfVar319[3];
              fVar136 = pfVar319[4];
              fVar137 = pfVar319[5];
              fVar138 = pfVar319[6];
              fVar497 = pfVar323[7] + pfVar5[7];
              pfVar319 = (float *)((long)pvVar322 + lVar306 + 0x60);
              fVar139 = *pfVar319;
              fVar140 = pfVar319[1];
              fVar141 = pfVar319[2];
              fVar142 = pfVar319[3];
              fVar143 = pfVar319[4];
              fVar144 = pfVar319[5];
              fVar145 = pfVar319[6];
              pfVar319 = (float *)((long)pvVar322 + lVar306 + 0x80);
              fVar146 = *pfVar319;
              fVar147 = pfVar319[1];
              fVar148 = pfVar319[2];
              fVar149 = pfVar319[3];
              fVar437 = pfVar319[4];
              fVar464 = pfVar319[5];
              fVar150 = pfVar319[6];
              pfVar323 = (float *)((long)pvVar291 + lVar318 + 0xc0);
              fVar151 = *pfVar323;
              fVar152 = pfVar323[1];
              fVar153 = pfVar323[2];
              fVar154 = pfVar323[3];
              fVar155 = pfVar323[4];
              fVar156 = pfVar323[5];
              fVar157 = pfVar323[6];
              fVar158 = pfVar323[7];
              pfVar323 = (float *)((long)pvVar291 + lVar318 + 0xe0);
              fVar159 = *pfVar323;
              fVar160 = pfVar323[1];
              fVar161 = pfVar323[2];
              fVar162 = pfVar323[3];
              fVar163 = pfVar323[4];
              fVar164 = pfVar323[5];
              fVar165 = pfVar323[6];
              fVar166 = pfVar323[7];
              fVar496 = fVar496 + fVar63;
              fVar494 = fVar497 + fVar63 + fVar494;
              fVar468 = pfVar5[7] + pfVar4[7] + fVar346;
              fVar469 = fVar330 * fVar71 + fVar132 * fVar78 + fVar139 * fVar125 +
                        fVar99 * fVar500 + fVar106 * fVar345 + fVar92 * fVar502 + fVar347;
              fVar471 = fVar343 * fVar72 + fVar133 * fVar79 + fVar140 * fVar126 +
                        fVar100 * fVar501 + fVar107 * fVar484 + fVar93 * fVar506 + fVar364;
              fVar473 = fVar64 * fVar73 + fVar134 * fVar80 + fVar141 * fVar127 +
                        fVar101 * fVar505 + fVar108 * fVar485 + fVar94 * fVar515 + fVar365;
              fVar475 = fVar65 * fVar74 + fVar135 * fVar81 + fVar142 * fVar128 +
                        fVar102 * fVar386 + fVar109 * fVar486 + fVar95 * fVar367 + fVar366;
              fVar477 = fVar66 * fVar75 + fVar136 * fVar82 + fVar143 * fVar129 +
                        fVar103 * fVar491 + fVar110 * fVar487 + fVar96 * fVar426 + fVar511;
              fVar479 = fVar67 * fVar76 + fVar137 * fVar83 + fVar144 * fVar130 +
                        fVar104 * fVar492 + fVar111 * fVar69 + fVar97 * fVar427 + fVar512;
              fVar481 = fVar68 * fVar77 + fVar138 * fVar84 + fVar145 * fVar131 +
                        fVar105 * fVar493 + fVar112 * fVar70 + fVar98 * fVar428 + fVar513;
              fVar483 = fVar468 + fVar495 + pfVar3[7] + fVar514;
              in_ZMM9 = ZEXT3264(CONCAT428(fVar483,CONCAT424(fVar481,CONCAT420(fVar479,CONCAT416(
                                                  fVar477,CONCAT412(fVar475,CONCAT48(fVar473,
                                                  CONCAT44(fVar471,fVar469))))))));
              fVar463 = fVar468 + pfVar4[7] + fVar463 + fVar463;
              pfVar323 = (float *)((long)pvVar322 + lVar306 + 0xa0);
              fVar468 = *pfVar323;
              fVar495 = pfVar323[1];
              fVar167 = pfVar323[2];
              fVar393 = pfVar323[3];
              fVar412 = pfVar323[4];
              fVar414 = pfVar323[5];
              fVar416 = pfVar323[6];
              fVar497 = fVar497 + pfVar2[7] + pfVar11[7];
              in_register_0000155c = fVar497 + pfVar314[7] + fVar514 + fVar425;
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x100);
              fVar179 = *pfVar314;
              fVar180 = pfVar314[1];
              fVar181 = pfVar314[2];
              fVar385 = pfVar314[3];
              fVar431 = pfVar314[4];
              fVar432 = pfVar314[5];
              fVar433 = pfVar314[6];
              in_register_0000151c = pfVar314[7];
              fVar497 = fVar496 + fVar497;
              in_register_0000149c = fVar497 + fStack_2cc;
              fVar497 = fVar346 + fVar63 + fVar497;
              in_register_0000135c = fVar497 + fStack_2ec;
              fVar497 = fVar346 + fVar63 + fVar497;
              auVar404._0_4_ =
                   fVar139 * fVar159 + fVar132 * fVar151 + fVar146 * fVar179 +
                   (float)local_258._0_4_;
              auVar404._4_4_ =
                   fVar140 * fVar160 + fVar133 * fVar152 + fVar147 * fVar180 +
                   (float)local_258._4_4_;
              auVar404._8_4_ =
                   fVar141 * fVar161 + fVar134 * fVar153 + fVar148 * fVar181 + fStack_250;
              auVar404._12_4_ =
                   fVar142 * fVar162 + fVar135 * fVar154 + fVar149 * fVar385 + fStack_24c;
              auVar404._16_4_ =
                   fVar143 * fVar163 + fVar136 * fVar155 + fVar437 * fVar431 + fStack_248;
              auVar404._20_4_ =
                   fVar144 * fVar164 + fVar137 * fVar156 + fVar464 * fVar432 + fStack_244;
              auVar404._24_4_ =
                   fVar145 * fVar165 + fVar138 * fVar157 + fVar150 * fVar433 + fStack_240;
              auVar404._28_4_ = fVar497 + fStack_23c;
              in_ZMM3 = ZEXT3264(auVar404);
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0x20);
              fVar425 = *pfVar314;
              fVar417 = pfVar314[1];
              fVar418 = pfVar314[2];
              fVar421 = pfVar314[3];
              fVar438 = pfVar314[4];
              fVar440 = pfVar314[5];
              fVar452 = pfVar314[6];
              fVar454 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0x40);
              fVar456 = *pfVar314;
              fVar459 = pfVar314[1];
              fVar461 = pfVar314[2];
              fVar420 = pfVar314[3];
              fVar490 = pfVar314[4];
              fVar499 = pfVar314[5];
              fVar168 = pfVar314[6];
              in_register_0000141c = pfVar314[7];
              pfVar314 = (float *)((long)pvVar307 + lVar306);
              fVar169 = *pfVar314;
              fVar170 = pfVar314[1];
              fVar384 = pfVar314[2];
              fVar419 = pfVar314[3];
              fVar436 = pfVar314[4];
              fVar470 = pfVar314[5];
              fVar472 = pfVar314[6];
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0x60);
              fVar466 = *pfVar314;
              fVar434 = pfVar314[1];
              fVar439 = pfVar314[2];
              fVar451 = pfVar314[3];
              fVar453 = pfVar314[4];
              fVar455 = pfVar314[5];
              fVar458 = pfVar314[6];
              in_register_0000159c = pfVar314[7];
              in_register_000014dc = pfVar319[7] + fVar496;
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0x80);
              fVar474 = *pfVar314;
              fVar476 = pfVar314[1];
              fVar478 = pfVar314[2];
              fVar480 = pfVar314[3];
              fVar482 = pfVar314[4];
              fVar498 = pfVar314[5];
              fVar171 = pfVar314[6];
              in_register_0000139c = fVar463 + in_register_0000141c + pfVar319[7] + fVar494;
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0xa0);
              fVar172 = *pfVar314;
              fVar173 = pfVar314[1];
              fVar174 = pfVar314[2];
              fVar175 = pfVar314[3];
              fVar176 = pfVar314[4];
              fVar177 = pfVar314[5];
              fVar178 = pfVar314[6];
              in_ZMM7 = ZEXT3264(CONCAT428(fVar463,CONCAT424(fVar433 * fVar178,
                                                             CONCAT420(fVar432 * fVar177,
                                                                       CONCAT416(fVar431 * fVar176,
                                                                                 CONCAT412(fVar385 *
                                                                                           fVar175,
                                                  CONCAT48(fVar181 * fVar174,
                                                           CONCAT44(fVar180 * fVar173,
                                                                    fVar179 * fVar172))))))));
              pfVar314 = (float *)((long)pvVar316 + lVar306);
              *pfVar314 = fVar330 * fVar159 + fVar368 * fVar151 + fVar132 * fVar179 + fVar391;
              pfVar314[1] = fVar343 * fVar160 + fVar381 * fVar152 + fVar133 * fVar180 + fVar410;
              pfVar314[2] = fVar64 * fVar161 + fVar382 * fVar153 + fVar134 * fVar181 + fStack_2e0;
              pfVar314[3] = fVar65 * fVar162 + fVar383 * fVar154 + fVar135 * fVar385 + fStack_2dc;
              pfVar314[4] = fVar66 * fVar163 + fVar60 * fVar155 + fVar136 * fVar431 + fStack_2d8;
              pfVar314[5] = fVar67 * fVar164 + fVar61 * fVar156 + fVar137 * fVar432 + fStack_2d4;
              pfVar314[6] = fVar68 * fVar165 + fVar62 * fVar157 + fVar138 * fVar433 + fStack_2d0;
              pfVar314[7] = in_register_0000149c;
              pfVar314 = (float *)((long)pvVar316 + lVar306 + 0x20);
              *pfVar314 = fVar132 * fVar159 + fVar330 * fVar151 + fVar139 * fVar179 + fVar392;
              pfVar314[1] = fVar133 * fVar160 + fVar343 * fVar152 + fVar140 * fVar180 + fVar411;
              pfVar314[2] = fVar134 * fVar161 + fVar64 * fVar153 + fVar141 * fVar181 + fVar413;
              pfVar314[3] = fVar135 * fVar162 + fVar65 * fVar154 + fVar142 * fVar385 + fVar415;
              pfVar314[4] = fVar136 * fVar163 + fVar66 * fVar155 + fVar143 * fVar431 + fStack_2f8;
              pfVar314[5] = fVar137 * fVar164 + fVar67 * fVar156 + fVar144 * fVar432 + fStack_2f4;
              pfVar314[6] = fVar138 * fVar165 + fVar68 * fVar157 + fVar145 * fVar433 + fStack_2f0;
              pfVar314[7] = in_register_0000135c;
              *(undefined1 (*) [32])((long)pvVar316 + lVar306 + 0x40) = auVar404;
              pfVar314 = (float *)((long)pvVar316 + lVar306 + 0x60);
              *pfVar314 = fVar146 * fVar159 + fVar139 * fVar151 + fVar468 * fVar179 +
                          (float)local_2c8._0_4_;
              pfVar314[1] = fVar147 * fVar160 + fVar140 * fVar152 + fVar495 * fVar180 +
                            (float)local_2c8._4_4_;
              pfVar314[2] = fVar148 * fVar161 + fVar141 * fVar153 + fVar167 * fVar181 + fStack_2c0;
              pfVar314[3] = fVar149 * fVar162 + fVar142 * fVar154 + fVar393 * fVar385 + fStack_2bc;
              pfVar314[4] = fVar437 * fVar163 + fVar143 * fVar155 + fVar412 * fVar431 + fStack_2b8;
              pfVar314[5] = fVar464 * fVar164 + fVar144 * fVar156 + fVar414 * fVar432 + fStack_2b4;
              pfVar314[6] = fVar150 * fVar165 + fVar145 * fVar157 + fVar416 * fVar433 + fStack_2b0;
              pfVar314[7] = fVar346 + fVar63 + fVar497 + fStack_2ac;
              pfVar314 = (float *)((long)pvVar298 + lVar306);
              *pfVar314 = fVar151 * fVar169 + fVar425 * fVar159 + fVar456 * fVar179 +
                          fVar368 * fVar71 + fVar330 * fVar78 + fVar132 * fVar125 +
                          fVar85 * fVar502 + fVar347 + fVar92 * fVar500 + fVar99 * fVar345;
              pfVar314[1] = fVar152 * fVar170 + fVar417 * fVar160 + fVar459 * fVar180 +
                            fVar381 * fVar72 + fVar343 * fVar79 + fVar133 * fVar126 +
                            fVar86 * fVar506 + fVar364 + fVar93 * fVar501 + fVar100 * fVar484;
              pfVar314[2] = fVar153 * fVar384 + fVar418 * fVar161 + fVar461 * fVar181 +
                            fVar382 * fVar73 + fVar64 * fVar80 + fVar134 * fVar127 +
                            fVar87 * fVar515 + fVar365 + fVar94 * fVar505 + fVar101 * fVar485;
              pfVar314[3] = fVar154 * fVar419 + fVar421 * fVar162 + fVar420 * fVar385 +
                            fVar383 * fVar74 + fVar65 * fVar81 + fVar135 * fVar128 +
                            fVar88 * fVar367 + fVar366 + fVar95 * fVar386 + fVar102 * fVar486;
              pfVar314[4] = fVar155 * fVar436 + fVar438 * fVar163 + fVar490 * fVar431 +
                            fVar60 * fVar75 + fVar66 * fVar82 + fVar136 * fVar129 +
                            fVar89 * fVar426 + fVar511 + fVar96 * fVar491 + fVar103 * fVar487;
              pfVar314[5] = fVar156 * fVar470 + fVar440 * fVar164 + fVar499 * fVar432 +
                            fVar61 * fVar76 + fVar67 * fVar83 + fVar137 * fVar130 +
                            fVar90 * fVar427 + fVar512 + fVar97 * fVar492 + fVar104 * fVar69;
              pfVar314[6] = fVar157 * fVar472 + fVar452 * fVar165 + fVar168 * fVar433 +
                            fVar62 * fVar77 + fVar68 * fVar84 + fVar138 * fVar131 +
                            fVar91 * fVar428 + fVar513 + fVar98 * fVar493 + fVar105 * fVar70;
              pfVar314[7] = fVar496 + fVar454 + fVar166 + fVar494;
              pfVar314 = (float *)((long)pvVar298 + lVar306 + 0x20);
              *pfVar314 = fVar469 + fVar425 * fVar151 + fVar456 * fVar159 + fVar466 * fVar179;
              pfVar314[1] = fVar471 + fVar417 * fVar152 + fVar459 * fVar160 + fVar434 * fVar180;
              pfVar314[2] = fVar473 + fVar418 * fVar153 + fVar461 * fVar161 + fVar439 * fVar181;
              pfVar314[3] = fVar475 + fVar421 * fVar154 + fVar420 * fVar162 + fVar451 * fVar385;
              pfVar314[4] = fVar477 + fVar438 * fVar155 + fVar490 * fVar163 + fVar453 * fVar431;
              pfVar314[5] = fVar479 + fVar440 * fVar156 + fVar499 * fVar164 + fVar455 * fVar432;
              pfVar314[6] = fVar481 + fVar452 * fVar157 + fVar168 * fVar165 + fVar458 * fVar433;
              pfVar314[7] = fVar483 + in_register_000014dc + fVar496 + fVar454;
              pfVar314 = (float *)((long)pvVar298 + lVar306 + 0x40);
              *pfVar314 = fVar146 * fVar125 + fVar132 * fVar71 + fVar139 * fVar78 + (float)local_298
                          + fVar474 * fVar179 + fVar456 * fVar151 + fVar466 * fVar159;
              pfVar314[1] = fVar147 * fVar126 + fVar133 * fVar72 + fVar140 * fVar79 +
                            local_298._4_4_ +
                            fVar476 * fVar180 + fVar459 * fVar152 + fVar434 * fVar160;
              pfVar314[2] = fVar148 * fVar127 + fVar134 * fVar73 + fVar141 * fVar80 + fStack_290 +
                            fVar478 * fVar181 + fVar461 * fVar153 + fVar439 * fVar161;
              pfVar314[3] = fVar149 * fVar128 + fVar135 * fVar74 + fVar142 * fVar81 + fStack_28c +
                            fVar480 * fVar385 + fVar420 * fVar154 + fVar451 * fVar162;
              pfVar314[4] = fVar437 * fVar129 + fVar136 * fVar75 + fVar143 * fVar82 + fVar457 +
                            fVar482 * fVar431 + fVar490 * fVar155 + fVar453 * fVar163;
              pfVar314[5] = fVar464 * fVar130 + fVar137 * fVar76 + fVar144 * fVar83 + fVar460 +
                            fVar498 * fVar432 + fVar499 * fVar156 + fVar455 * fVar164;
              pfVar314[6] = fVar150 * fVar131 + fVar138 * fVar77 + fVar145 * fVar84 + fVar462 +
                            fVar171 * fVar433 + fVar168 * fVar157 + fVar458 * fVar165;
              pfVar314[7] = in_register_0000139c;
              pfVar314 = (float *)((long)pvVar298 + lVar306 + 0x60);
              *pfVar314 = fVar468 * fVar125 + fVar139 * fVar71 + fVar146 * fVar78 +
                          fVar106 * fVar502 + fVar347 + fVar113 * fVar500 + fVar465 * fVar345 +
                          fVar466 * fVar151 + fVar474 * fVar159 + fVar179 * fVar172;
              pfVar314[1] = fVar495 * fVar126 + fVar140 * fVar72 + fVar147 * fVar79 +
                            fVar107 * fVar506 + fVar364 + fVar114 * fVar501 + fVar119 * fVar484 +
                            fVar434 * fVar152 + fVar476 * fVar160 + fVar180 * fVar173;
              pfVar314[2] = fVar167 * fVar127 + fVar141 * fVar73 + fVar148 * fVar80 +
                            fVar108 * fVar515 + fVar365 + fVar115 * fVar505 + fVar120 * fVar485 +
                            fVar439 * fVar153 + fVar478 * fVar161 + fVar181 * fVar174;
              pfVar314[3] = fVar393 * fVar128 + fVar142 * fVar74 + fVar149 * fVar81 +
                            fVar109 * fVar367 + fVar366 + fVar116 * fVar386 + fVar121 * fVar486 +
                            fVar451 * fVar154 + fVar480 * fVar162 + fVar385 * fVar175;
              pfVar314[4] = fVar412 * fVar129 + fVar143 * fVar75 + fVar437 * fVar82 +
                            fVar110 * fVar426 + fVar511 + fVar117 * fVar491 + fVar122 * fVar487 +
                            fVar453 * fVar155 + fVar482 * fVar163 + fVar431 * fVar176;
              pfVar314[5] = fVar414 * fVar130 + fVar144 * fVar76 + fVar464 * fVar83 +
                            fVar111 * fVar427 + fVar512 + fVar118 * fVar492 + fVar123 * fVar69 +
                            fVar455 * fVar156 + fVar498 * fVar164 + fVar432 * fVar177;
              pfVar314[6] = fVar416 * fVar131 + fVar145 * fVar77 + fVar150 * fVar84 +
                            fVar112 * fVar428 + fVar513 + fVar430 * fVar493 + fVar124 * fVar70 +
                            fVar458 * fVar157 + fVar171 * fVar165 + fVar433 * fVar178;
              pfVar314[7] = in_register_0000155c + fVar158 + fVar166 + fVar463;
              lVar306 = lVar306 + 0x80;
            }
            for (; iVar309 + 1 < iVar289; iVar309 = iVar309 + 2) {
              pfVar325 = (float *)((long)piVar324 + lVar306 + 0x20);
              fVar368 = pfVar325[1];
              fVar381 = pfVar325[2];
              fVar382 = pfVar325[3];
              fVar383 = pfVar325[4];
              fVar60 = pfVar325[5];
              fVar61 = pfVar325[6];
              pfVar301 = (float *)((long)piVar324 + lVar306 + 0x40);
              fVar62 = pfVar301[1];
              fVar63 = pfVar301[2];
              fVar330 = pfVar301[3];
              fVar343 = pfVar301[4];
              fVar64 = pfVar301[5];
              fVar65 = pfVar301[6];
              pfVar314 = (float *)((long)pvVar291 + lVar318);
              fVar66 = *pfVar314;
              fVar67 = pfVar314[1];
              fVar68 = pfVar314[2];
              fVar502 = pfVar314[3];
              fVar506 = pfVar314[4];
              fVar515 = pfVar314[5];
              fVar367 = pfVar314[6];
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0x20);
              fVar426 = *pfVar319;
              fVar427 = pfVar319[1];
              fVar428 = pfVar319[2];
              fVar500 = pfVar319[3];
              fVar501 = pfVar319[4];
              fVar505 = pfVar319[5];
              fVar386 = pfVar319[6];
              fVar491 = pfVar319[7];
              pfVar299 = (float *)((long)pvVar291 + lVar318 + 0x40);
              fVar492 = *pfVar299;
              fVar493 = pfVar299[1];
              fVar345 = pfVar299[2];
              fVar484 = pfVar299[3];
              fVar485 = pfVar299[4];
              fVar486 = pfVar299[5];
              fVar487 = pfVar299[6];
              pfVar319 = (float *)((long)piVar324 + lVar306);
              fVar69 = pfVar319[1];
              fVar70 = pfVar319[2];
              fVar71 = pfVar319[3];
              fVar72 = pfVar319[4];
              fVar73 = pfVar319[5];
              fVar74 = pfVar319[6];
              pfVar2 = (float *)((long)pvVar291 + lVar318 + 0x60);
              fVar75 = *pfVar2;
              fVar76 = pfVar2[1];
              fVar77 = pfVar2[2];
              fVar78 = pfVar2[3];
              fVar79 = pfVar2[4];
              fVar80 = pfVar2[5];
              fVar81 = pfVar2[6];
              fVar436 = fVar514 + in_register_0000139c + pfVar325[7] + pfVar301[7];
              pfVar3 = (float *)((long)piVar324 + lVar306 + 0x60);
              fVar464 = fVar514 + in_ZMM7._28_4_ + in_register_0000141c + pfVar325[7] + pfVar301[7];
              pfVar9 = (float *)((long)pvVar291 + lVar318 + 0x80);
              fVar82 = *pfVar9;
              fVar83 = pfVar9[1];
              fVar84 = pfVar9[2];
              fVar85 = pfVar9[3];
              fVar86 = pfVar9[4];
              fVar87 = pfVar9[5];
              fVar88 = pfVar9[6];
              pfVar323 = (float *)((long)pvVar291 + lVar318 + 0xa0);
              fVar89 = *pfVar323;
              fVar90 = pfVar323[1];
              fVar91 = pfVar323[2];
              fVar92 = pfVar323[3];
              fVar93 = pfVar323[4];
              fVar94 = pfVar323[5];
              fVar95 = pfVar323[6];
              fVar96 = pfVar323[7];
              pfVar323 = (float *)((long)piVar321 + lVar306);
              fVar97 = *pfVar323;
              fVar98 = pfVar323[1];
              fVar99 = pfVar323[2];
              fVar100 = pfVar323[3];
              fVar101 = pfVar323[4];
              fVar102 = pfVar323[5];
              fVar103 = pfVar323[6];
              pfVar4 = (float *)((long)piVar321 + lVar306 + 0x20);
              fVar104 = *pfVar4;
              fVar105 = pfVar4[1];
              fVar106 = pfVar4[2];
              fVar107 = pfVar4[3];
              fVar108 = pfVar4[4];
              fVar109 = pfVar4[5];
              fVar110 = pfVar4[6];
              pfVar5 = (float *)((long)piVar321 + lVar306 + 0x40);
              fVar111 = *pfVar5;
              fVar112 = pfVar5[1];
              fVar113 = pfVar5[2];
              fVar114 = pfVar5[3];
              fVar115 = pfVar5[4];
              fVar116 = pfVar5[5];
              fVar117 = pfVar5[6];
              pfVar5 = (float *)((long)piVar321 + lVar306 + 0x60);
              fVar118 = *pfVar5;
              fVar430 = pfVar5[1];
              fVar465 = pfVar5[2];
              fVar119 = pfVar5[3];
              fVar120 = pfVar5[4];
              fVar121 = pfVar5[5];
              fVar122 = pfVar5[6];
              fVar498 = in_register_0000151c + in_register_0000159c;
              fVar437 = fVar464 + in_register_0000155c + in_register_0000159c + fVar436;
              in_register_0000141c = fVar514 + pfVar314[7] + in_register_0000159c + pfVar299[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0xc0);
              fVar123 = *pfVar314;
              fVar124 = pfVar314[1];
              fVar125 = pfVar314[2];
              fVar126 = pfVar314[3];
              fVar127 = pfVar314[4];
              fVar128 = pfVar314[5];
              fVar129 = pfVar314[6];
              in_register_0000135c = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0xe0);
              fVar130 = *pfVar314;
              fVar131 = pfVar314[1];
              fVar346 = pfVar314[2];
              fVar132 = pfVar314[3];
              fVar133 = pfVar314[4];
              fVar134 = pfVar314[5];
              fVar135 = pfVar314[6];
              fVar136 = pfVar314[7];
              pfVar5 = (float *)((long)pvVar322 + lVar306);
              fVar137 = pfVar5[1];
              fVar138 = pfVar5[2];
              fVar139 = pfVar5[3];
              fVar140 = pfVar5[4];
              fVar141 = pfVar5[5];
              fVar142 = pfVar5[6];
              pfVar314 = (float *)((long)pvVar322 + lVar306 + 0x20);
              fVar143 = *pfVar314;
              fVar144 = pfVar314[1];
              fVar145 = pfVar314[2];
              fVar146 = pfVar314[3];
              fVar147 = pfVar314[4];
              fVar148 = pfVar314[5];
              fVar149 = pfVar314[6];
              pfVar299 = (float *)((long)pvVar322 + lVar306 + 0x40);
              fVar421 = *pfVar299;
              fVar438 = pfVar299[1];
              fVar440 = pfVar299[2];
              fVar452 = pfVar299[3];
              fVar454 = pfVar299[4];
              fVar456 = pfVar299[5];
              fVar459 = pfVar299[6];
              in_register_000014dc = pfVar299[7];
              in_register_0000155c =
                   in_register_0000155c + in_register_0000159c + in_register_0000159c;
              fVar470 = *pfVar5 * fVar75 + fVar143 * fVar82;
              fVar472 = fVar137 * fVar76 + fVar144 * fVar83;
              fVar474 = fVar138 * fVar77 + fVar145 * fVar84;
              fVar476 = fVar139 * fVar78 + fVar146 * fVar85;
              fVar478 = fVar140 * fVar79 + fVar147 * fVar86;
              fVar480 = fVar141 * fVar80 + fVar148 * fVar87;
              fVar482 = fVar142 * fVar81 + fVar149 * fVar88;
              in_ZMM9 = ZEXT3264(CONCAT428(pfVar5[7] + pfVar314[7],
                                           CONCAT424(fVar482,CONCAT420(fVar480,CONCAT416(fVar478,
                                                  CONCAT412(fVar476,CONCAT48(fVar474,CONCAT44(
                                                  fVar472,fVar470))))))));
              pfVar299 = (float *)((long)pvVar291 + lVar318 + 0x100);
              fVar393 = *pfVar299;
              fVar412 = pfVar299[1];
              fVar414 = pfVar299[2];
              fVar416 = pfVar299[3];
              fVar425 = pfVar299[4];
              fVar417 = pfVar299[5];
              fVar418 = pfVar299[6];
              in_register_0000149c = pfVar299[7];
              fVar384 = pfVar2[7] + pfVar9[7];
              fVar419 = fVar498 + in_register_0000159c + pfVar9[7];
              pfVar299 = (float *)((long)pvVar322 + lVar306 + 0x60);
              fVar461 = *pfVar299;
              fVar420 = pfVar299[1];
              fVar490 = pfVar299[2];
              fVar499 = pfVar299[3];
              fVar168 = pfVar299[4];
              fVar169 = pfVar299[5];
              fVar170 = pfVar299[6];
              in_register_0000151c = pfVar299[7];
              auVar405._0_4_ =
                   fVar347 + *pfVar325 * fVar66 + *pfVar301 * fVar426 + fVar492 * *pfVar3 +
                   fVar104 * fVar75 + fVar111 * fVar82 + fVar118 * fVar89 +
                   fVar143 * fVar123 + fVar421 * fVar130 + fVar461 * fVar393;
              auVar405._4_4_ =
                   fVar364 + fVar368 * fVar67 + fVar62 * fVar427 + fVar493 * pfVar3[1] +
                   fVar105 * fVar76 + fVar112 * fVar83 + fVar430 * fVar90 +
                   fVar144 * fVar124 + fVar438 * fVar131 + fVar420 * fVar412;
              auVar405._8_4_ =
                   fVar365 + fVar381 * fVar68 + fVar63 * fVar428 + fVar345 * pfVar3[2] +
                   fVar106 * fVar77 + fVar113 * fVar84 + fVar465 * fVar91 +
                   fVar145 * fVar125 + fVar440 * fVar346 + fVar490 * fVar414;
              auVar405._12_4_ =
                   fVar366 + fVar382 * fVar502 + fVar330 * fVar500 + fVar484 * pfVar3[3] +
                   fVar107 * fVar78 + fVar114 * fVar85 + fVar119 * fVar92 +
                   fVar146 * fVar126 + fVar452 * fVar132 + fVar499 * fVar416;
              auVar405._16_4_ =
                   fVar511 + fVar383 * fVar506 + fVar343 * fVar501 + fVar485 * pfVar3[4] +
                   fVar108 * fVar79 + fVar115 * fVar86 + fVar120 * fVar93 +
                   fVar147 * fVar127 + fVar454 * fVar133 + fVar168 * fVar425;
              auVar405._20_4_ =
                   fVar512 + fVar60 * fVar515 + fVar64 * fVar505 + fVar486 * pfVar3[5] +
                   fVar109 * fVar80 + fVar116 * fVar87 + fVar121 * fVar94 +
                   fVar148 * fVar128 + fVar456 * fVar134 + fVar169 * fVar417;
              auVar405._24_4_ =
                   fVar513 + fVar61 * fVar367 + fVar65 * fVar386 + fVar487 * pfVar3[6] +
                   fVar110 * fVar81 + fVar117 * fVar88 + fVar122 * fVar95 +
                   fVar149 * fVar129 + fVar459 * fVar135 + fVar170 * fVar418;
              auVar405._28_4_ = fVar437 + in_register_0000155c + fVar419;
              in_ZMM3 = ZEXT3264(auVar405);
              in_register_0000139c =
                   pfVar323[7] + fVar514 + pfVar4[7] + fVar464 + pfVar5[7] + pfVar314[7] + fVar437;
              pfVar314 = (float *)((long)pvVar307 + lVar306);
              fVar437 = *pfVar314;
              fVar464 = pfVar314[1];
              fVar150 = pfVar314[2];
              fVar151 = pfVar314[3];
              fVar152 = pfVar314[4];
              fVar153 = pfVar314[5];
              fVar154 = pfVar314[6];
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0x20);
              fVar155 = *pfVar314;
              fVar156 = pfVar314[1];
              fVar157 = pfVar314[2];
              fVar158 = pfVar314[3];
              fVar159 = pfVar314[4];
              fVar160 = pfVar314[5];
              fVar161 = pfVar314[6];
              fVar162 = pfVar314[7];
              auVar360 = *(undefined1 (*) [32])((long)pvVar307 + lVar306 + 0x40);
              in_ZMM7 = ZEXT3264(auVar360);
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0x60);
              fVar163 = *pfVar314;
              fVar164 = pfVar314[1];
              fVar165 = pfVar314[2];
              fVar166 = pfVar314[3];
              fVar468 = pfVar314[4];
              fVar495 = pfVar314[5];
              fVar167 = pfVar314[6];
              pfVar314 = (float *)((long)pvVar316 + lVar306);
              *pfVar314 = fVar347 + fVar66 * *pfVar319 + *pfVar325 * fVar426 + *pfVar301 * fVar492 +
                          fVar97 * fVar75 + fVar104 * fVar82 + fVar111 * fVar89 +
                          *pfVar5 * fVar123 + fVar143 * fVar130 + fVar421 * fVar393;
              pfVar314[1] = fVar364 + fVar67 * fVar69 + fVar368 * fVar427 + fVar62 * fVar493 +
                            fVar98 * fVar76 + fVar105 * fVar83 + fVar112 * fVar90 +
                            fVar137 * fVar124 + fVar144 * fVar131 + fVar438 * fVar412;
              pfVar314[2] = fVar365 + fVar68 * fVar70 + fVar381 * fVar428 + fVar63 * fVar345 +
                            fVar99 * fVar77 + fVar106 * fVar84 + fVar113 * fVar91 +
                            fVar138 * fVar125 + fVar145 * fVar346 + fVar440 * fVar414;
              pfVar314[3] = fVar366 + fVar502 * fVar71 + fVar382 * fVar500 + fVar330 * fVar484 +
                            fVar100 * fVar78 + fVar107 * fVar85 + fVar114 * fVar92 +
                            fVar139 * fVar126 + fVar146 * fVar132 + fVar452 * fVar416;
              pfVar314[4] = fVar511 + fVar506 * fVar72 + fVar383 * fVar501 + fVar343 * fVar485 +
                            fVar101 * fVar79 + fVar108 * fVar86 + fVar115 * fVar93 +
                            fVar140 * fVar127 + fVar147 * fVar133 + fVar454 * fVar425;
              pfVar314[5] = fVar512 + fVar515 * fVar73 + fVar60 * fVar505 + fVar64 * fVar486 +
                            fVar102 * fVar80 + fVar109 * fVar87 + fVar116 * fVar94 +
                            fVar141 * fVar128 + fVar148 * fVar134 + fVar456 * fVar417;
              pfVar314[6] = fVar513 + fVar367 * fVar74 + fVar61 * fVar386 + fVar65 * fVar487 +
                            fVar103 * fVar81 + fVar110 * fVar88 + fVar117 * fVar95 +
                            fVar142 * fVar129 + fVar149 * fVar135 + fVar459 * fVar418;
              pfVar314[7] = fVar436 + fVar498 + fVar491 + fVar419;
              *(undefined1 (*) [32])((long)pvVar316 + lVar306 + 0x20) = auVar405;
              pfVar314 = (float *)((long)pvVar298 + lVar306);
              *pfVar314 = fVar97 * fVar66 + fVar347 + fVar104 * fVar426 + fVar111 * fVar492 +
                          fVar470 + fVar421 * fVar89 +
                          fVar123 * fVar437 + fVar155 * fVar130 + fVar393 * auVar360._0_4_;
              pfVar314[1] = fVar98 * fVar67 + fVar364 + fVar105 * fVar427 + fVar112 * fVar493 +
                            fVar472 + fVar438 * fVar90 +
                            fVar124 * fVar464 + fVar156 * fVar131 + fVar412 * auVar360._4_4_;
              pfVar314[2] = fVar99 * fVar68 + fVar365 + fVar106 * fVar428 + fVar113 * fVar345 +
                            fVar474 + fVar440 * fVar91 +
                            fVar125 * fVar150 + fVar157 * fVar346 + fVar414 * auVar360._8_4_;
              pfVar314[3] = fVar100 * fVar502 + fVar366 + fVar107 * fVar500 + fVar114 * fVar484 +
                            fVar476 + fVar452 * fVar92 +
                            fVar126 * fVar151 + fVar158 * fVar132 + fVar416 * auVar360._12_4_;
              pfVar314[4] = fVar101 * fVar506 + fVar511 + fVar108 * fVar501 + fVar115 * fVar485 +
                            fVar478 + fVar454 * fVar93 +
                            fVar127 * fVar152 + fVar159 * fVar133 + fVar425 * auVar360._16_4_;
              pfVar314[5] = fVar102 * fVar515 + fVar512 + fVar109 * fVar505 + fVar116 * fVar486 +
                            fVar480 + fVar456 * fVar94 +
                            fVar128 * fVar153 + fVar160 * fVar134 + fVar417 * auVar360._20_4_;
              pfVar314[6] = fVar103 * fVar367 + fVar513 + fVar110 * fVar386 + fVar117 * fVar487 +
                            fVar482 + fVar459 * fVar95 +
                            fVar129 * fVar154 + fVar161 * fVar135 + fVar418 * auVar360._24_4_;
              pfVar314[7] = in_register_0000139c + fVar384 + fVar162 + in_register_0000135c;
              pfVar314 = (float *)((long)pvVar298 + lVar306 + 0x20);
              *pfVar314 = fVar347 + fVar104 * fVar66 + fVar111 * fVar426 + fVar118 * fVar492 +
                          fVar143 * fVar75 + fVar421 * fVar82 + fVar461 * fVar89 +
                          fVar155 * fVar123 + auVar360._0_4_ * fVar130 + fVar393 * fVar163;
              pfVar314[1] = fVar364 + fVar105 * fVar67 + fVar112 * fVar427 + fVar430 * fVar493 +
                            fVar144 * fVar76 + fVar438 * fVar83 + fVar420 * fVar90 +
                            fVar156 * fVar124 + auVar360._4_4_ * fVar131 + fVar412 * fVar164;
              pfVar314[2] = fVar365 + fVar106 * fVar68 + fVar113 * fVar428 + fVar465 * fVar345 +
                            fVar145 * fVar77 + fVar440 * fVar84 + fVar490 * fVar91 +
                            fVar157 * fVar125 + auVar360._8_4_ * fVar346 + fVar414 * fVar165;
              pfVar314[3] = fVar366 + fVar107 * fVar502 + fVar114 * fVar500 + fVar119 * fVar484 +
                            fVar146 * fVar78 + fVar452 * fVar85 + fVar499 * fVar92 +
                            fVar158 * fVar126 + auVar360._12_4_ * fVar132 + fVar416 * fVar166;
              pfVar314[4] = fVar511 + fVar108 * fVar506 + fVar115 * fVar501 + fVar120 * fVar485 +
                            fVar147 * fVar79 + fVar454 * fVar86 + fVar168 * fVar93 +
                            fVar159 * fVar127 + auVar360._16_4_ * fVar133 + fVar425 * fVar468;
              pfVar314[5] = fVar512 + fVar109 * fVar515 + fVar116 * fVar505 + fVar121 * fVar486 +
                            fVar148 * fVar80 + fVar456 * fVar87 + fVar169 * fVar94 +
                            fVar160 * fVar128 + auVar360._20_4_ * fVar134 + fVar417 * fVar495;
              pfVar314[6] = fVar513 + fVar110 * fVar367 + fVar117 * fVar386 + fVar122 * fVar487 +
                            fVar149 * fVar81 + fVar459 * fVar88 + fVar170 * fVar95 +
                            fVar161 * fVar129 + auVar360._24_4_ * fVar135 + fVar418 * fVar167;
              pfVar314[7] = in_register_0000141c + fVar384 + fVar96 +
                            in_register_0000135c + fVar136 + in_register_0000135c;
              lVar306 = lVar306 + 0x40;
            }
            for (; iVar309 < iVar289; iVar309 = iVar309 + 1) {
              pfVar314 = (float *)((long)pvVar291 + lVar318);
              fVar368 = *pfVar314;
              fVar381 = pfVar314[1];
              fVar382 = pfVar314[2];
              fVar383 = pfVar314[3];
              fVar60 = pfVar314[4];
              fVar61 = pfVar314[5];
              fVar62 = pfVar314[6];
              fVar63 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x20);
              fVar330 = *pfVar314;
              fVar343 = pfVar314[1];
              fVar64 = pfVar314[2];
              fVar65 = pfVar314[3];
              fVar66 = pfVar314[4];
              fVar67 = pfVar314[5];
              fVar68 = pfVar314[6];
              fVar502 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x40);
              fVar506 = *pfVar314;
              fVar515 = pfVar314[1];
              fVar367 = pfVar314[2];
              fVar426 = pfVar314[3];
              fVar427 = pfVar314[4];
              fVar428 = pfVar314[5];
              fVar500 = pfVar314[6];
              fVar501 = pfVar314[7];
              pfVar314 = (float *)((long)piVar324 + lVar306);
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0x60);
              fVar505 = *pfVar319;
              fVar386 = pfVar319[1];
              fVar491 = pfVar319[2];
              fVar492 = pfVar319[3];
              fVar493 = pfVar319[4];
              fVar345 = pfVar319[5];
              fVar484 = pfVar319[6];
              fVar485 = pfVar319[7];
              pfVar323 = (float *)((long)piVar324 + lVar306 + 0x20);
              pfVar325 = (float *)((long)piVar324 + lVar306 + 0x40);
              fVar430 = in_register_0000135c + in_register_0000139c;
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0x80);
              fVar486 = *pfVar319;
              fVar487 = pfVar319[1];
              fVar69 = pfVar319[2];
              fVar70 = pfVar319[3];
              fVar71 = pfVar319[4];
              fVar72 = pfVar319[5];
              fVar73 = pfVar319[6];
              fVar74 = pfVar319[7];
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0xa0);
              fVar137 = *pfVar319;
              fVar138 = pfVar319[1];
              fVar139 = pfVar319[2];
              fVar140 = pfVar319[3];
              fVar141 = pfVar319[4];
              fVar142 = pfVar319[5];
              fVar143 = pfVar319[6];
              in_register_0000139c = pfVar319[7];
              pfVar319 = (float *)((long)piVar321 + lVar306);
              fVar75 = *pfVar319;
              fVar76 = pfVar319[1];
              fVar77 = pfVar319[2];
              fVar78 = pfVar319[3];
              fVar79 = pfVar319[4];
              fVar80 = pfVar319[5];
              fVar81 = pfVar319[6];
              pfVar301 = (float *)((long)piVar321 + lVar306 + 0x20);
              fVar82 = *pfVar301;
              fVar83 = pfVar301[1];
              fVar84 = pfVar301[2];
              fVar85 = pfVar301[3];
              fVar86 = pfVar301[4];
              fVar87 = pfVar301[5];
              fVar88 = pfVar301[6];
              pfVar299 = (float *)((long)piVar321 + lVar306 + 0x40);
              fVar89 = *pfVar299;
              fVar90 = pfVar299[1];
              fVar91 = pfVar299[2];
              fVar92 = pfVar299[3];
              fVar93 = pfVar299[4];
              fVar94 = pfVar299[5];
              fVar95 = pfVar299[6];
              fVar465 = in_register_0000149c + pfVar319[7];
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0xc0);
              fVar96 = *pfVar319;
              fVar97 = pfVar319[1];
              fVar98 = pfVar319[2];
              fVar99 = pfVar319[3];
              fVar100 = pfVar319[4];
              fVar101 = pfVar319[5];
              fVar102 = pfVar319[6];
              fVar103 = pfVar319[7];
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0xe0);
              fVar104 = *pfVar319;
              fVar105 = pfVar319[1];
              fVar106 = pfVar319[2];
              fVar107 = pfVar319[3];
              fVar108 = pfVar319[4];
              fVar109 = pfVar319[5];
              fVar110 = pfVar319[6];
              fVar111 = pfVar319[7];
              auVar360 = *(undefined1 (*) [32])((long)pvVar291 + lVar318 + 0x100);
              in_ZMM7 = ZEXT3264(auVar360);
              pfVar299 = (float *)((long)pvVar322 + lVar306);
              fVar112 = *pfVar299;
              fVar113 = pfVar299[1];
              fVar114 = pfVar299[2];
              fVar115 = pfVar299[3];
              fVar116 = pfVar299[4];
              fVar117 = pfVar299[5];
              fVar118 = pfVar299[6];
              auVar53 = *(undefined1 (*) [32])((long)pvVar322 + lVar306 + 0x20);
              in_ZMM9 = ZEXT3264(auVar53);
              pfVar319 = (float *)((long)pvVar322 + lVar306 + 0x40);
              fVar144 = *pfVar319;
              fVar145 = pfVar319[1];
              fVar146 = pfVar319[2];
              fVar147 = pfVar319[3];
              fVar148 = pfVar319[4];
              fVar149 = pfVar319[5];
              fVar437 = pfVar319[6];
              in_register_0000149c = pfVar319[7];
              in_register_0000141c = in_register_000014dc + pfVar299[7];
              in_register_0000135c = in_register_0000141c + fVar74;
              auVar406._0_4_ =
                   fVar347 + fVar368 * *pfVar314 + fVar330 * *pfVar323 + fVar506 * *pfVar325 +
                   fVar89 * fVar137 + fVar75 * fVar505 + fVar82 * fVar486 +
                   fVar112 * fVar96 + auVar53._0_4_ * fVar104 + fVar144 * auVar360._0_4_;
              auVar406._4_4_ =
                   fVar364 + fVar381 * pfVar314[1] + fVar343 * pfVar323[1] + fVar515 * pfVar325[1] +
                   fVar90 * fVar138 + fVar76 * fVar386 + fVar83 * fVar487 +
                   fVar113 * fVar97 + auVar53._4_4_ * fVar105 + fVar145 * auVar360._4_4_;
              auVar406._8_4_ =
                   fVar365 + fVar382 * pfVar314[2] + fVar64 * pfVar323[2] + fVar367 * pfVar325[2] +
                   fVar91 * fVar139 + fVar77 * fVar491 + fVar84 * fVar69 +
                   fVar114 * fVar98 + auVar53._8_4_ * fVar106 + fVar146 * auVar360._8_4_;
              auVar406._12_4_ =
                   fVar366 + fVar383 * pfVar314[3] + fVar65 * pfVar323[3] + fVar426 * pfVar325[3] +
                   fVar92 * fVar140 + fVar78 * fVar492 + fVar85 * fVar70 +
                   fVar115 * fVar99 + auVar53._12_4_ * fVar107 + fVar147 * auVar360._12_4_;
              auVar406._16_4_ =
                   fVar511 + fVar60 * pfVar314[4] + fVar66 * pfVar323[4] + fVar427 * pfVar325[4] +
                   fVar93 * fVar141 + fVar79 * fVar493 + fVar86 * fVar71 +
                   fVar116 * fVar100 + auVar53._16_4_ * fVar108 + fVar148 * auVar360._16_4_;
              auVar406._20_4_ =
                   fVar512 + fVar61 * pfVar314[5] + fVar67 * pfVar323[5] + fVar428 * pfVar325[5] +
                   fVar94 * fVar142 + fVar80 * fVar345 + fVar87 * fVar72 +
                   fVar117 * fVar101 + auVar53._20_4_ * fVar109 + fVar149 * auVar360._20_4_;
              auVar406._24_4_ =
                   fVar513 + fVar62 * pfVar314[6] + fVar68 * pfVar323[6] + fVar500 * pfVar325[6] +
                   fVar95 * fVar143 + fVar81 * fVar484 + fVar88 * fVar73 +
                   fVar118 * fVar102 + auVar53._24_4_ * fVar110 + fVar437 * auVar360._24_4_;
              auVar406._28_4_ =
                   fVar514 + in_ZMM3._28_4_ + fVar430 + pfVar301[7] + fVar465 + in_register_0000135c
              ;
              in_ZMM3 = ZEXT3264(auVar406);
              pfVar314 = (float *)((long)pvVar307 + lVar306);
              fVar430 = *pfVar314;
              fVar465 = pfVar314[1];
              fVar119 = pfVar314[2];
              fVar120 = pfVar314[3];
              fVar121 = pfVar314[4];
              fVar122 = pfVar314[5];
              fVar123 = pfVar314[6];
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0x20);
              fVar124 = *pfVar314;
              fVar125 = pfVar314[1];
              fVar126 = pfVar314[2];
              fVar127 = pfVar314[3];
              fVar128 = pfVar314[4];
              fVar129 = pfVar314[5];
              fVar130 = pfVar314[6];
              pfVar314 = (float *)((long)pvVar307 + lVar306 + 0x40);
              fVar131 = *pfVar314;
              fVar346 = pfVar314[1];
              fVar132 = pfVar314[2];
              fVar133 = pfVar314[3];
              fVar134 = pfVar314[4];
              fVar135 = pfVar314[5];
              fVar136 = pfVar314[6];
              *(undefined1 (*) [32])((long)pvVar316 + lVar306) = auVar406;
              pfVar314 = (float *)((long)pvVar298 + lVar306);
              *pfVar314 = fVar347 + fVar75 * fVar368 + fVar82 * fVar330 + fVar89 * fVar506 +
                          fVar112 * fVar505 + auVar53._0_4_ * fVar486 + fVar144 * fVar137 +
                          fVar96 * fVar430 + fVar104 * fVar124 + auVar360._0_4_ * fVar131;
              pfVar314[1] = fVar364 + fVar76 * fVar381 + fVar83 * fVar343 + fVar90 * fVar515 +
                            fVar113 * fVar386 + auVar53._4_4_ * fVar487 + fVar145 * fVar138 +
                            fVar97 * fVar465 + fVar105 * fVar125 + auVar360._4_4_ * fVar346;
              pfVar314[2] = fVar365 + fVar77 * fVar382 + fVar84 * fVar64 + fVar91 * fVar367 +
                            fVar114 * fVar491 + auVar53._8_4_ * fVar69 + fVar146 * fVar139 +
                            fVar98 * fVar119 + fVar106 * fVar126 + auVar360._8_4_ * fVar132;
              pfVar314[3] = fVar366 + fVar78 * fVar383 + fVar85 * fVar65 + fVar92 * fVar426 +
                            fVar115 * fVar492 + auVar53._12_4_ * fVar70 + fVar147 * fVar140 +
                            fVar99 * fVar120 + fVar107 * fVar127 + auVar360._12_4_ * fVar133;
              pfVar314[4] = fVar511 + fVar79 * fVar60 + fVar86 * fVar66 + fVar93 * fVar427 +
                            fVar116 * fVar493 + auVar53._16_4_ * fVar71 + fVar148 * fVar141 +
                            fVar100 * fVar121 + fVar108 * fVar128 + auVar360._16_4_ * fVar134;
              pfVar314[5] = fVar512 + fVar80 * fVar61 + fVar87 * fVar67 + fVar94 * fVar428 +
                            fVar117 * fVar345 + auVar53._20_4_ * fVar72 + fVar149 * fVar142 +
                            fVar101 * fVar122 + fVar109 * fVar129 + auVar360._20_4_ * fVar135;
              pfVar314[6] = fVar513 + fVar81 * fVar62 + fVar88 * fVar68 + fVar95 * fVar500 +
                            fVar118 * fVar484 + auVar53._24_4_ * fVar73 + fVar437 * fVar143 +
                            fVar102 * fVar123 + fVar110 * fVar130 + auVar360._24_4_ * fVar136;
              pfVar314[7] = fVar514 + fVar63 + fVar502 + fVar501 +
                            fVar485 + fVar74 + in_register_0000135c + fVar103 + fVar111 + fVar111;
              lVar306 = lVar306 + 0x20;
            }
            piVar324 = (pointer)((long)piVar324 + lVar306 + lVar308);
            piVar321 = (pointer)((long)piVar321 + lVar306 + lVar308);
            pvVar322 = (void *)((long)pvVar322 + lVar306 + lVar308);
            pvVar307 = (void *)((long)pvVar307 + lVar306 + lVar308);
            pvVar316 = (void *)((long)pvVar316 + lVar306 + local_318);
            pvVar298 = (void *)((long)pvVar298 + lVar306 + local_318);
          }
          for (; (int)uVar303 < iVar304; uVar303 = uVar303 + 1) {
            lVar306 = 0;
            for (iVar309 = 0; iVar309 + 3 < iVar289; iVar309 = iVar309 + 4) {
              pfVar314 = (float *)((long)piVar324 + lVar306 + 0x20);
              fVar381 = *pfVar314;
              fVar382 = pfVar314[1];
              fVar383 = pfVar314[2];
              fVar60 = pfVar314[3];
              fVar61 = pfVar314[4];
              fVar62 = pfVar314[5];
              fVar63 = pfVar314[6];
              fVar330 = pfVar314[7];
              pfVar314 = (float *)((long)piVar324 + lVar306 + 0x40);
              fVar343 = *pfVar314;
              fVar64 = pfVar314[1];
              fVar65 = pfVar314[2];
              fVar66 = pfVar314[3];
              fVar67 = pfVar314[4];
              fVar68 = pfVar314[5];
              fVar502 = pfVar314[6];
              fVar506 = pfVar314[7];
              pfVar319 = (float *)((long)piVar324 + lVar306 + 0x60);
              fVar515 = *pfVar319;
              fVar367 = pfVar319[1];
              fVar426 = pfVar319[2];
              fVar427 = pfVar319[3];
              fVar428 = pfVar319[4];
              fVar500 = pfVar319[5];
              fVar501 = pfVar319[6];
              pfVar314 = (float *)((long)piVar324 + lVar306 + 0x80);
              fVar505 = *pfVar314;
              fVar386 = pfVar314[1];
              fVar491 = pfVar314[2];
              fVar492 = pfVar314[3];
              fVar493 = pfVar314[4];
              fVar345 = pfVar314[5];
              fVar484 = pfVar314[6];
              fVar485 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318);
              fVar486 = *pfVar314;
              fVar487 = pfVar314[1];
              fVar69 = pfVar314[2];
              fVar70 = pfVar314[3];
              fVar71 = pfVar314[4];
              fVar72 = pfVar314[5];
              fVar73 = pfVar314[6];
              fVar74 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x20);
              fVar75 = *pfVar314;
              fVar76 = pfVar314[1];
              fVar77 = pfVar314[2];
              fVar78 = pfVar314[3];
              fVar79 = pfVar314[4];
              fVar80 = pfVar314[5];
              fVar81 = pfVar314[6];
              fVar82 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x40);
              fVar83 = *pfVar314;
              fVar84 = pfVar314[1];
              fVar85 = pfVar314[2];
              fVar86 = pfVar314[3];
              fVar87 = pfVar314[4];
              fVar88 = pfVar314[5];
              fVar89 = pfVar314[6];
              pfVar314 = (float *)((long)piVar324 + lVar306);
              fVar90 = pfVar314[1];
              fVar91 = pfVar314[2];
              fVar92 = pfVar314[3];
              fVar93 = pfVar314[4];
              fVar94 = pfVar314[5];
              fVar95 = pfVar314[6];
              pfVar323 = (float *)((long)pvVar291 + lVar318 + 0x60);
              fVar96 = *pfVar323;
              fVar97 = pfVar323[1];
              fVar98 = pfVar323[2];
              fVar99 = pfVar323[3];
              fVar100 = pfVar323[4];
              fVar101 = pfVar323[5];
              fVar102 = pfVar323[6];
              fVar103 = pfVar323[7];
              fVar392 = in_register_0000141c + fVar514;
              fVar368 = in_ZMM9._28_4_;
              fVar490 = in_register_0000149c + fVar514;
              fVar385 = in_register_000014dc + fVar506;
              fVar420 = in_register_0000151c + pfVar319[7];
              pfVar319 = (float *)((long)piVar324 + lVar306 + 0xa0);
              fVar104 = *pfVar319;
              fVar105 = pfVar319[1];
              fVar106 = pfVar319[2];
              fVar107 = pfVar319[3];
              fVar108 = pfVar319[4];
              fVar109 = pfVar319[5];
              fVar110 = pfVar319[6];
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0x80);
              fVar111 = *pfVar319;
              fVar112 = pfVar319[1];
              fVar113 = pfVar319[2];
              fVar114 = pfVar319[3];
              fVar115 = pfVar319[4];
              fVar116 = pfVar319[5];
              fVar117 = pfVar319[6];
              fVar118 = pfVar319[7];
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0xa0);
              fVar430 = *pfVar319;
              fVar465 = pfVar319[1];
              fVar119 = pfVar319[2];
              fVar120 = pfVar319[3];
              fVar121 = pfVar319[4];
              fVar122 = pfVar319[5];
              fVar123 = pfVar319[6];
              pfVar323 = (float *)((long)piVar321 + lVar306 + 0x20);
              fVar124 = *pfVar323;
              fVar125 = pfVar323[1];
              fVar126 = pfVar323[2];
              fVar127 = pfVar323[3];
              fVar128 = pfVar323[4];
              fVar129 = pfVar323[5];
              fVar130 = pfVar323[6];
              pfVar319 = (float *)((long)piVar321 + lVar306 + 0x40);
              fVar131 = *pfVar319;
              fVar346 = pfVar319[1];
              fVar132 = pfVar319[2];
              fVar133 = pfVar319[3];
              fVar134 = pfVar319[4];
              fVar135 = pfVar319[5];
              fVar136 = pfVar319[6];
              pfVar319 = (float *)((long)piVar321 + lVar306 + 0x60);
              fVar137 = *pfVar319;
              fVar138 = pfVar319[1];
              fVar139 = pfVar319[2];
              fVar140 = pfVar319[3];
              fVar141 = pfVar319[4];
              fVar142 = pfVar319[5];
              fVar143 = pfVar319[6];
              pfVar319 = (float *)((long)piVar321 + lVar306);
              fVar144 = pfVar319[1];
              fVar145 = pfVar319[2];
              fVar146 = pfVar319[3];
              fVar147 = pfVar319[4];
              fVar148 = pfVar319[5];
              fVar149 = pfVar319[6];
              pfVar301 = (float *)((long)piVar321 + lVar306 + 0x80);
              fVar437 = *pfVar301;
              fVar464 = pfVar301[1];
              fVar150 = pfVar301[2];
              fVar151 = pfVar301[3];
              fVar152 = pfVar301[4];
              fVar153 = pfVar301[5];
              fVar154 = pfVar301[6];
              fVar499 = in_register_0000155c + in_register_0000151c;
              fVar431 = fVar490 + pfVar323[7] + fVar118;
              fVar432 = in_register_0000151c + fVar490 + fVar431;
              fVar433 = fVar499 + fVar432;
              pfVar323 = (float *)((long)piVar321 + lVar306 + 0xa0);
              fVar155 = *pfVar323;
              fVar156 = pfVar323[1];
              fVar157 = pfVar323[2];
              fVar158 = pfVar323[3];
              fVar159 = pfVar323[4];
              fVar160 = pfVar323[5];
              fVar161 = pfVar323[6];
              pfVar323 = (float *)((long)pvVar291 + lVar318 + 0xc0);
              fVar162 = *pfVar323;
              fVar163 = pfVar323[1];
              fVar164 = pfVar323[2];
              fVar165 = pfVar323[3];
              fVar166 = pfVar323[4];
              fVar468 = pfVar323[5];
              fVar495 = pfVar323[6];
              fVar167 = pfVar323[7];
              pfVar323 = (float *)((long)pvVar291 + lVar318 + 0xe0);
              fVar393 = *pfVar323;
              fVar412 = pfVar323[1];
              fVar414 = pfVar323[2];
              fVar416 = pfVar323[3];
              fVar425 = pfVar323[4];
              fVar417 = pfVar323[5];
              fVar418 = pfVar323[6];
              fVar421 = pfVar323[7];
              pfVar323 = (float *)((long)pvVar291 + lVar318 + 0x100);
              fVar419 = *pfVar323;
              fVar436 = pfVar323[1];
              fVar470 = pfVar323[2];
              fVar472 = pfVar323[3];
              fVar474 = pfVar323[4];
              fVar476 = pfVar323[5];
              fVar478 = pfVar323[6];
              in_register_0000139c = pfVar323[7];
              pfVar323 = (float *)((long)pvVar322 + lVar306 + 0x20);
              fVar438 = *pfVar323;
              fVar440 = pfVar323[1];
              fVar452 = pfVar323[2];
              fVar454 = pfVar323[3];
              fVar456 = pfVar323[4];
              fVar459 = pfVar323[5];
              fVar461 = pfVar323[6];
              pfVar325 = (float *)((long)pvVar322 + lVar306 + 0x40);
              fVar480 = *pfVar325;
              fVar482 = pfVar325[1];
              fVar498 = pfVar325[2];
              fVar171 = pfVar325[3];
              fVar172 = pfVar325[4];
              fVar173 = pfVar325[5];
              fVar174 = pfVar325[6];
              in_register_0000141c = pfVar325[7];
              auVar360 = *(undefined1 (*) [32])((long)pvVar322 + lVar306 + 0x60);
              in_ZMM9 = ZEXT3264(auVar360);
              pfVar325 = (float *)((long)pvVar322 + lVar306 + 0x80);
              fVar175 = *pfVar325;
              fVar176 = pfVar325[1];
              fVar177 = pfVar325[2];
              fVar178 = pfVar325[3];
              fVar179 = pfVar325[4];
              fVar180 = pfVar325[5];
              fVar181 = pfVar325[6];
              in_register_0000149c = pfVar325[7];
              pfVar325 = (float *)((long)pvVar322 + lVar306);
              fVar410 = auVar360._0_4_;
              fVar411 = auVar360._4_4_;
              fVar413 = auVar360._8_4_;
              fVar415 = auVar360._12_4_;
              fVar494 = auVar360._16_4_;
              fVar457 = auVar360._20_4_;
              fVar460 = auVar360._24_4_;
              fVar439 = fVar162 * *pfVar325 + fVar438 * fVar393;
              fVar451 = fVar163 * pfVar325[1] + fVar440 * fVar412;
              fVar453 = fVar164 * pfVar325[2] + fVar452 * fVar414;
              fVar455 = fVar165 * pfVar325[3] + fVar454 * fVar416;
              fVar458 = fVar166 * pfVar325[4] + fVar456 * fVar425;
              fVar497 = fVar468 * pfVar325[5] + fVar459 * fVar417;
              fVar391 = fVar495 * pfVar325[6] + fVar461 * fVar418;
              fVar466 = pfVar301[7] + pfVar323[7];
              in_ZMM7 = ZEXT3264(CONCAT428(fVar466,CONCAT424(fVar391,CONCAT420(fVar497,CONCAT416(
                                                  fVar458,CONCAT412(fVar455,CONCAT48(fVar453,
                                                  CONCAT44(fVar451,fVar439))))))));
              in_register_000014dc = fVar499 + pfVar301[7];
              in_register_0000151c = in_register_0000155c + fVar499;
              fVar466 = fVar466 + fVar421;
              fVar434 = in_register_000014dc + fVar466;
              in_register_0000135c = in_register_0000151c + fVar434;
              auVar407._0_4_ =
                   fVar343 * fVar486 + fVar347 + fVar515 * fVar75 + fVar505 * fVar83 +
                   fVar131 * fVar96 + fVar137 * fVar111 + fVar437 * fVar430 +
                   fVar480 * fVar162 + fVar410 * fVar393 + fVar175 * fVar419;
              auVar407._4_4_ =
                   fVar64 * fVar487 + fVar364 + fVar367 * fVar76 + fVar386 * fVar84 +
                   fVar346 * fVar97 + fVar138 * fVar112 + fVar464 * fVar465 +
                   fVar482 * fVar163 + fVar411 * fVar412 + fVar176 * fVar436;
              auVar407._8_4_ =
                   fVar65 * fVar69 + fVar365 + fVar426 * fVar77 + fVar491 * fVar85 +
                   fVar132 * fVar98 + fVar139 * fVar113 + fVar150 * fVar119 +
                   fVar498 * fVar164 + fVar413 * fVar414 + fVar177 * fVar470;
              auVar407._12_4_ =
                   fVar66 * fVar70 + fVar366 + fVar427 * fVar78 + fVar492 * fVar86 +
                   fVar133 * fVar99 + fVar140 * fVar114 + fVar151 * fVar120 +
                   fVar171 * fVar165 + fVar415 * fVar416 + fVar178 * fVar472;
              auVar407._16_4_ =
                   fVar67 * fVar71 + fVar511 + fVar428 * fVar79 + fVar493 * fVar87 +
                   fVar134 * fVar100 + fVar141 * fVar115 + fVar152 * fVar121 +
                   fVar172 * fVar166 + fVar494 * fVar425 + fVar179 * fVar474;
              auVar407._20_4_ =
                   fVar68 * fVar72 + fVar512 + fVar500 * fVar80 + fVar345 * fVar88 +
                   fVar135 * fVar101 + fVar142 * fVar116 + fVar153 * fVar122 +
                   fVar173 * fVar468 + fVar457 * fVar417 + fVar180 * fVar476;
              auVar407._24_4_ =
                   fVar502 * fVar73 + fVar513 + fVar501 * fVar81 + fVar484 * fVar89 +
                   fVar136 * fVar102 + fVar143 * fVar117 + fVar154 * fVar123 +
                   fVar174 * fVar495 + fVar460 * fVar418 + fVar181 * fVar478;
              auVar407._28_4_ = fVar490 + fVar420 + fVar433 + in_register_0000135c;
              in_ZMM3 = ZEXT3264(auVar407);
              pfVar323 = (float *)((long)pvVar322 + lVar306 + 0xa0);
              fVar420 = *pfVar323;
              fVar490 = pfVar323[1];
              fVar499 = pfVar323[2];
              fVar168 = pfVar323[3];
              fVar169 = pfVar323[4];
              fVar170 = pfVar323[5];
              fVar384 = pfVar323[6];
              pfVar323 = (float *)((long)pvVar316 + lVar306);
              *pfVar323 = fVar486 * *pfVar314 + fVar347 + fVar381 * fVar75 + fVar343 * fVar83 +
                          fVar96 * *pfVar319 + fVar124 * fVar111 + fVar131 * fVar430 +
                          fVar439 + fVar480 * fVar419;
              pfVar323[1] = fVar487 * fVar90 + fVar364 + fVar382 * fVar76 + fVar64 * fVar84 +
                            fVar97 * fVar144 + fVar125 * fVar112 + fVar346 * fVar465 +
                            fVar451 + fVar482 * fVar436;
              pfVar323[2] = fVar69 * fVar91 + fVar365 + fVar383 * fVar77 + fVar65 * fVar85 +
                            fVar98 * fVar145 + fVar126 * fVar113 + fVar132 * fVar119 +
                            fVar453 + fVar498 * fVar470;
              pfVar323[3] = fVar70 * fVar92 + fVar366 + fVar60 * fVar78 + fVar66 * fVar86 +
                            fVar99 * fVar146 + fVar127 * fVar114 + fVar133 * fVar120 +
                            fVar455 + fVar171 * fVar472;
              pfVar323[4] = fVar71 * fVar93 + fVar511 + fVar61 * fVar79 + fVar67 * fVar87 +
                            fVar100 * fVar147 + fVar128 * fVar115 + fVar134 * fVar121 +
                            fVar458 + fVar172 * fVar474;
              pfVar323[5] = fVar72 * fVar94 + fVar512 + fVar62 * fVar80 + fVar68 * fVar88 +
                            fVar101 * fVar148 + fVar129 * fVar116 + fVar135 * fVar122 +
                            fVar497 + fVar173 * fVar476;
              pfVar323[6] = fVar73 * fVar95 + fVar513 + fVar63 * fVar81 + fVar502 * fVar89 +
                            fVar102 * fVar149 + fVar130 * fVar117 + fVar136 * fVar123 +
                            fVar391 + fVar174 * fVar478;
              pfVar323[7] = fVar392 + fVar330 + fVar506 + fVar431 + fVar466;
              pfVar314 = (float *)((long)pvVar316 + lVar306 + 0x20);
              *pfVar314 = fVar381 * fVar486 + fVar347 + fVar343 * fVar75 + fVar515 * fVar83 +
                          fVar124 * fVar96 + fVar131 * fVar111 + fVar137 * fVar430 +
                          fVar438 * fVar162 + fVar480 * fVar393 + fVar410 * fVar419;
              pfVar314[1] = fVar382 * fVar487 + fVar364 + fVar64 * fVar76 + fVar367 * fVar84 +
                            fVar125 * fVar97 + fVar346 * fVar112 + fVar138 * fVar465 +
                            fVar440 * fVar163 + fVar482 * fVar412 + fVar411 * fVar436;
              pfVar314[2] = fVar383 * fVar69 + fVar365 + fVar65 * fVar77 + fVar426 * fVar85 +
                            fVar126 * fVar98 + fVar132 * fVar113 + fVar139 * fVar119 +
                            fVar452 * fVar164 + fVar498 * fVar414 + fVar413 * fVar470;
              pfVar314[3] = fVar60 * fVar70 + fVar366 + fVar66 * fVar78 + fVar427 * fVar86 +
                            fVar127 * fVar99 + fVar133 * fVar114 + fVar140 * fVar120 +
                            fVar454 * fVar165 + fVar171 * fVar416 + fVar415 * fVar472;
              pfVar314[4] = fVar61 * fVar71 + fVar511 + fVar67 * fVar79 + fVar428 * fVar87 +
                            fVar128 * fVar100 + fVar134 * fVar115 + fVar141 * fVar121 +
                            fVar456 * fVar166 + fVar172 * fVar425 + fVar494 * fVar474;
              pfVar314[5] = fVar62 * fVar72 + fVar512 + fVar68 * fVar80 + fVar500 * fVar88 +
                            fVar129 * fVar101 + fVar135 * fVar116 + fVar142 * fVar122 +
                            fVar459 * fVar468 + fVar173 * fVar417 + fVar457 * fVar476;
              pfVar314[6] = fVar63 * fVar73 + fVar513 + fVar502 * fVar81 + fVar501 * fVar89 +
                            fVar130 * fVar102 + fVar136 * fVar117 + fVar143 * fVar123 +
                            fVar461 * fVar495 + fVar174 * fVar418 + fVar460 * fVar478;
              pfVar314[7] = fVar368 + fVar514 + fVar385 + fVar432 + fVar434;
              *(undefined1 (*) [32])((long)pvVar316 + lVar306 + 0x40) = auVar407;
              pfVar314 = (float *)((long)pvVar316 + lVar306 + 0x60);
              *pfVar314 = fVar347 + fVar515 * fVar486 + fVar505 * fVar75 + fVar83 * fVar104 +
                          fVar137 * fVar96 + fVar437 * fVar111 + fVar430 * fVar155 +
                          fVar410 * fVar162 + fVar175 * fVar393 + fVar419 * fVar420;
              pfVar314[1] = fVar364 + fVar367 * fVar487 + fVar386 * fVar76 + fVar84 * fVar105 +
                            fVar138 * fVar97 + fVar464 * fVar112 + fVar465 * fVar156 +
                            fVar411 * fVar163 + fVar176 * fVar412 + fVar436 * fVar490;
              pfVar314[2] = fVar365 + fVar426 * fVar69 + fVar491 * fVar77 + fVar85 * fVar106 +
                            fVar139 * fVar98 + fVar150 * fVar113 + fVar119 * fVar157 +
                            fVar413 * fVar164 + fVar177 * fVar414 + fVar470 * fVar499;
              pfVar314[3] = fVar366 + fVar427 * fVar70 + fVar492 * fVar78 + fVar86 * fVar107 +
                            fVar140 * fVar99 + fVar151 * fVar114 + fVar120 * fVar158 +
                            fVar415 * fVar165 + fVar178 * fVar416 + fVar472 * fVar168;
              pfVar314[4] = fVar511 + fVar428 * fVar71 + fVar493 * fVar79 + fVar87 * fVar108 +
                            fVar141 * fVar100 + fVar152 * fVar115 + fVar121 * fVar159 +
                            fVar494 * fVar166 + fVar179 * fVar425 + fVar474 * fVar169;
              pfVar314[5] = fVar512 + fVar500 * fVar72 + fVar345 * fVar80 + fVar88 * fVar109 +
                            fVar142 * fVar101 + fVar153 * fVar116 + fVar122 * fVar160 +
                            fVar457 * fVar468 + fVar180 * fVar417 + fVar476 * fVar170;
              pfVar314[6] = fVar513 + fVar501 * fVar73 + fVar484 * fVar81 + fVar89 * fVar110 +
                            fVar143 * fVar102 + fVar154 * fVar117 + fVar123 * fVar161 +
                            fVar460 * fVar495 + fVar181 * fVar418 + fVar478 * fVar384;
              pfVar314[7] = fVar514 + fVar74 + fVar82 + fVar485 + fVar103 + fVar118 + fVar433 +
                            fVar167 + fVar421 + in_register_0000135c;
              lVar306 = lVar306 + 0x80;
            }
            for (; iVar309 + 1 < iVar289; iVar309 = iVar309 + 2) {
              pfVar314 = (float *)((long)piVar324 + lVar306 + 0x20);
              fVar368 = *pfVar314;
              fVar381 = pfVar314[1];
              fVar382 = pfVar314[2];
              fVar383 = pfVar314[3];
              fVar60 = pfVar314[4];
              fVar61 = pfVar314[5];
              fVar62 = pfVar314[6];
              fVar63 = pfVar314[7];
              pfVar314 = (float *)((long)piVar324 + lVar306 + 0x40);
              fVar330 = *pfVar314;
              fVar343 = pfVar314[1];
              fVar64 = pfVar314[2];
              fVar65 = pfVar314[3];
              fVar66 = pfVar314[4];
              fVar67 = pfVar314[5];
              fVar68 = pfVar314[6];
              fVar502 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318);
              fVar506 = *pfVar314;
              fVar515 = pfVar314[1];
              fVar367 = pfVar314[2];
              fVar426 = pfVar314[3];
              fVar427 = pfVar314[4];
              fVar428 = pfVar314[5];
              fVar500 = pfVar314[6];
              fVar501 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x20);
              fVar505 = *pfVar314;
              fVar386 = pfVar314[1];
              fVar491 = pfVar314[2];
              fVar492 = pfVar314[3];
              fVar493 = pfVar314[4];
              fVar345 = pfVar314[5];
              fVar484 = pfVar314[6];
              fVar485 = pfVar314[7];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x40);
              fVar486 = *pfVar314;
              fVar487 = pfVar314[1];
              fVar69 = pfVar314[2];
              fVar70 = pfVar314[3];
              fVar71 = pfVar314[4];
              fVar72 = pfVar314[5];
              fVar73 = pfVar314[6];
              pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x60);
              fVar74 = *pfVar314;
              fVar75 = pfVar314[1];
              fVar76 = pfVar314[2];
              fVar77 = pfVar314[3];
              fVar78 = pfVar314[4];
              fVar79 = pfVar314[5];
              fVar80 = pfVar314[6];
              fVar81 = pfVar314[7];
              pfVar314 = (float *)((long)piVar324 + lVar306);
              fVar82 = pfVar314[1];
              fVar83 = pfVar314[2];
              fVar84 = pfVar314[3];
              fVar85 = pfVar314[4];
              fVar86 = pfVar314[5];
              fVar87 = pfVar314[6];
              fVar438 = fVar514 + in_register_0000139c;
              pfVar319 = (float *)((long)piVar324 + lVar306 + 0x60);
              fVar88 = *pfVar319;
              fVar89 = pfVar319[1];
              fVar90 = pfVar319[2];
              fVar91 = pfVar319[3];
              fVar92 = pfVar319[4];
              fVar93 = pfVar319[5];
              fVar94 = pfVar319[6];
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0x80);
              fVar95 = *pfVar319;
              fVar96 = pfVar319[1];
              fVar97 = pfVar319[2];
              fVar98 = pfVar319[3];
              fVar99 = pfVar319[4];
              fVar100 = pfVar319[5];
              fVar101 = pfVar319[6];
              fVar102 = pfVar319[7];
              pfVar319 = (float *)((long)pvVar291 + lVar318 + 0xa0);
              fVar103 = *pfVar319;
              fVar104 = pfVar319[1];
              fVar105 = pfVar319[2];
              fVar106 = pfVar319[3];
              fVar107 = pfVar319[4];
              fVar108 = pfVar319[5];
              fVar109 = pfVar319[6];
              fVar110 = pfVar319[7];
              pfVar319 = (float *)((long)piVar321 + lVar306 + 0x20);
              fVar111 = *pfVar319;
              fVar112 = pfVar319[1];
              fVar113 = pfVar319[2];
              fVar114 = pfVar319[3];
              fVar115 = pfVar319[4];
              fVar116 = pfVar319[5];
              fVar117 = pfVar319[6];
              fVar118 = pfVar319[7];
              pfVar319 = (float *)((long)piVar321 + lVar306);
              fVar430 = pfVar319[1];
              fVar465 = pfVar319[2];
              fVar119 = pfVar319[3];
              fVar120 = pfVar319[4];
              fVar121 = pfVar319[5];
              fVar122 = pfVar319[6];
              pfVar323 = (float *)((long)piVar321 + lVar306 + 0x40);
              fVar123 = *pfVar323;
              fVar124 = pfVar323[1];
              fVar125 = pfVar323[2];
              fVar126 = pfVar323[3];
              fVar127 = pfVar323[4];
              fVar128 = pfVar323[5];
              fVar129 = pfVar323[6];
              pfVar325 = (float *)((long)piVar321 + lVar306 + 0x60);
              fVar130 = *pfVar325;
              fVar131 = pfVar325[1];
              fVar346 = pfVar325[2];
              fVar132 = pfVar325[3];
              fVar133 = pfVar325[4];
              fVar134 = pfVar325[5];
              fVar135 = pfVar325[6];
              pfVar325 = (float *)((long)pvVar291 + lVar318 + 0xc0);
              fVar136 = *pfVar325;
              fVar137 = pfVar325[1];
              fVar138 = pfVar325[2];
              fVar139 = pfVar325[3];
              fVar140 = pfVar325[4];
              fVar141 = pfVar325[5];
              fVar142 = pfVar325[6];
              fVar143 = pfVar325[7];
              pfVar325 = (float *)((long)pvVar291 + lVar318 + 0xe0);
              fVar144 = *pfVar325;
              fVar145 = pfVar325[1];
              fVar146 = pfVar325[2];
              fVar147 = pfVar325[3];
              fVar148 = pfVar325[4];
              fVar149 = pfVar325[5];
              fVar437 = pfVar325[6];
              fVar464 = pfVar325[7];
              pfVar299 = (float *)((long)pvVar291 + lVar318 + 0x100);
              fVar150 = pfVar299[1];
              fVar151 = pfVar299[2];
              fVar152 = pfVar299[3];
              fVar153 = pfVar299[4];
              fVar154 = pfVar299[5];
              fVar155 = pfVar299[6];
              pfVar325 = (float *)((long)pvVar322 + lVar306 + 0x20);
              fVar156 = *pfVar325;
              fVar157 = pfVar325[1];
              fVar158 = pfVar325[2];
              fVar159 = pfVar325[3];
              fVar160 = pfVar325[4];
              fVar161 = pfVar325[5];
              fVar162 = pfVar325[6];
              pfVar301 = (float *)((long)pvVar322 + lVar306 + 0x40);
              fVar163 = *pfVar301;
              fVar164 = pfVar301[1];
              fVar165 = pfVar301[2];
              fVar166 = pfVar301[3];
              fVar468 = pfVar301[4];
              fVar495 = pfVar301[5];
              fVar167 = pfVar301[6];
              in_register_0000139c = pfVar301[7];
              pfVar301 = (float *)((long)pvVar322 + lVar306);
              fVar440 = fVar136 * *pfVar301;
              fVar452 = fVar137 * pfVar301[1];
              fVar454 = fVar138 * pfVar301[2];
              fVar456 = fVar139 * pfVar301[3];
              fVar459 = fVar140 * pfVar301[4];
              fVar461 = fVar141 * pfVar301[5];
              fVar420 = fVar142 * pfVar301[6];
              in_ZMM7 = ZEXT3264(CONCAT428(pfVar323[7],
                                           CONCAT424(fVar420,CONCAT420(fVar461,CONCAT416(fVar459,
                                                  CONCAT412(fVar456,CONCAT48(fVar454,CONCAT44(
                                                  fVar452,fVar440))))))));
              in_register_0000135c = pfVar323[7] + pfVar325[7];
              fVar421 = in_register_0000135c + fVar464;
              pfVar323 = (float *)((long)pvVar322 + lVar306 + 0x60);
              fVar393 = *pfVar299 * *pfVar323;
              fVar412 = fVar150 * pfVar323[1];
              fVar414 = fVar151 * pfVar323[2];
              fVar416 = fVar152 * pfVar323[3];
              fVar425 = fVar153 * pfVar323[4];
              fVar417 = fVar154 * pfVar323[5];
              fVar418 = fVar155 * pfVar323[6];
              in_ZMM3 = ZEXT3264(CONCAT428(fVar421,CONCAT424(fVar418,CONCAT420(fVar417,CONCAT416(
                                                  fVar425,CONCAT412(fVar416,CONCAT48(fVar414,
                                                  CONCAT44(fVar412,fVar393))))))));
              pfVar323 = (float *)((long)pvVar316 + lVar306);
              *pfVar323 = fVar347 + fVar506 * *pfVar314 + fVar368 * fVar505 + fVar330 * fVar486 +
                          fVar74 * *pfVar319 + fVar111 * fVar95 + fVar123 * fVar103 +
                          fVar440 + fVar156 * fVar144 + fVar163 * *pfVar299;
              pfVar323[1] = fVar364 + fVar515 * fVar82 + fVar381 * fVar386 + fVar343 * fVar487 +
                            fVar75 * fVar430 + fVar112 * fVar96 + fVar124 * fVar104 +
                            fVar452 + fVar157 * fVar145 + fVar164 * fVar150;
              pfVar323[2] = fVar365 + fVar367 * fVar83 + fVar382 * fVar491 + fVar64 * fVar69 +
                            fVar76 * fVar465 + fVar113 * fVar97 + fVar125 * fVar105 +
                            fVar454 + fVar158 * fVar146 + fVar165 * fVar151;
              pfVar323[3] = fVar366 + fVar426 * fVar84 + fVar383 * fVar492 + fVar65 * fVar70 +
                            fVar77 * fVar119 + fVar114 * fVar98 + fVar126 * fVar106 +
                            fVar456 + fVar159 * fVar147 + fVar166 * fVar152;
              pfVar323[4] = fVar511 + fVar427 * fVar85 + fVar60 * fVar493 + fVar66 * fVar71 +
                            fVar78 * fVar120 + fVar115 * fVar99 + fVar127 * fVar107 +
                            fVar459 + fVar160 * fVar148 + fVar468 * fVar153;
              pfVar323[5] = fVar512 + fVar428 * fVar86 + fVar61 * fVar345 + fVar67 * fVar72 +
                            fVar79 * fVar121 + fVar116 * fVar100 + fVar128 * fVar108 +
                            fVar461 + fVar161 * fVar149 + fVar495 * fVar154;
              pfVar323[6] = fVar513 + fVar500 * fVar87 + fVar62 * fVar484 + fVar68 * fVar73 +
                            fVar80 * fVar122 + fVar117 * fVar101 + fVar129 * fVar109 +
                            fVar420 + fVar162 * fVar437 + fVar167 * fVar155;
              pfVar323[7] = fVar438 + fVar63 + fVar502 + fVar438 + fVar118 + fVar81 + fVar421;
              pfVar314 = (float *)((long)pvVar316 + lVar306 + 0x20);
              *pfVar314 = fVar347 + fVar368 * fVar506 + fVar330 * fVar505 + fVar486 * fVar88 +
                          fVar111 * fVar74 + fVar123 * fVar95 + fVar103 * fVar130 +
                          fVar156 * fVar136 + fVar163 * fVar144 + fVar393;
              pfVar314[1] = fVar364 + fVar381 * fVar515 + fVar343 * fVar386 + fVar487 * fVar89 +
                            fVar112 * fVar75 + fVar124 * fVar96 + fVar104 * fVar131 +
                            fVar157 * fVar137 + fVar164 * fVar145 + fVar412;
              pfVar314[2] = fVar365 + fVar382 * fVar367 + fVar64 * fVar491 + fVar69 * fVar90 +
                            fVar113 * fVar76 + fVar125 * fVar97 + fVar105 * fVar346 +
                            fVar158 * fVar138 + fVar165 * fVar146 + fVar414;
              pfVar314[3] = fVar366 + fVar383 * fVar426 + fVar65 * fVar492 + fVar70 * fVar91 +
                            fVar114 * fVar77 + fVar126 * fVar98 + fVar106 * fVar132 +
                            fVar159 * fVar139 + fVar166 * fVar147 + fVar416;
              pfVar314[4] = fVar511 + fVar60 * fVar427 + fVar66 * fVar493 + fVar71 * fVar92 +
                            fVar115 * fVar78 + fVar127 * fVar99 + fVar107 * fVar133 +
                            fVar160 * fVar140 + fVar468 * fVar148 + fVar425;
              pfVar314[5] = fVar512 + fVar61 * fVar428 + fVar67 * fVar345 + fVar72 * fVar93 +
                            fVar116 * fVar79 + fVar128 * fVar100 + fVar108 * fVar134 +
                            fVar161 * fVar141 + fVar495 * fVar149 + fVar417;
              pfVar314[6] = fVar513 + fVar62 * fVar500 + fVar68 * fVar484 + fVar73 * fVar94 +
                            fVar117 * fVar80 + fVar129 * fVar101 + fVar109 * fVar135 +
                            fVar162 * fVar142 + fVar167 * fVar437 + fVar418;
              pfVar314[7] = fVar514 + fVar501 + fVar485 + fVar502 + fVar81 + fVar102 + fVar110 +
                            fVar143 + fVar464 + fVar421;
              lVar306 = lVar306 + 0x40;
            }
            for (; iVar309 < iVar289; iVar309 = iVar309 + 1) {
              pfVar314 = (float *)((long)piVar324 + lVar306);
              fVar368 = pfVar314[1];
              fVar381 = pfVar314[2];
              fVar382 = pfVar314[3];
              fVar383 = pfVar314[4];
              fVar60 = pfVar314[5];
              fVar61 = pfVar314[6];
              fVar62 = pfVar314[7];
              pfVar301 = (float *)((long)piVar324 + lVar306 + 0x20);
              fVar63 = pfVar301[1];
              fVar330 = pfVar301[2];
              fVar343 = pfVar301[3];
              fVar64 = pfVar301[4];
              fVar65 = pfVar301[5];
              fVar66 = pfVar301[6];
              fVar67 = pfVar301[7];
              pfVar299 = (float *)((long)piVar324 + lVar306 + 0x40);
              fVar68 = pfVar299[1];
              fVar502 = pfVar299[2];
              fVar506 = pfVar299[3];
              fVar515 = pfVar299[4];
              fVar367 = pfVar299[5];
              fVar426 = pfVar299[6];
              fVar427 = pfVar299[7];
              pfVar319 = (float *)((long)pvVar291 + lVar318);
              fVar428 = pfVar319[1];
              fVar500 = pfVar319[2];
              fVar501 = pfVar319[3];
              fVar505 = pfVar319[4];
              fVar386 = pfVar319[5];
              fVar491 = pfVar319[6];
              pfVar2 = (float *)((long)pvVar291 + lVar318 + 0x20);
              fVar492 = pfVar2[1];
              fVar493 = pfVar2[2];
              fVar345 = pfVar2[3];
              fVar484 = pfVar2[4];
              fVar485 = pfVar2[5];
              fVar486 = pfVar2[6];
              pfVar3 = (float *)((long)pvVar291 + lVar318 + 0x40);
              fVar487 = pfVar3[1];
              fVar69 = pfVar3[2];
              fVar70 = pfVar3[3];
              fVar71 = pfVar3[4];
              fVar72 = pfVar3[5];
              fVar73 = pfVar3[6];
              pfVar323 = (float *)((long)piVar321 + lVar306);
              fVar74 = pfVar323[1];
              fVar75 = pfVar323[2];
              fVar76 = pfVar323[3];
              fVar77 = pfVar323[4];
              fVar78 = pfVar323[5];
              fVar79 = pfVar323[6];
              fVar80 = pfVar323[7];
              pfVar4 = (float *)((long)piVar321 + lVar306 + 0x20);
              fVar81 = pfVar4[1];
              fVar82 = pfVar4[2];
              fVar83 = pfVar4[3];
              fVar84 = pfVar4[4];
              fVar85 = pfVar4[5];
              fVar86 = pfVar4[6];
              fVar87 = pfVar4[7];
              pfVar5 = (float *)((long)piVar321 + lVar306 + 0x40);
              fVar88 = pfVar5[1];
              fVar89 = pfVar5[2];
              fVar90 = pfVar5[3];
              fVar91 = pfVar5[4];
              fVar92 = pfVar5[5];
              fVar93 = pfVar5[6];
              pfVar9 = (float *)((long)pvVar291 + lVar318 + 0x60);
              fVar94 = pfVar9[1];
              fVar95 = pfVar9[2];
              fVar96 = pfVar9[3];
              fVar97 = pfVar9[4];
              fVar98 = pfVar9[5];
              fVar99 = pfVar9[6];
              pfVar12 = (float *)((long)pvVar291 + lVar318 + 0x80);
              fVar100 = pfVar12[1];
              fVar101 = pfVar12[2];
              fVar102 = pfVar12[3];
              fVar103 = pfVar12[4];
              fVar104 = pfVar12[5];
              fVar105 = pfVar12[6];
              pfVar13 = (float *)((long)pvVar291 + lVar318 + 0xa0);
              fVar106 = pfVar13[1];
              fVar107 = pfVar13[2];
              fVar108 = pfVar13[3];
              fVar109 = pfVar13[4];
              fVar110 = pfVar13[5];
              fVar111 = pfVar13[6];
              pfVar11 = (float *)((long)pvVar322 + lVar306);
              fVar112 = pfVar11[1];
              fVar113 = pfVar11[2];
              fVar114 = pfVar11[3];
              fVar115 = pfVar11[4];
              fVar116 = pfVar11[5];
              fVar117 = pfVar11[6];
              fVar118 = pfVar11[7];
              pfVar10 = (float *)((long)pvVar322 + lVar306 + 0x20);
              fVar430 = pfVar10[1];
              fVar465 = pfVar10[2];
              fVar119 = pfVar10[3];
              fVar120 = pfVar10[4];
              fVar121 = pfVar10[5];
              fVar122 = pfVar10[6];
              fVar123 = pfVar10[7];
              auVar360 = *(undefined1 (*) [32])((long)pvVar322 + lVar306 + 0x40);
              in_ZMM3 = ZEXT3264(auVar360);
              pfVar14 = (float *)((long)pvVar291 + lVar318 + 0xc0);
              fVar124 = pfVar14[1];
              fVar125 = pfVar14[2];
              fVar126 = pfVar14[3];
              fVar127 = pfVar14[4];
              fVar128 = pfVar14[5];
              fVar129 = pfVar14[6];
              pfVar15 = (float *)((long)pvVar291 + lVar318 + 0xe0);
              fVar130 = pfVar15[1];
              fVar131 = pfVar15[2];
              fVar346 = pfVar15[3];
              fVar132 = pfVar15[4];
              fVar133 = pfVar15[5];
              fVar134 = pfVar15[6];
              pfVar16 = (float *)((long)pvVar291 + lVar318 + 0x100);
              fVar135 = pfVar16[1];
              fVar136 = pfVar16[2];
              fVar137 = pfVar16[3];
              fVar138 = pfVar16[4];
              fVar139 = pfVar16[5];
              fVar140 = pfVar16[6];
              pfVar325 = (float *)((long)pvVar316 + lVar306);
              *pfVar325 = fVar347 + *pfVar314 * *pfVar319 +
                          *pfVar301 * *pfVar2 + *pfVar299 * *pfVar3 +
                          *pfVar323 * *pfVar9 + *pfVar4 * *pfVar12 + *pfVar5 * *pfVar13 +
                          *pfVar11 * *pfVar14 + *pfVar10 * *pfVar15 + auVar360._0_4_ * *pfVar16;
              pfVar325[1] = fVar364 + fVar368 * fVar428 + fVar63 * fVar492 + fVar68 * fVar487 +
                            fVar74 * fVar94 + fVar81 * fVar100 + fVar88 * fVar106 +
                            fVar112 * fVar124 + fVar430 * fVar130 + auVar360._4_4_ * fVar135;
              pfVar325[2] = fVar365 + fVar381 * fVar500 + fVar330 * fVar493 + fVar502 * fVar69 +
                            fVar75 * fVar95 + fVar82 * fVar101 + fVar89 * fVar107 +
                            fVar113 * fVar125 + fVar465 * fVar131 + auVar360._8_4_ * fVar136;
              pfVar325[3] = fVar366 + fVar382 * fVar501 + fVar343 * fVar345 + fVar506 * fVar70 +
                            fVar76 * fVar96 + fVar83 * fVar102 + fVar90 * fVar108 +
                            fVar114 * fVar126 + fVar119 * fVar346 + auVar360._12_4_ * fVar137;
              pfVar325[4] = fVar511 + fVar383 * fVar505 + fVar64 * fVar484 + fVar515 * fVar71 +
                            fVar77 * fVar97 + fVar84 * fVar103 + fVar91 * fVar109 +
                            fVar115 * fVar127 + fVar120 * fVar132 + auVar360._16_4_ * fVar138;
              pfVar325[5] = fVar512 + fVar60 * fVar386 + fVar65 * fVar485 + fVar367 * fVar72 +
                            fVar78 * fVar98 + fVar85 * fVar104 + fVar92 * fVar110 +
                            fVar116 * fVar128 + fVar121 * fVar133 + auVar360._20_4_ * fVar139;
              pfVar325[6] = fVar513 + fVar61 * fVar491 + fVar66 * fVar486 + fVar426 * fVar73 +
                            fVar79 * fVar99 + fVar86 * fVar105 + fVar93 * fVar111 +
                            fVar117 * fVar129 + fVar122 * fVar134 + auVar360._24_4_ * fVar140;
              pfVar325[7] = fVar514 + fVar62 + fVar67 + fVar427 + fVar80 + fVar87 + fVar87 +
                            fVar118 + fVar123 + fVar123;
              lVar306 = lVar306 + 0x20;
            }
            piVar324 = (pointer)((long)piVar324 + lVar306 + 0x40);
            piVar321 = (pointer)((long)piVar321 + lVar306 + 0x40);
            pvVar322 = (void *)((long)pvVar322 + lVar306 + 0x40);
            pvVar316 = (void *)((long)pvVar316 + lVar306);
          }
          local_2a8 = uVar310;
          uVar327 = uVar310 + 1;
        }
      }
      else {
        bVar288 = (byte)iVar290;
        if ((iVar293 == 2 && iVar289 == 2) && bVar288 == 0xf) {
          iVar289 = top_blob->w;
          pvVar315 = (this->super_ConvolutionDepthWise).bias_data.data;
          uVar310 = 0;
          uVar327 = (ulong)(uint)top_blob->h;
          if (top_blob->h < 1) {
            uVar327 = uVar310;
          }
          uVar296 = (ulong)(uint)local_368.c;
          if (local_368.c < 1) {
            uVar296 = uVar310;
          }
          lVar308 = (long)((local_368.w - iVar289) * 0x10) * 4;
          for (; local_268 = CONCAT44(local_268._4_4_,(float)local_268),
              local_318 = CONCAT44(local_318._4_4_,(float)local_318),
              local_298 = CONCAT44(local_298._4_4_,(float)local_298), uVar310 != uVar296;
              uVar310 = uVar310 + 1) {
            if (pvVar315 == (void *)0x0) {
              uVar344 = 0;
              uVar331 = 0;
              uVar488 = 0;
              uVar489 = 0;
            }
            else {
              puVar1 = (undefined8 *)((long)pvVar315 + uVar310 * 0x20);
              uVar331 = *puVar1;
              uVar344 = puVar1[1];
              uVar488 = puVar1[2];
              uVar489 = puVar1[3];
            }
            pauVar312 = (undefined1 (*) [32])
                        (top_blob->cstep * uVar310 * top_blob->elemsize + (long)top_blob->data);
            pvVar291 = (this->weight_data_tm).data;
            lVar318 = (long)(this->weight_data_tm).w * uVar310 * (this->weight_data_tm).elemsize;
            piVar317 = (pointer)(local_368.cstep * uVar310 *
                                 CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) +
                                (long)local_368.data);
            lVar306 = (long)local_368.w *
                      CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
            piVar321 = (pointer)((long)piVar317 + lVar306);
            pvVar322 = (void *)((long)piVar317 + lVar306 * 2);
            puVar1 = (undefined8 *)((long)pvVar291 + lVar318);
            uVar268 = puVar1[2];
            uVar269 = puVar1[3];
            puVar7 = (undefined8 *)((long)pvVar291 + lVar318 + 0x20);
            uVar270 = *puVar7;
            uVar271 = puVar7[1];
            uVar272 = puVar7[2];
            uVar273 = puVar7[3];
            pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x40);
            fVar67 = *pfVar314;
            fVar68 = pfVar314[1];
            local_2e8 = *(pointer *)pfVar314;
            fStack_2e0 = pfVar314[2];
            fStack_2dc = pfVar314[3];
            fStack_2d8 = pfVar314[4];
            fStack_2d4 = pfVar314[5];
            fStack_2d0 = pfVar314[6];
            fStack_2cc = pfVar314[7];
            puVar8 = (ulong *)((long)pvVar291 + lVar318 + 0x60);
            piVar324 = (pointer)*puVar8;
            uVar300 = puVar8[1];
            fStack_2f8 = *(float *)(puVar8 + 2);
            fStack_2f4 = *(float *)((long)puVar8 + 0x14);
            fStack_2f0 = *(float *)(puVar8 + 3);
            fStack_2ec = *(float *)((long)puVar8 + 0x1c);
            pauVar313 = (undefined1 (*) [16])((long)pvVar291 + lVar318 + 0x80);
            _local_2c8 = *pauVar313;
            fStack_2b8 = *(float *)pauVar313[1];
            fStack_2b4 = *(float *)(pauVar313[1] + 4);
            fStack_2b0 = *(float *)(pauVar313[1] + 8);
            fStack_2ac = *(float *)(pauVar313[1] + 0xc);
            puVar7 = (undefined8 *)((long)pvVar291 + lVar318 + 0xa0);
            uVar274 = puVar7[2];
            uStack_280 = puVar7[3];
            pfVar314 = (float *)((long)pvVar291 + lVar318 + 0xc0);
            fVar347 = *pfVar314;
            fVar364 = pfVar314[1];
            fVar365 = pfVar314[2];
            fVar366 = pfVar314[3];
            fVar511 = pfVar314[4];
            fVar512 = pfVar314[5];
            fVar513 = pfVar314[6];
            pfVar314 = (float *)((long)pvVar291 + lVar318 + 0xe0);
            fVar514 = *pfVar314;
            fVar368 = pfVar314[1];
            fVar381 = pfVar314[2];
            fVar382 = pfVar314[3];
            fVar383 = pfVar314[4];
            fVar60 = pfVar314[5];
            fVar61 = pfVar314[6];
            pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x100);
            fVar62 = *pfVar314;
            fVar63 = pfVar314[1];
            fVar330 = pfVar314[2];
            fVar343 = pfVar314[3];
            fVar64 = pfVar314[4];
            fVar65 = pfVar314[5];
            fVar66 = pfVar314[6];
            local_3b8 = (float)*puVar1;
            fStack_3b4 = (float)((ulong)*puVar1 >> 0x20);
            fStack_3b0 = (float)puVar1[1];
            fStack_3ac = (float)((ulong)puVar1[1] >> 0x20);
            local_298._0_4_ = (float)*puVar7;
            local_298._4_4_ = (float)((ulong)*puVar7 >> 0x20);
            fStack_290 = (float)puVar7[1];
            fStack_28c = (float)((ulong)puVar7[1] >> 0x20);
            for (iVar304 = 0; iVar304 != (int)uVar327; iVar304 = iVar304 + 1) {
              lVar306 = 0;
              iVar309 = 0;
              fVar502 = fStack_2cc;
              fVar506 = fStack_2ec;
              fVar515 = fStack_2ac;
              while( true ) {
                fStack_3a8 = (float)uVar268;
                fStack_3a4 = (float)((ulong)uVar268 >> 0x20);
                fStack_3a0 = (float)uVar269;
                local_3d8._0_4_ = (float)uVar331;
                local_3d8._4_4_ = (float)((ulong)uVar331 >> 0x20);
                fStack_3d0 = (float)uVar344;
                fStack_3cc = (float)((ulong)uVar344 >> 0x20);
                fStack_3c8 = (float)uVar488;
                fStack_3c4 = (float)((ulong)uVar488 >> 0x20);
                fStack_3c0 = (float)uVar489;
                fStack_3bc = (float)((ulong)uVar489 >> 0x20);
                local_398 = (float)uVar270;
                fStack_394 = (float)((ulong)uVar270 >> 0x20);
                fStack_390 = (float)uVar271;
                fStack_38c = (float)((ulong)uVar271 >> 0x20);
                fStack_388 = (float)uVar272;
                fStack_384 = (float)((ulong)uVar272 >> 0x20);
                fStack_380 = (float)uVar273;
                local_308._0_4_ = SUB84(piVar324,0);
                local_308._4_4_ = (float)((ulong)piVar324 >> 0x20);
                uStack_300._0_4_ = (float)uVar300;
                uStack_300._4_4_ = (float)(uVar300 >> 0x20);
                uStack_288._0_4_ = (float)uVar274;
                uStack_288._4_4_ = (float)((ulong)uVar274 >> 0x20);
                if (iVar289 <= iVar309 + 3) break;
                pfVar325 = (float *)((long)piVar317 + lVar306 + 0x40);
                fVar367 = pfVar325[7];
                pfVar11 = (float *)((long)piVar317 + lVar306 + 0x80);
                pfVar12 = (float *)((long)piVar317 + lVar306 + 0xc0);
                fStack_39c = (float)((ulong)uVar269 >> 0x20);
                pfVar314 = (float *)((long)piVar317 + lVar306);
                fVar500 = fVar502 + fStack_3bc;
                fVar505 = fVar506 + fStack_3bc;
                fVar515 = fVar515 + fStack_3bc;
                fStack_37c = (float)((ulong)uVar273 >> 0x20);
                pfVar301 = (float *)((long)piVar317 + lVar306 + 0x20);
                pfVar299 = (float *)((long)piVar317 + lVar306 + 0x60);
                pfVar13 = (float *)((long)piVar317 + lVar306 + 0xa0);
                pfVar14 = (float *)((long)piVar317 + lVar306 + 0xe0);
                pfVar15 = (float *)((long)piVar317 + lVar306 + 0x100);
                pfVar2 = (float *)((long)piVar321 + lVar306 + 0x40);
                pfVar16 = (float *)((long)piVar321 + lVar306 + 0x80);
                pfVar17 = (float *)((long)piVar321 + lVar306 + 0xc0);
                pfVar319 = (float *)((long)piVar321 + lVar306);
                pfVar3 = (float *)((long)piVar321 + lVar306 + 0x20);
                pfVar4 = (float *)((long)piVar321 + lVar306 + 0x60);
                fVar501 = fVar500 + fVar515;
                pfVar18 = (float *)((long)piVar321 + lVar306 + 0xa0);
                fVar506 = fVar505 + fVar515;
                pfVar19 = (float *)((long)piVar321 + lVar306 + 0xe0);
                fVar426 = pfVar12[7] + fVar515 + pfVar2[7];
                fVar427 = fVar501 + fVar426;
                fVar428 = fVar506 + fVar427;
                pfVar20 = (float *)((long)piVar321 + lVar306 + 0x100);
                pfVar5 = (float *)((long)pvVar322 + lVar306 + 0x40);
                pfVar21 = (float *)((long)pvVar322 + lVar306 + 0x80);
                in_register_0000135c = pfVar21[7];
                pfVar323 = (float *)((long)pvVar322 + lVar306);
                pfVar22 = (float *)((long)pvVar322 + lVar306 + 0xc0);
                pfVar9 = (float *)((long)pvVar322 + lVar306 + 0x20);
                pfVar10 = (float *)((long)pvVar322 + lVar306 + 0x60);
                pfVar23 = (float *)((long)pvVar322 + lVar306 + 0xa0);
                fVar502 = fVar506 + fVar501;
                pfVar24 = (float *)((long)pvVar322 + lVar306 + 0xe0);
                fVar506 = fVar515 + fVar506;
                in_register_0000131c = pfVar16[7] + fVar501 + pfVar5[7];
                auVar361._0_4_ =
                     local_3b8 * *pfVar314 + (float)local_3d8 +
                     *pfVar325 * fVar67 + local_398 * *pfVar301 +
                     (float)local_308 * *pfVar319 + (float)local_2c8._0_4_ * *pfVar3 +
                     *pfVar2 * (float)local_298 +
                     fVar347 * *pfVar323 + fVar514 * *pfVar9 + fVar62 * *pfVar5;
                auVar361._4_4_ =
                     fStack_3b4 * pfVar314[1] + local_3d8._4_4_ +
                     pfVar325[1] * fVar68 + fStack_394 * pfVar301[1] +
                     local_308._4_4_ * pfVar319[1] + (float)local_2c8._4_4_ * pfVar3[1] +
                     pfVar2[1] * local_298._4_4_ +
                     fVar364 * pfVar323[1] + fVar368 * pfVar9[1] + fVar63 * pfVar5[1];
                auVar361._8_4_ =
                     fStack_3b0 * pfVar314[2] + fStack_3d0 +
                     pfVar325[2] * fStack_2e0 + fStack_390 * pfVar301[2] +
                     (float)uStack_300 * pfVar319[2] + fStack_2c0 * pfVar3[2] +
                     pfVar2[2] * fStack_290 +
                     fVar365 * pfVar323[2] + fVar381 * pfVar9[2] + fVar330 * pfVar5[2];
                auVar361._12_4_ =
                     fStack_3ac * pfVar314[3] + fStack_3cc +
                     pfVar325[3] * fStack_2dc + fStack_38c * pfVar301[3] +
                     uStack_300._4_4_ * pfVar319[3] + fStack_2bc * pfVar3[3] +
                     pfVar2[3] * fStack_28c +
                     fVar366 * pfVar323[3] + fVar382 * pfVar9[3] + fVar343 * pfVar5[3];
                auVar361._16_4_ =
                     fStack_3a8 * pfVar314[4] + fStack_3c8 +
                     pfVar325[4] * fStack_2d8 + fStack_388 * pfVar301[4] +
                     fStack_2f8 * pfVar319[4] + fStack_2b8 * pfVar3[4] +
                     pfVar2[4] * (float)uStack_288 +
                     fVar511 * pfVar323[4] + fVar383 * pfVar9[4] + fVar64 * pfVar5[4];
                auVar361._20_4_ =
                     fStack_3a4 * pfVar314[5] + fStack_3c4 +
                     pfVar325[5] * fStack_2d4 + fStack_384 * pfVar301[5] +
                     fStack_2f4 * pfVar319[5] + fStack_2b4 * pfVar3[5] +
                     pfVar2[5] * uStack_288._4_4_ +
                     fVar512 * pfVar323[5] + fVar60 * pfVar9[5] + fVar65 * pfVar5[5];
                auVar361._24_4_ =
                     fStack_3a0 * pfVar314[6] + fStack_3c0 +
                     pfVar325[6] * fStack_2d0 + fStack_380 * pfVar301[6] +
                     fStack_2f0 * pfVar319[6] + fStack_2b0 * pfVar3[6] +
                     pfVar2[6] * (float)uStack_280 +
                     fVar513 * pfVar323[6] + fVar61 * pfVar9[6] + fVar66 * pfVar5[6];
                auVar361._28_4_ = fVar500 + fVar367 + fStack_3bc + fVar426 + in_register_0000131c;
                auVar363 = ZEXT3264(auVar361);
                in_register_0000131c = pfVar12[7] + fVar515 + fVar501 + in_register_0000131c;
                auVar380._0_4_ =
                     *pfVar325 * local_3b8 + (float)local_3d8 +
                     *pfVar11 * fVar67 + local_398 * *pfVar299 +
                     *pfVar2 * (float)local_308 + (float)local_2c8._0_4_ * *pfVar4 +
                     *pfVar16 * (float)local_298 +
                     *pfVar5 * fVar347 + fVar514 * *pfVar10 + fVar62 * *pfVar21;
                auVar380._4_4_ =
                     pfVar325[1] * fStack_3b4 + local_3d8._4_4_ +
                     pfVar11[1] * fVar68 + fStack_394 * pfVar299[1] +
                     pfVar2[1] * local_308._4_4_ + (float)local_2c8._4_4_ * pfVar4[1] +
                     pfVar16[1] * local_298._4_4_ +
                     pfVar5[1] * fVar364 + fVar368 * pfVar10[1] + fVar63 * pfVar21[1];
                auVar380._8_4_ =
                     pfVar325[2] * fStack_3b0 + fStack_3d0 +
                     pfVar11[2] * fStack_2e0 + fStack_390 * pfVar299[2] +
                     pfVar2[2] * (float)uStack_300 + fStack_2c0 * pfVar4[2] +
                     pfVar16[2] * fStack_290 +
                     pfVar5[2] * fVar365 + fVar381 * pfVar10[2] + fVar330 * pfVar21[2];
                auVar380._12_4_ =
                     pfVar325[3] * fStack_3ac + fStack_3cc +
                     pfVar11[3] * fStack_2dc + fStack_38c * pfVar299[3] +
                     pfVar2[3] * uStack_300._4_4_ + fStack_2bc * pfVar4[3] + pfVar16[3] * fStack_28c
                     + pfVar5[3] * fVar366 + fVar382 * pfVar10[3] + fVar343 * pfVar21[3];
                auVar380._16_4_ =
                     pfVar325[4] * fStack_3a8 + fStack_3c8 +
                     pfVar11[4] * fStack_2d8 + fStack_388 * pfVar299[4] +
                     pfVar2[4] * fStack_2f8 + fStack_2b8 * pfVar4[4] +
                     pfVar16[4] * (float)uStack_288 +
                     pfVar5[4] * fVar511 + fVar383 * pfVar10[4] + fVar64 * pfVar21[4];
                auVar380._20_4_ =
                     pfVar325[5] * fStack_3a4 + fStack_3c4 +
                     pfVar11[5] * fStack_2d4 + fStack_384 * pfVar299[5] +
                     pfVar2[5] * fStack_2f4 + fStack_2b4 * pfVar4[5] + pfVar16[5] * uStack_288._4_4_
                     + pfVar5[5] * fVar512 + fVar60 * pfVar10[5] + fVar65 * pfVar21[5];
                auVar380._24_4_ =
                     pfVar325[6] * fStack_3a0 + fStack_3c0 +
                     pfVar11[6] * fStack_2d0 + fStack_380 * pfVar299[6] +
                     pfVar2[6] * fStack_2f0 + fStack_2b0 * pfVar4[6] +
                     pfVar16[6] * (float)uStack_280 +
                     pfVar5[6] * fVar513 + fVar61 * pfVar10[6] + fVar66 * pfVar21[6];
                auVar380._28_4_ =
                     fVar505 + fVar367 + in_ZMM2._28_4_ + fVar427 + in_register_0000131c;
                in_ZMM2 = ZEXT3264(auVar380);
                in_register_0000131c = fVar502 + in_register_0000131c;
                auVar408._0_4_ =
                     *pfVar11 * local_3b8 + (float)local_3d8 +
                     *pfVar12 * fVar67 + local_398 * *pfVar13 +
                     *pfVar16 * (float)local_308 + (float)local_2c8._0_4_ * *pfVar18 +
                     *pfVar17 * (float)local_298 +
                     *pfVar21 * fVar347 + fVar514 * *pfVar23 + *pfVar22 * fVar62;
                auVar408._4_4_ =
                     pfVar11[1] * fStack_3b4 + local_3d8._4_4_ +
                     pfVar12[1] * fVar68 + fStack_394 * pfVar13[1] +
                     pfVar16[1] * local_308._4_4_ + (float)local_2c8._4_4_ * pfVar18[1] +
                     pfVar17[1] * local_298._4_4_ +
                     pfVar21[1] * fVar364 + fVar368 * pfVar23[1] + pfVar22[1] * fVar63;
                auVar408._8_4_ =
                     pfVar11[2] * fStack_3b0 + fStack_3d0 +
                     pfVar12[2] * fStack_2e0 + fStack_390 * pfVar13[2] +
                     pfVar16[2] * (float)uStack_300 + fStack_2c0 * pfVar18[2] +
                     pfVar17[2] * fStack_290 +
                     pfVar21[2] * fVar365 + fVar381 * pfVar23[2] + pfVar22[2] * fVar330;
                auVar408._12_4_ =
                     pfVar11[3] * fStack_3ac + fStack_3cc +
                     pfVar12[3] * fStack_2dc + fStack_38c * pfVar13[3] +
                     pfVar16[3] * uStack_300._4_4_ + fStack_2bc * pfVar18[3] +
                     pfVar17[3] * fStack_28c +
                     pfVar21[3] * fVar366 + fVar382 * pfVar23[3] + pfVar22[3] * fVar343;
                auVar408._16_4_ =
                     pfVar11[4] * fStack_3a8 + fStack_3c8 +
                     pfVar12[4] * fStack_2d8 + fStack_388 * pfVar13[4] +
                     pfVar16[4] * fStack_2f8 + fStack_2b8 * pfVar18[4] +
                     pfVar17[4] * (float)uStack_288 +
                     pfVar21[4] * fVar511 + fVar383 * pfVar23[4] + pfVar22[4] * fVar64;
                auVar408._20_4_ =
                     pfVar11[5] * fStack_3a4 + fStack_3c4 +
                     pfVar12[5] * fStack_2d4 + fStack_384 * pfVar13[5] +
                     pfVar16[5] * fStack_2f4 + fStack_2b4 * pfVar18[5] +
                     pfVar17[5] * uStack_288._4_4_ +
                     pfVar21[5] * fVar512 + fVar60 * pfVar23[5] + pfVar22[5] * fVar65;
                auVar408._24_4_ =
                     pfVar11[6] * fStack_3a0 + fStack_3c0 +
                     pfVar12[6] * fStack_2d0 + fStack_380 * pfVar13[6] +
                     pfVar16[6] * fStack_2f0 + fStack_2b0 * pfVar18[6] +
                     pfVar17[6] * (float)uStack_280 +
                     pfVar21[6] * fVar513 + fVar61 * pfVar23[6] + pfVar22[6] * fVar66;
                auVar408._28_4_ =
                     fVar515 + fVar367 + in_ZMM3._28_4_ + fVar428 + in_register_0000131c;
                in_ZMM3 = ZEXT3264(auVar408);
                pfVar314 = (float *)((long)pvVar322 + lVar306 + 0x100);
                in_register_0000131c = fVar506 + in_register_0000131c;
                auVar339._0_4_ =
                     *pfVar12 * local_3b8 + (float)local_3d8 +
                     fVar67 * *pfVar15 + local_398 * *pfVar14 +
                     (float)local_2c8._0_4_ * *pfVar19 + *pfVar17 * (float)local_308 +
                     (float)local_298 * *pfVar20 +
                     *pfVar22 * fVar347 + fVar514 * *pfVar24 + fVar62 * *pfVar314;
                auVar339._4_4_ =
                     pfVar12[1] * fStack_3b4 + local_3d8._4_4_ +
                     fVar68 * pfVar15[1] + fStack_394 * pfVar14[1] +
                     (float)local_2c8._4_4_ * pfVar19[1] + pfVar17[1] * local_308._4_4_ +
                     local_298._4_4_ * pfVar20[1] +
                     pfVar22[1] * fVar364 + fVar368 * pfVar24[1] + fVar63 * pfVar314[1];
                auVar339._8_4_ =
                     pfVar12[2] * fStack_3b0 + fStack_3d0 +
                     fStack_2e0 * pfVar15[2] + fStack_390 * pfVar14[2] +
                     fStack_2c0 * pfVar19[2] + pfVar17[2] * (float)uStack_300 +
                     fStack_290 * pfVar20[2] +
                     pfVar22[2] * fVar365 + fVar381 * pfVar24[2] + fVar330 * pfVar314[2];
                auVar339._12_4_ =
                     pfVar12[3] * fStack_3ac + fStack_3cc +
                     fStack_2dc * pfVar15[3] + fStack_38c * pfVar14[3] +
                     fStack_2bc * pfVar19[3] + pfVar17[3] * uStack_300._4_4_ +
                     fStack_28c * pfVar20[3] +
                     pfVar22[3] * fVar366 + fVar382 * pfVar24[3] + fVar343 * pfVar314[3];
                auVar339._16_4_ =
                     pfVar12[4] * fStack_3a8 + fStack_3c8 +
                     fStack_2d8 * pfVar15[4] + fStack_388 * pfVar14[4] +
                     fStack_2b8 * pfVar19[4] + pfVar17[4] * fStack_2f8 +
                     (float)uStack_288 * pfVar20[4] +
                     pfVar22[4] * fVar511 + fVar383 * pfVar24[4] + fVar64 * pfVar314[4];
                auVar339._20_4_ =
                     pfVar12[5] * fStack_3a4 + fStack_3c4 +
                     fStack_2d4 * pfVar15[5] + fStack_384 * pfVar14[5] +
                     fStack_2b4 * pfVar19[5] + pfVar17[5] * fStack_2f4 +
                     uStack_288._4_4_ * pfVar20[5] +
                     pfVar22[5] * fVar512 + fVar60 * pfVar24[5] + fVar65 * pfVar314[5];
                auVar339._24_4_ =
                     pfVar12[6] * fStack_3a0 + fStack_3c0 +
                     fStack_2d0 * pfVar15[6] + fStack_380 * pfVar14[6] +
                     fStack_2b0 * pfVar19[6] + pfVar17[6] * fStack_2f0 +
                     (float)uStack_280 * pfVar20[6] +
                     pfVar22[6] * fVar513 + fVar61 * pfVar24[6] + fVar66 * pfVar314[6];
                auVar339._28_4_ =
                     fStack_39c + fStack_3bc + fVar367 + fStack_37c + fVar515 + fStack_2ec + fVar428
                     + in_register_0000131c;
                auVar342 = ZEXT3264(auVar339);
                *pauVar312 = auVar361;
                pauVar312[1] = auVar380;
                pauVar312[2] = auVar408;
                pauVar312[3] = auVar339;
                pauVar312 = pauVar312 + 4;
                iVar309 = iVar309 + 4;
                lVar306 = lVar306 + 0x100;
              }
              for (; iVar309 + 1 < iVar289; iVar309 = iVar309 + 2) {
                pfVar325 = (float *)((long)piVar317 + lVar306 + 0x40);
                pfVar314 = (float *)((long)piVar317 + lVar306);
                fVar515 = fStack_3bc + auVar363._28_4_;
                fVar502 = in_ZMM2._28_4_;
                pfVar301 = (float *)((long)piVar317 + lVar306 + 0x20);
                pfVar299 = (float *)((long)piVar317 + lVar306 + 0x60);
                fVar427 = in_ZMM3._28_4_;
                pfVar11 = (float *)((long)piVar317 + lVar306 + 0x80);
                fVar367 = in_register_0000131c + fVar515;
                pfVar2 = (float *)((long)piVar321 + lVar306 + 0x40);
                pfVar319 = (float *)((long)piVar321 + lVar306);
                pfVar3 = (float *)((long)piVar321 + lVar306 + 0x20);
                pfVar4 = (float *)((long)piVar321 + lVar306 + 0x60);
                fVar426 = fVar427 + in_register_0000135c + pfVar2[7];
                pfVar12 = (float *)((long)piVar321 + lVar306 + 0x80);
                fVar386 = in_register_0000131c + in_register_0000135c + fVar426;
                pfVar323 = (float *)((long)pvVar322 + lVar306);
                pfVar5 = (float *)((long)pvVar322 + lVar306 + 0x40);
                fVar506 = pfVar5[7];
                pfVar9 = (float *)((long)pvVar322 + lVar306 + 0x20);
                pfVar10 = (float *)((long)pvVar322 + lVar306 + 0x60);
                in_register_0000131c =
                     in_register_0000131c + in_register_0000135c + in_register_0000135c;
                pfVar13 = (float *)((long)pvVar322 + lVar306 + 0x80);
                in_ZMM3 = ZEXT3264(CONCAT428(fVar506,CONCAT424(fVar66 * pfVar13[6],
                                                               CONCAT420(fVar65 * pfVar13[5],
                                                                         CONCAT416(fVar64 * pfVar13[
                                                  4],CONCAT412(fVar343 * pfVar13[3],
                                                               CONCAT48(fVar330 * pfVar13[2],
                                                                        CONCAT44(fVar63 * pfVar13[1]
                                                                                 ,fVar62 * *pfVar13)
                                                                       )))))));
                auVar340._0_4_ =
                     (float)local_3d8 + local_3b8 * *pfVar314 +
                     local_398 * *pfVar301 + fVar67 * *pfVar325 +
                     (float)local_308 * *pfVar319 + (float)local_2c8._0_4_ * *pfVar3 +
                     *pfVar2 * (float)local_298 +
                     fVar347 * *pfVar323 + fVar514 * *pfVar9 + fVar62 * *pfVar5;
                auVar340._4_4_ =
                     local_3d8._4_4_ + fStack_3b4 * pfVar314[1] +
                     fStack_394 * pfVar301[1] + fVar68 * pfVar325[1] +
                     local_308._4_4_ * pfVar319[1] + (float)local_2c8._4_4_ * pfVar3[1] +
                     pfVar2[1] * local_298._4_4_ +
                     fVar364 * pfVar323[1] + fVar368 * pfVar9[1] + fVar63 * pfVar5[1];
                auVar340._8_4_ =
                     fStack_3d0 + fStack_3b0 * pfVar314[2] +
                     fStack_390 * pfVar301[2] + fStack_2e0 * pfVar325[2] +
                     (float)uStack_300 * pfVar319[2] + fStack_2c0 * pfVar3[2] +
                     pfVar2[2] * fStack_290 +
                     fVar365 * pfVar323[2] + fVar381 * pfVar9[2] + fVar330 * pfVar5[2];
                auVar340._12_4_ =
                     fStack_3cc + fStack_3ac * pfVar314[3] +
                     fStack_38c * pfVar301[3] + fStack_2dc * pfVar325[3] +
                     uStack_300._4_4_ * pfVar319[3] + fStack_2bc * pfVar3[3] +
                     pfVar2[3] * fStack_28c +
                     fVar366 * pfVar323[3] + fVar382 * pfVar9[3] + fVar343 * pfVar5[3];
                auVar340._16_4_ =
                     fStack_3c8 + fStack_3a8 * pfVar314[4] +
                     fStack_388 * pfVar301[4] + fStack_2d8 * pfVar325[4] +
                     fStack_2f8 * pfVar319[4] + fStack_2b8 * pfVar3[4] +
                     pfVar2[4] * (float)uStack_288 +
                     fVar511 * pfVar323[4] + fVar383 * pfVar9[4] + fVar64 * pfVar5[4];
                auVar340._20_4_ =
                     fStack_3c4 + fStack_3a4 * pfVar314[5] +
                     fStack_384 * pfVar301[5] + fStack_2d4 * pfVar325[5] +
                     fStack_2f4 * pfVar319[5] + fStack_2b4 * pfVar3[5] +
                     pfVar2[5] * uStack_288._4_4_ +
                     fVar512 * pfVar323[5] + fVar60 * pfVar9[5] + fVar65 * pfVar5[5];
                auVar340._24_4_ =
                     fStack_3c0 + fStack_3a0 * pfVar314[6] +
                     fStack_380 * pfVar301[6] + fStack_2d0 * pfVar325[6] +
                     fStack_2f0 * pfVar319[6] + fStack_2b0 * pfVar3[6] +
                     pfVar2[6] * (float)uStack_280 +
                     fVar513 * pfVar323[6] + fVar61 * pfVar9[6] + fVar66 * pfVar5[6];
                auVar340._28_4_ =
                     fVar515 + fVar427 + pfVar325[7] + fVar426 +
                     fVar386 + in_register_0000135c + fVar506;
                auVar342 = ZEXT3264(auVar340);
                fVar515 = *pfVar5 * fVar347 + fVar514 * *pfVar10 + fVar62 * *pfVar13;
                fVar426 = pfVar5[1] * fVar364 + fVar368 * pfVar10[1] + fVar63 * pfVar13[1];
                fVar427 = pfVar5[2] * fVar365 + fVar381 * pfVar10[2] + fVar330 * pfVar13[2];
                fVar428 = pfVar5[3] * fVar366 + fVar382 * pfVar10[3] + fVar343 * pfVar13[3];
                fVar500 = pfVar5[4] * fVar511 + fVar383 * pfVar10[4] + fVar64 * pfVar13[4];
                fVar501 = pfVar5[5] * fVar512 + fVar60 * pfVar10[5] + fVar65 * pfVar13[5];
                fVar505 = pfVar5[6] * fVar513 + fVar61 * pfVar10[6] + fVar66 * pfVar13[6];
                in_ZMM2 = ZEXT3264(CONCAT428(in_register_0000131c + fVar506,
                                             CONCAT424(fVar505,CONCAT420(fVar501,CONCAT416(fVar500,
                                                  CONCAT412(fVar428,CONCAT48(fVar427,CONCAT44(
                                                  fVar426,fVar515))))))));
                auVar362._0_4_ =
                     (float)local_3d8 + local_3b8 * *pfVar325 +
                     local_398 * *pfVar299 + fVar67 * *pfVar11 +
                     (float)local_308 * *pfVar2 + (float)local_2c8._0_4_ * *pfVar4 +
                     (float)local_298 * *pfVar12 + fVar515;
                auVar362._4_4_ =
                     local_3d8._4_4_ + fStack_3b4 * pfVar325[1] +
                     fStack_394 * pfVar299[1] + fVar68 * pfVar11[1] +
                     local_308._4_4_ * pfVar2[1] + (float)local_2c8._4_4_ * pfVar4[1] +
                     local_298._4_4_ * pfVar12[1] + fVar426;
                auVar362._8_4_ =
                     fStack_3d0 + fStack_3b0 * pfVar325[2] +
                     fStack_390 * pfVar299[2] + fStack_2e0 * pfVar11[2] +
                     (float)uStack_300 * pfVar2[2] + fStack_2c0 * pfVar4[2] +
                     fStack_290 * pfVar12[2] + fVar427;
                auVar362._12_4_ =
                     fStack_3cc + fStack_3ac * pfVar325[3] +
                     fStack_38c * pfVar299[3] + fStack_2dc * pfVar11[3] +
                     uStack_300._4_4_ * pfVar2[3] + fStack_2bc * pfVar4[3] + fStack_28c * pfVar12[3]
                     + fVar428;
                auVar362._16_4_ =
                     fStack_3c8 + fStack_3a8 * pfVar325[4] +
                     fStack_388 * pfVar299[4] + fStack_2d8 * pfVar11[4] +
                     fStack_2f8 * pfVar2[4] + fStack_2b8 * pfVar4[4] +
                     (float)uStack_288 * pfVar12[4] + fVar500;
                auVar362._20_4_ =
                     fStack_3c4 + fStack_3a4 * pfVar325[5] +
                     fStack_384 * pfVar299[5] + fStack_2d4 * pfVar11[5] +
                     fStack_2f4 * pfVar2[5] + fStack_2b4 * pfVar4[5] + uStack_288._4_4_ * pfVar12[5]
                     + fVar501;
                auVar362._24_4_ =
                     fStack_3c0 + fStack_3a0 * pfVar325[6] +
                     fStack_380 * pfVar299[6] + fStack_2d0 * pfVar11[6] +
                     fStack_2f0 * pfVar2[6] + fStack_2b0 * pfVar4[6] +
                     (float)uStack_280 * pfVar12[6] + fVar505;
                auVar362._28_4_ =
                     fStack_3bc + fVar502 + fVar367 + fVar386 + in_register_0000131c + fVar506;
                auVar363 = ZEXT3264(auVar362);
                *pauVar312 = auVar340;
                pauVar312[1] = auVar362;
                pauVar312 = pauVar312 + 2;
                lVar306 = lVar306 + 0x80;
              }
              for (; iVar309 < iVar289; iVar309 = iVar309 + 1) {
                pfVar314 = (float *)((long)piVar317 + lVar306);
                pfVar325 = (float *)((long)piVar317 + lVar306 + 0x20);
                pfVar301 = (float *)((long)piVar317 + lVar306 + 0x40);
                fVar502 = in_ZMM2._28_4_;
                fVar501 = auVar363._28_4_ + fVar502;
                pfVar319 = (float *)((long)piVar321 + lVar306);
                pfVar299 = (float *)((long)piVar321 + lVar306 + 0x20);
                pfVar323 = (float *)((long)piVar321 + lVar306 + 0x40);
                auVar409._0_4_ = (float)local_298 * *pfVar323;
                auVar409._4_4_ = local_298._4_4_ * pfVar323[1];
                auVar409._8_4_ = fStack_290 * pfVar323[2];
                auVar409._12_4_ = fStack_28c * pfVar323[3];
                auVar409._16_4_ = (float)uStack_288 * pfVar323[4];
                auVar409._20_4_ = uStack_288._4_4_ * pfVar323[5];
                auVar409._28_36_ = in_ZMM3._28_36_;
                auVar409._24_4_ = (float)uStack_280 * pfVar323[6];
                fVar505 = fVar501 + fVar502 + in_ZMM3._28_4_;
                pfVar323 = (float *)((long)pvVar322 + lVar306);
                pfVar2 = (float *)((long)pvVar322 + lVar306 + 0x20);
                pfVar3 = (float *)((long)pvVar322 + lVar306 + 0x40);
                in_ZMM2 = ZEXT3264(CONCAT428(fVar502,CONCAT424(fVar66 * pfVar3[6],
                                                               CONCAT420(fVar65 * pfVar3[5],
                                                                         CONCAT416(fVar64 * pfVar3[4
                                                  ],CONCAT412(fVar343 * pfVar3[3],
                                                              CONCAT48(fVar330 * pfVar3[2],
                                                                       CONCAT44(fVar63 * pfVar3[1],
                                                                                fVar62 * *pfVar3))))
                                                  ))));
                fVar506 = fVar347 * *pfVar323 + fVar514 * *pfVar2 + fVar62 * *pfVar3;
                fVar515 = fVar364 * pfVar323[1] + fVar368 * pfVar2[1] + fVar63 * pfVar3[1];
                fVar367 = fVar365 * pfVar323[2] + fVar381 * pfVar2[2] + fVar330 * pfVar3[2];
                fVar426 = fVar366 * pfVar323[3] + fVar382 * pfVar2[3] + fVar343 * pfVar3[3];
                fVar427 = fVar511 * pfVar323[4] + fVar383 * pfVar2[4] + fVar64 * pfVar3[4];
                fVar428 = fVar512 * pfVar323[5] + fVar60 * pfVar2[5] + fVar65 * pfVar3[5];
                fVar500 = fVar513 * pfVar323[6] + fVar61 * pfVar2[6] + fVar66 * pfVar3[6];
                fVar502 = fVar502 + fVar505 + fVar502;
                auVar363 = ZEXT3264(CONCAT428(fVar502,CONCAT424(fVar500,CONCAT420(fVar428,CONCAT416(
                                                  fVar427,CONCAT412(fVar426,CONCAT48(fVar367,
                                                  CONCAT44(fVar515,fVar506))))))));
                auVar341._0_4_ =
                     (float)local_3d8 + local_3b8 * *pfVar314 +
                     local_398 * *pfVar325 + fVar67 * *pfVar301 +
                     (float)local_308 * *pfVar319 + (float)local_2c8._0_4_ * *pfVar299 +
                     auVar409._0_4_ + fVar506;
                auVar341._4_4_ =
                     local_3d8._4_4_ + fStack_3b4 * pfVar314[1] +
                     fStack_394 * pfVar325[1] + fVar68 * pfVar301[1] +
                     local_308._4_4_ * pfVar319[1] + (float)local_2c8._4_4_ * pfVar299[1] +
                     auVar409._4_4_ + fVar515;
                auVar341._8_4_ =
                     fStack_3d0 + fStack_3b0 * pfVar314[2] +
                     fStack_390 * pfVar325[2] + fStack_2e0 * pfVar301[2] +
                     (float)uStack_300 * pfVar319[2] + fStack_2c0 * pfVar299[2] + auVar409._8_4_ +
                     fVar367;
                auVar341._12_4_ =
                     fStack_3cc + fStack_3ac * pfVar314[3] +
                     fStack_38c * pfVar325[3] + fStack_2dc * pfVar301[3] +
                     uStack_300._4_4_ * pfVar319[3] + fStack_2bc * pfVar299[3] + auVar409._12_4_ +
                     fVar426;
                auVar341._16_4_ =
                     fStack_3c8 + fStack_3a8 * pfVar314[4] +
                     fStack_388 * pfVar325[4] + fStack_2d8 * pfVar301[4] +
                     fStack_2f8 * pfVar319[4] + fStack_2b8 * pfVar299[4] + auVar409._16_4_ + fVar427
                ;
                auVar341._20_4_ =
                     fStack_3c4 + fStack_3a4 * pfVar314[5] +
                     fStack_384 * pfVar325[5] + fStack_2d4 * pfVar301[5] +
                     fStack_2f4 * pfVar319[5] + fStack_2b4 * pfVar299[5] + auVar409._20_4_ + fVar428
                ;
                auVar341._24_4_ =
                     fStack_3c0 + fStack_3a0 * pfVar314[6] +
                     fStack_380 * pfVar325[6] + fStack_2d0 * pfVar301[6] +
                     fStack_2f0 * pfVar319[6] + fStack_2b0 * pfVar299[6] + auVar409._24_4_ + fVar500
                ;
                auVar341._28_4_ = fStack_3bc + auVar342._28_4_ + fVar501 + fVar505 + fVar502;
                auVar342 = ZEXT3264(auVar341);
                *pauVar312 = auVar341;
                pauVar312 = pauVar312 + 1;
                lVar306 = lVar306 + 0x40;
                in_ZMM3 = ZEXT3264(auVar409._0_32_);
              }
              piVar317 = (pointer)((long)piVar317 + lVar306 + lVar308);
              piVar321 = (pointer)((long)piVar321 + lVar306 + lVar308);
              pvVar322 = (void *)((long)pvVar322 + lVar306 + lVar308);
            }
            local_308 = piVar324;
            uStack_300 = uVar300;
            uStack_288 = uVar274;
          }
        }
        else {
          bVar288 = bVar288 >> 2 & bVar288 >> 3 & (auVar51._4_4_ == 5 && auVar51._0_4_ == 5);
          if (((iVar289 == 1 && iVar293 == 1) & bVar288) == 1) {
            uVar310 = 0;
            uVar327 = (ulong)(uint)top_blob->w;
            if (top_blob->w < 1) {
              uVar327 = uVar310;
            }
            pvVar315 = (this->super_ConvolutionDepthWise).bias_data.data;
            uVar296 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar296 = uVar310;
            }
            uVar300 = (ulong)(uint)local_368.c;
            if (local_368.c < 1) {
              uVar300 = uVar310;
            }
            for (; local_268 = CONCAT44(local_268._4_4_,(float)local_268),
                local_318 = CONCAT44(local_318._4_4_,(float)local_318),
                local_298 = CONCAT44(local_298._4_4_,(float)local_298), uVar310 != uVar300;
                uVar310 = uVar310 + 1) {
              if (pvVar315 == (void *)0x0) {
                auVar360 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              }
              else {
                auVar360 = *(undefined1 (*) [32])((long)pvVar315 + uVar310 * 0x20);
              }
              pvVar298 = (void *)(top_blob->cstep * uVar310 * top_blob->elemsize +
                                 (long)top_blob->data);
              pvVar291 = (this->weight_data_tm).data;
              lVar306 = (long)(this->weight_data_tm).w * uVar310 * (this->weight_data_tm).elemsize;
              piVar317 = (pointer)(local_368.cstep * uVar310 *
                                   CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize)
                                  + (long)local_368.data);
              lVar308 = (long)local_368.w *
                        CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
              piVar321 = (pointer)((long)piVar317 + lVar308);
              pvVar322 = (void *)((long)piVar317 + lVar308 * 2);
              pvVar307 = (void *)(lVar308 * 3 + (long)piVar317);
              piVar324 = piVar317 + lVar308;
              for (iVar289 = 0; iVar289 != (int)uVar296; iVar289 = iVar289 + 1) {
                lVar308 = 0;
                uVar292 = uVar327;
                while (iVar304 = (int)uVar292, uVar292 = (ulong)(iVar304 - 1), iVar304 != 0) {
                  pfVar314 = (float *)((long)pvVar291 + lVar306);
                  fVar347 = pfVar314[1];
                  fVar364 = pfVar314[2];
                  fVar365 = pfVar314[3];
                  fVar366 = pfVar314[4];
                  fVar511 = pfVar314[5];
                  fVar512 = pfVar314[6];
                  fVar513 = pfVar314[7];
                  pfVar299 = (float *)((long)pvVar291 + lVar306 + 0x20);
                  fVar514 = pfVar299[1];
                  fVar368 = pfVar299[2];
                  fVar381 = pfVar299[3];
                  fVar382 = pfVar299[4];
                  fVar383 = pfVar299[5];
                  fVar60 = pfVar299[6];
                  pfVar2 = (float *)((long)pvVar291 + lVar306 + 0x40);
                  fVar61 = pfVar2[1];
                  fVar62 = pfVar2[2];
                  fVar63 = pfVar2[3];
                  fVar330 = pfVar2[4];
                  fVar343 = pfVar2[5];
                  fVar64 = pfVar2[6];
                  pfVar3 = (float *)((long)pvVar291 + lVar306 + 0x60);
                  fVar65 = pfVar3[1];
                  fVar66 = pfVar3[2];
                  fVar67 = pfVar3[3];
                  fVar68 = pfVar3[4];
                  fVar502 = pfVar3[5];
                  fVar506 = pfVar3[6];
                  pfVar319 = (float *)((long)piVar317 + lVar308);
                  fVar515 = pfVar319[1];
                  fVar367 = pfVar319[2];
                  fVar426 = pfVar319[3];
                  fVar427 = pfVar319[4];
                  fVar428 = pfVar319[5];
                  fVar500 = pfVar319[6];
                  pfVar24 = (float *)((long)pvVar291 + lVar306 + 0x80);
                  fVar501 = pfVar24[1];
                  fVar505 = pfVar24[2];
                  fVar386 = pfVar24[3];
                  fVar491 = pfVar24[4];
                  fVar492 = pfVar24[5];
                  fVar493 = pfVar24[6];
                  pfVar4 = (float *)((long)piVar317 + lVar308 + 0x20);
                  fVar345 = pfVar4[1];
                  fVar484 = pfVar4[2];
                  fVar485 = pfVar4[3];
                  fVar486 = pfVar4[4];
                  fVar487 = pfVar4[5];
                  fVar69 = pfVar4[6];
                  pfVar5 = (float *)((long)piVar317 + lVar308 + 0x40);
                  fVar70 = pfVar5[1];
                  fVar71 = pfVar5[2];
                  fVar72 = pfVar5[3];
                  fVar73 = pfVar5[4];
                  fVar74 = pfVar5[5];
                  fVar75 = pfVar5[6];
                  fVar387 = pfVar299[7] + pfVar2[7];
                  pfVar9 = (float *)((long)piVar317 + lVar308 + 0x60);
                  fVar76 = pfVar9[1];
                  fVar77 = pfVar9[2];
                  fVar78 = pfVar9[3];
                  fVar79 = pfVar9[4];
                  fVar80 = pfVar9[5];
                  fVar81 = pfVar9[6];
                  pfVar25 = (float *)((long)piVar317 + lVar308 + 0x80);
                  fVar82 = pfVar25[1];
                  fVar83 = pfVar25[2];
                  fVar84 = pfVar25[3];
                  fVar85 = pfVar25[4];
                  fVar86 = pfVar25[5];
                  fVar87 = pfVar25[6];
                  pfVar26 = (float *)((long)pvVar291 + lVar306 + 0xa0);
                  fVar88 = pfVar26[1];
                  fVar89 = pfVar26[2];
                  fVar90 = pfVar26[3];
                  fVar91 = pfVar26[4];
                  fVar92 = pfVar26[5];
                  fVar93 = pfVar26[6];
                  fVar94 = pfVar26[7];
                  pfVar27 = (float *)((long)pvVar291 + lVar306 + 0xc0);
                  fVar95 = pfVar27[1];
                  fVar96 = pfVar27[2];
                  fVar97 = pfVar27[3];
                  fVar98 = pfVar27[4];
                  fVar99 = pfVar27[5];
                  fVar100 = pfVar27[6];
                  fVar101 = pfVar27[7];
                  pfVar28 = (float *)((long)pvVar291 + lVar306 + 0xe0);
                  fVar102 = pfVar28[1];
                  fVar103 = pfVar28[2];
                  fVar104 = pfVar28[3];
                  fVar105 = pfVar28[4];
                  fVar106 = pfVar28[5];
                  fVar107 = pfVar28[6];
                  pfVar29 = (float *)((long)pvVar291 + lVar306 + 0x100);
                  fVar108 = pfVar29[1];
                  fVar109 = pfVar29[2];
                  fVar110 = pfVar29[3];
                  fVar111 = pfVar29[4];
                  fVar112 = pfVar29[5];
                  fVar113 = pfVar29[6];
                  pfVar30 = (float *)((long)pvVar291 + lVar306 + 0x120);
                  fVar114 = pfVar30[1];
                  fVar115 = pfVar30[2];
                  fVar116 = pfVar30[3];
                  fVar117 = pfVar30[4];
                  fVar118 = pfVar30[5];
                  fVar430 = pfVar30[6];
                  pfVar323 = (float *)((long)piVar321 + lVar308);
                  fVar465 = pfVar323[1];
                  fVar119 = pfVar323[2];
                  fVar120 = pfVar323[3];
                  fVar121 = pfVar323[4];
                  fVar122 = pfVar323[5];
                  fVar123 = pfVar323[6];
                  fVar388 = fVar387 + pfVar2[7] + fVar94;
                  pfVar10 = (float *)((long)piVar321 + lVar308 + 0x20);
                  fVar124 = pfVar10[1];
                  fVar125 = pfVar10[2];
                  fVar126 = pfVar10[3];
                  fVar127 = pfVar10[4];
                  fVar128 = pfVar10[5];
                  fVar129 = pfVar10[6];
                  pfVar11 = (float *)((long)piVar321 + lVar308 + 0x40);
                  fVar130 = pfVar11[1];
                  fVar131 = pfVar11[2];
                  fVar346 = pfVar11[3];
                  fVar132 = pfVar11[4];
                  fVar133 = pfVar11[5];
                  fVar134 = pfVar11[6];
                  pfVar12 = (float *)((long)piVar321 + lVar308 + 0x60);
                  fVar135 = pfVar12[1];
                  fVar136 = pfVar12[2];
                  fVar137 = pfVar12[3];
                  fVar138 = pfVar12[4];
                  fVar139 = pfVar12[5];
                  fVar140 = pfVar12[6];
                  pfVar31 = (float *)((long)piVar321 + lVar308 + 0x80);
                  fVar141 = pfVar31[1];
                  fVar142 = pfVar31[2];
                  fVar143 = pfVar31[3];
                  fVar144 = pfVar31[4];
                  fVar145 = pfVar31[5];
                  fVar146 = pfVar31[6];
                  pfVar32 = (float *)((long)pvVar291 + lVar306 + 0x140);
                  fVar147 = pfVar32[1];
                  fVar148 = pfVar32[2];
                  fVar149 = pfVar32[3];
                  fVar437 = pfVar32[4];
                  fVar464 = pfVar32[5];
                  fVar150 = pfVar32[6];
                  fVar151 = pfVar32[7];
                  pfVar33 = (float *)((long)pvVar291 + lVar306 + 0x160);
                  fVar152 = pfVar33[1];
                  fVar153 = pfVar33[2];
                  fVar154 = pfVar33[3];
                  fVar155 = pfVar33[4];
                  fVar156 = pfVar33[5];
                  fVar157 = pfVar33[6];
                  fVar158 = pfVar33[7];
                  pfVar34 = (float *)((long)pvVar291 + lVar306 + 0x180);
                  fVar159 = pfVar34[1];
                  fVar160 = pfVar34[2];
                  fVar161 = pfVar34[3];
                  fVar162 = pfVar34[4];
                  fVar163 = pfVar34[5];
                  fVar164 = pfVar34[6];
                  fVar165 = pfVar34[7];
                  pfVar35 = (float *)((long)pvVar291 + lVar306 + 0x1a0);
                  fVar166 = pfVar35[1];
                  fVar468 = pfVar35[2];
                  fVar495 = pfVar35[3];
                  fVar167 = pfVar35[4];
                  fVar393 = pfVar35[5];
                  fVar412 = pfVar35[6];
                  pfVar325 = (float *)((long)pvVar322 + lVar308);
                  fVar414 = pfVar325[1];
                  fVar416 = pfVar325[2];
                  fVar425 = pfVar325[3];
                  fVar417 = pfVar325[4];
                  fVar418 = pfVar325[5];
                  fVar421 = pfVar325[6];
                  pfVar36 = (float *)((long)pvVar291 + lVar306 + 0x1c0);
                  fVar438 = pfVar36[1];
                  fVar440 = pfVar36[2];
                  fVar452 = pfVar36[3];
                  fVar454 = pfVar36[4];
                  fVar456 = pfVar36[5];
                  fVar459 = pfVar36[6];
                  pfVar13 = (float *)((long)pvVar322 + lVar308 + 0x20);
                  fVar461 = pfVar13[1];
                  fVar420 = pfVar13[2];
                  fVar490 = pfVar13[3];
                  fVar499 = pfVar13[4];
                  fVar168 = pfVar13[5];
                  fVar169 = pfVar13[6];
                  pfVar14 = (float *)((long)pvVar322 + lVar308 + 0x40);
                  fVar170 = pfVar14[1];
                  fVar384 = pfVar14[2];
                  fVar419 = pfVar14[3];
                  fVar436 = pfVar14[4];
                  fVar470 = pfVar14[5];
                  fVar472 = pfVar14[6];
                  pfVar15 = (float *)((long)pvVar322 + lVar308 + 0x60);
                  fVar474 = pfVar15[1];
                  fVar476 = pfVar15[2];
                  fVar478 = pfVar15[3];
                  fVar480 = pfVar15[4];
                  fVar482 = pfVar15[5];
                  fVar498 = pfVar15[6];
                  pfVar37 = (float *)((long)pvVar322 + lVar308 + 0x80);
                  fVar171 = pfVar37[1];
                  fVar172 = pfVar37[2];
                  fVar173 = pfVar37[3];
                  fVar174 = pfVar37[4];
                  fVar175 = pfVar37[5];
                  fVar176 = pfVar37[6];
                  pfVar38 = (float *)((long)pvVar291 + lVar306 + 0x1e0);
                  fVar177 = pfVar38[1];
                  fVar178 = pfVar38[2];
                  fVar179 = pfVar38[3];
                  fVar180 = pfVar38[4];
                  fVar181 = pfVar38[5];
                  fVar385 = pfVar38[6];
                  pfVar39 = (float *)((long)pvVar291 + lVar306 + 0x200);
                  fVar431 = pfVar39[1];
                  fVar432 = pfVar39[2];
                  fVar433 = pfVar39[3];
                  fVar466 = pfVar39[4];
                  fVar434 = pfVar39[5];
                  fVar439 = pfVar39[6];
                  fVar451 = pfVar39[7];
                  pfVar40 = (float *)((long)pvVar291 + lVar306 + 0x220);
                  fVar453 = pfVar40[1];
                  fVar455 = pfVar40[2];
                  fVar458 = pfVar40[3];
                  fVar497 = pfVar40[4];
                  fVar391 = pfVar40[5];
                  fVar392 = pfVar40[6];
                  pfVar41 = (float *)((long)pvVar291 + lVar306 + 0x240);
                  fVar410 = pfVar41[1];
                  fVar411 = pfVar41[2];
                  fVar413 = pfVar41[3];
                  fVar415 = pfVar41[4];
                  fVar494 = pfVar41[5];
                  fVar457 = pfVar41[6];
                  pfVar22 = (float *)((long)pvVar307 + lVar308);
                  fVar460 = pfVar22[1];
                  fVar462 = pfVar22[2];
                  fVar463 = pfVar22[3];
                  fVar469 = pfVar22[4];
                  fVar471 = pfVar22[5];
                  fVar473 = pfVar22[6];
                  pfVar42 = (float *)((long)pvVar291 + lVar306 + 0x260);
                  fVar475 = pfVar42[1];
                  fVar477 = pfVar42[2];
                  fVar479 = pfVar42[3];
                  fVar481 = pfVar42[4];
                  fVar483 = pfVar42[5];
                  fVar496 = pfVar42[6];
                  pfVar16 = (float *)((long)pvVar307 + lVar308 + 0x20);
                  fVar182 = pfVar16[1];
                  fVar183 = pfVar16[2];
                  fVar184 = pfVar16[3];
                  fVar185 = pfVar16[4];
                  fVar186 = pfVar16[5];
                  fVar187 = pfVar16[6];
                  pfVar17 = (float *)((long)pvVar307 + lVar308 + 0x40);
                  fVar188 = pfVar17[1];
                  fVar189 = pfVar17[2];
                  fVar190 = pfVar17[3];
                  fVar191 = pfVar17[4];
                  fVar192 = pfVar17[5];
                  fVar193 = pfVar17[6];
                  pfVar18 = (float *)((long)pvVar307 + lVar308 + 0x60);
                  fVar194 = pfVar18[1];
                  fVar195 = pfVar18[2];
                  fVar196 = pfVar18[3];
                  fVar197 = pfVar18[4];
                  fVar198 = pfVar18[5];
                  fVar199 = pfVar18[6];
                  pfVar43 = (float *)((long)pvVar307 + lVar308 + 0x80);
                  fVar200 = pfVar43[1];
                  fVar201 = pfVar43[2];
                  fVar202 = pfVar43[3];
                  fVar203 = pfVar43[4];
                  fVar204 = pfVar43[5];
                  fVar205 = pfVar43[6];
                  pfVar44 = (float *)((long)pvVar291 + lVar306 + 0x280);
                  fVar206 = pfVar44[1];
                  fVar207 = pfVar44[2];
                  fVar208 = pfVar44[3];
                  fVar209 = pfVar44[4];
                  fVar210 = pfVar44[5];
                  fVar211 = pfVar44[6];
                  fVar212 = pfVar44[7];
                  pfVar45 = (float *)((long)pvVar291 + lVar306 + 0x2a0);
                  fVar213 = pfVar45[1];
                  fVar214 = pfVar45[2];
                  fVar215 = pfVar45[3];
                  fVar216 = pfVar45[4];
                  fVar217 = pfVar45[5];
                  fVar218 = pfVar45[6];
                  fVar219 = pfVar45[7];
                  pfVar46 = (float *)((long)pvVar291 + lVar306 + 0x2c0);
                  fVar220 = pfVar46[1];
                  fVar221 = pfVar46[2];
                  fVar222 = pfVar46[3];
                  fVar223 = pfVar46[4];
                  fVar224 = pfVar46[5];
                  fVar225 = pfVar46[6];
                  pfVar47 = (float *)((long)pvVar291 + lVar306 + 0x2e0);
                  fVar226 = pfVar47[1];
                  fVar227 = pfVar47[2];
                  fVar228 = pfVar47[3];
                  fVar229 = pfVar47[4];
                  fVar230 = pfVar47[5];
                  fVar231 = pfVar47[6];
                  pfVar48 = (float *)((long)pvVar291 + lVar306 + 0x300);
                  fVar232 = pfVar48[1];
                  fVar233 = pfVar48[2];
                  fVar234 = pfVar48[3];
                  fVar235 = pfVar48[4];
                  fVar236 = pfVar48[5];
                  fVar237 = pfVar48[6];
                  pfVar23 = (float *)((long)piVar324 + lVar308);
                  fVar238 = pfVar23[1];
                  fVar239 = pfVar23[2];
                  fVar240 = pfVar23[3];
                  fVar241 = pfVar23[4];
                  fVar242 = pfVar23[5];
                  fVar243 = pfVar23[6];
                  fVar389 = pfVar38[7] + fVar451 + fVar451 + pfVar40[7] + fVar451 + fVar212;
                  pfVar19 = (float *)((long)piVar324 + lVar308 + 0x20);
                  fVar451 = pfVar19[1];
                  fVar244 = pfVar19[2];
                  fVar245 = pfVar19[3];
                  fVar246 = pfVar19[4];
                  fVar247 = pfVar19[5];
                  fVar248 = pfVar19[6];
                  pfVar20 = (float *)((long)piVar324 + lVar308 + 0x40);
                  fVar249 = pfVar20[1];
                  fVar250 = pfVar20[2];
                  fVar251 = pfVar20[3];
                  fVar252 = pfVar20[4];
                  fVar253 = pfVar20[5];
                  fVar254 = pfVar20[6];
                  pfVar21 = (float *)((long)piVar324 + lVar308 + 0x60);
                  fVar255 = pfVar21[1];
                  fVar256 = pfVar21[2];
                  fVar257 = pfVar21[3];
                  fVar258 = pfVar21[4];
                  fVar259 = pfVar21[5];
                  fVar260 = pfVar21[6];
                  pfVar49 = (float *)((long)piVar324 + lVar308 + 0x80);
                  fVar261 = pfVar49[1];
                  fVar262 = pfVar49[2];
                  fVar263 = pfVar49[3];
                  fVar264 = pfVar49[4];
                  fVar265 = pfVar49[5];
                  fVar266 = pfVar49[6];
                  pfVar301 = (float *)((long)pvVar298 + lVar308);
                  *pfVar301 = *pfVar314 * *pfVar319 + auVar360._0_4_ +
                              *pfVar299 * *pfVar4 + *pfVar2 * *pfVar5 +
                              *pfVar3 * *pfVar9 + *pfVar24 * *pfVar25 + *pfVar26 * *pfVar323 +
                              *pfVar27 * *pfVar10 + *pfVar28 * *pfVar11 + *pfVar29 * *pfVar12 +
                              *pfVar30 * *pfVar31 +
                              *pfVar32 * *pfVar325 + *pfVar33 * *pfVar13 + *pfVar34 * *pfVar14 +
                              *pfVar35 * *pfVar15 + *pfVar36 * *pfVar37 +
                              *pfVar38 * *pfVar22 + *pfVar39 * *pfVar16 + *pfVar40 * *pfVar17 +
                              *pfVar41 * *pfVar18 + *pfVar42 * *pfVar43 + *pfVar44 * *pfVar23 +
                              *pfVar45 * *pfVar19 + *pfVar46 * *pfVar20 + *pfVar47 * *pfVar21 +
                              *pfVar48 * *pfVar49;
                  pfVar301[1] = fVar347 * fVar515 + auVar360._4_4_ +
                                fVar514 * fVar345 + fVar61 * fVar70 +
                                fVar65 * fVar76 + fVar501 * fVar82 + fVar88 * fVar465 +
                                fVar95 * fVar124 + fVar102 * fVar130 + fVar108 * fVar135 +
                                fVar114 * fVar141 +
                                fVar147 * fVar414 + fVar152 * fVar461 + fVar159 * fVar170 +
                                fVar166 * fVar474 + fVar438 * fVar171 +
                                fVar177 * fVar460 + fVar431 * fVar182 + fVar453 * fVar188 +
                                fVar410 * fVar194 + fVar475 * fVar200 + fVar206 * fVar238 +
                                fVar213 * fVar451 + fVar220 * fVar249 + fVar226 * fVar255 +
                                fVar232 * fVar261;
                  pfVar301[2] = fVar364 * fVar367 + auVar360._8_4_ +
                                fVar368 * fVar484 + fVar62 * fVar71 +
                                fVar66 * fVar77 + fVar505 * fVar83 + fVar89 * fVar119 +
                                fVar96 * fVar125 + fVar103 * fVar131 + fVar109 * fVar136 +
                                fVar115 * fVar142 +
                                fVar148 * fVar416 + fVar153 * fVar420 + fVar160 * fVar384 +
                                fVar468 * fVar476 + fVar440 * fVar172 +
                                fVar178 * fVar462 + fVar432 * fVar183 + fVar455 * fVar189 +
                                fVar411 * fVar195 + fVar477 * fVar201 + fVar207 * fVar239 +
                                fVar214 * fVar244 + fVar221 * fVar250 + fVar227 * fVar256 +
                                fVar233 * fVar262;
                  pfVar301[3] = fVar365 * fVar426 + auVar360._12_4_ +
                                fVar381 * fVar485 + fVar63 * fVar72 +
                                fVar67 * fVar78 + fVar386 * fVar84 + fVar90 * fVar120 +
                                fVar97 * fVar126 + fVar104 * fVar346 + fVar110 * fVar137 +
                                fVar116 * fVar143 +
                                fVar149 * fVar425 + fVar154 * fVar490 + fVar161 * fVar419 +
                                fVar495 * fVar478 + fVar452 * fVar173 +
                                fVar179 * fVar463 + fVar433 * fVar184 + fVar458 * fVar190 +
                                fVar413 * fVar196 + fVar479 * fVar202 + fVar208 * fVar240 +
                                fVar215 * fVar245 + fVar222 * fVar251 + fVar228 * fVar257 +
                                fVar234 * fVar263;
                  pfVar301[4] = fVar366 * fVar427 + auVar360._16_4_ +
                                fVar382 * fVar486 + fVar330 * fVar73 +
                                fVar68 * fVar79 + fVar491 * fVar85 + fVar91 * fVar121 +
                                fVar98 * fVar127 + fVar105 * fVar132 + fVar111 * fVar138 +
                                fVar117 * fVar144 +
                                fVar437 * fVar417 + fVar155 * fVar499 + fVar162 * fVar436 +
                                fVar167 * fVar480 + fVar454 * fVar174 +
                                fVar180 * fVar469 + fVar466 * fVar185 + fVar497 * fVar191 +
                                fVar415 * fVar197 + fVar481 * fVar203 + fVar209 * fVar241 +
                                fVar216 * fVar246 + fVar223 * fVar252 + fVar229 * fVar258 +
                                fVar235 * fVar264;
                  pfVar301[5] = fVar511 * fVar428 + auVar360._20_4_ +
                                fVar383 * fVar487 + fVar343 * fVar74 +
                                fVar502 * fVar80 + fVar492 * fVar86 + fVar92 * fVar122 +
                                fVar99 * fVar128 + fVar106 * fVar133 + fVar112 * fVar139 +
                                fVar118 * fVar145 +
                                fVar464 * fVar418 + fVar156 * fVar168 + fVar163 * fVar470 +
                                fVar393 * fVar482 + fVar456 * fVar175 +
                                fVar181 * fVar471 + fVar434 * fVar186 + fVar391 * fVar192 +
                                fVar494 * fVar198 + fVar483 * fVar204 + fVar210 * fVar242 +
                                fVar217 * fVar247 + fVar224 * fVar253 + fVar230 * fVar259 +
                                fVar236 * fVar265;
                  pfVar301[6] = fVar512 * fVar500 + auVar360._24_4_ +
                                fVar60 * fVar69 + fVar64 * fVar75 +
                                fVar506 * fVar81 + fVar493 * fVar87 + fVar93 * fVar123 +
                                fVar100 * fVar129 + fVar107 * fVar134 + fVar113 * fVar140 +
                                fVar430 * fVar146 +
                                fVar150 * fVar421 + fVar157 * fVar169 + fVar164 * fVar472 +
                                fVar412 * fVar498 + fVar459 * fVar176 +
                                fVar385 * fVar473 + fVar439 * fVar187 + fVar392 * fVar193 +
                                fVar457 * fVar199 + fVar496 * fVar205 + fVar211 * fVar243 +
                                fVar218 * fVar248 + fVar225 * fVar254 + fVar231 * fVar260 +
                                fVar237 * fVar266;
                  pfVar301[7] = fVar513 + auVar360._28_4_ + fVar387 + fVar388 +
                                fVar388 + fVar94 + fVar101 + fVar94 +
                                fVar151 + fVar158 + fVar158 + fVar165 + fVar158 + fVar389 +
                                fVar389 + fVar212 + fVar219 + fVar212;
                  lVar308 = lVar308 + 0x20;
                }
                piVar317 = (pointer)((long)piVar317 + lVar308 + 0x80);
                piVar321 = (pointer)((long)piVar321 + lVar308 + 0x80);
                pvVar322 = (void *)((long)pvVar322 + lVar308 + 0x80);
                pvVar307 = (void *)((long)pvVar307 + lVar308 + 0x80);
                piVar324 = (pointer)((long)piVar324 + lVar308 + 0x80);
                pvVar298 = (void *)((long)pvVar298 + lVar308);
              }
            }
          }
          else {
            if ((bVar288 & (iVar289 == 2 && iVar293 == 2)) != 1) {
              uVar303 = auVar51._4_4_ * auVar51._0_4_;
              std::vector<int,_std::allocator<int>_>::vector
                        (&_space_ofs,(long)(int)uVar303,(allocator_type *)&opt_p);
              iVar289 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar293 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar290 = (this->super_ConvolutionDepthWise).dilation_w * iVar293;
              iVar305 = 0;
              lVar308 = 0;
              for (iVar297 = 0; iVar297 < (this->super_ConvolutionDepthWise).kernel_h;
                  iVar297 = iVar297 + 1) {
                for (lVar306 = 0; (int)lVar306 < iVar293; lVar306 = lVar306 + 1) {
                  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)lVar308 + lVar306] = iVar305;
                  iVar305 = iVar305 + (this->super_ConvolutionDepthWise).dilation_w;
                  iVar293 = (this->super_ConvolutionDepthWise).kernel_w;
                }
                iVar305 = iVar305 + (iVar284 * iVar289 - iVar290);
                lVar308 = (int)lVar308 + lVar306;
              }
              local_2e8._0_4_ = (float)(uVar303 * 8);
              uVar295 = 0;
              if ((int)uVar303 < 1) {
                uVar303 = uVar295;
              }
              iVar289 = (int)local_308;
              local_308 = (pointer)((ulong)local_308 & 0xffffffff);
              if (iVar289 < 1) {
                local_308 = (pointer)0x0;
              }
              for (piVar321 = (pointer)0x0; piVar321 != local_308;
                  piVar321 = (pointer)((long)piVar321 + 1)) {
                pvVar315 = (void *)(top_blob->cstep * (long)piVar321 * top_blob->elemsize +
                                   (long)top_blob->data);
                pvVar322 = (this->weight_data_tm).data;
                for (iVar289 = 0; iVar289 <= iVar309; iVar289 = iVar289 + 1) {
                  for (lVar308 = 0; lVar308 <= iVar304; lVar308 = lVar308 + 1) {
                    if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                      auVar342 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar342 = ZEXT3264(*(undefined1 (*) [32])
                                           ((long)(this->super_ConvolutionDepthWise).bias_data.data
                                           + (long)piVar321 * 0x20));
                    }
                    for (lVar306 = 0; (ulong)uVar303 * 4 != lVar306; lVar306 = lVar306 + 4) {
                      pfVar314 = (float *)((long)pvVar322 + lVar306 * 8 + (long)(int)uVar295 * 4);
                      pfVar319 = (float *)((long)local_368.data +
                                          (long)*(int *)((long)_space_ofs.
                                                                                                                              
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar306
                                                  ) * 0x20 +
                                          (long)((this->super_ConvolutionDepthWise).stride_w *
                                                 (int)lVar308 * 8) * 4 +
                                          (long)iVar289 *
                                          (long)(this->super_ConvolutionDepthWise).stride_h *
                                          (long)local_368.w *
                                          CONCAT44(local_368.elemsize._4_4_,
                                                   (undefined4)local_368.elemsize) +
                                          local_368.cstep * (long)piVar321 *
                                          CONCAT44(local_368.elemsize._4_4_,
                                                   (undefined4)local_368.elemsize));
                      auVar342 = ZEXT3264(CONCAT428(pfVar314[7] + auVar342._28_4_,
                                                    CONCAT424(pfVar314[6] * pfVar319[6] +
                                                              auVar342._24_4_,
                                                              CONCAT420(pfVar314[5] * pfVar319[5] +
                                                                        auVar342._20_4_,
                                                                        CONCAT416(pfVar314[4] *
                                                                                  pfVar319[4] +
                                                                                  auVar342._16_4_,
                                                                                  CONCAT412(pfVar314
                                                  [3] * pfVar319[3] + auVar342._12_4_,
                                                  CONCAT48(pfVar314[2] * pfVar319[2] +
                                                           auVar342._8_4_,
                                                           CONCAT44(pfVar314[1] * pfVar319[1] +
                                                                    auVar342._4_4_,
                                                                    *pfVar314 * *pfVar319 +
                                                                    auVar342._0_4_))))))));
                    }
                    *(undefined1 (*) [32])((long)pvVar315 + lVar308 * 0x20) = auVar342._0_32_;
                  }
                  pvVar315 = (void *)((long)pvVar315 + (long)(int)(local_2c8._0_4_ << 3) * 4);
                }
                uVar295 = uVar295 + (int)(float)local_2e8;
              }
              pLVar57 = this->activation;
              if (pLVar57 != (Layer *)0x0) {
                (*pLVar57->_vptr_Layer[9])(pLVar57,top_blob,opt);
              }
              goto LAB_003b6585;
            }
            uVar303 = top_blob->w;
            pvVar315 = (this->super_ConvolutionDepthWise).bias_data.data;
            uVar310 = 0;
            uVar327 = (ulong)uVar303;
            if ((int)uVar303 < 1) {
              uVar327 = uVar310;
            }
            uVar296 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar296 = uVar310;
            }
            uVar300 = (ulong)(uint)local_368.c;
            if (local_368.c < 1) {
              uVar300 = uVar310;
            }
            lVar308 = (long)(int)((local_368.w - uVar303) * 0x10) * 4;
            for (; local_268 = CONCAT44(local_268._4_4_,(float)local_268),
                local_318 = CONCAT44(local_318._4_4_,(float)local_318),
                local_298 = CONCAT44(local_298._4_4_,(float)local_298), uVar310 != uVar300;
                uVar310 = uVar310 + 1) {
              if (pvVar315 == (void *)0x0) {
                auVar360 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              }
              else {
                auVar360 = *(undefined1 (*) [32])((long)pvVar315 + uVar310 * 0x20);
              }
              pfVar314 = (float *)(top_blob->cstep * uVar310 * top_blob->elemsize +
                                  (long)top_blob->data);
              pvVar291 = (this->weight_data_tm).data;
              lVar318 = (long)(this->weight_data_tm).w * uVar310 * (this->weight_data_tm).elemsize;
              piVar317 = (pointer)(local_368.cstep * uVar310 *
                                   CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize)
                                  + (long)local_368.data);
              lVar306 = (long)local_368.w *
                        CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
              piVar321 = (pointer)((long)piVar317 + lVar306);
              pvVar322 = (void *)((long)piVar317 + lVar306 * 2);
              pvVar298 = (void *)(lVar306 * 3 + (long)piVar317);
              piVar324 = piVar317 + lVar306;
              for (iVar289 = 0; iVar289 != (int)uVar296; iVar289 = iVar289 + 1) {
                lVar306 = 0;
                uVar292 = uVar327;
                while (iVar304 = (int)uVar292, uVar292 = (ulong)(iVar304 - 1), iVar304 != 0) {
                  pfVar319 = (float *)((long)pvVar291 + lVar318);
                  fVar347 = pfVar319[1];
                  fVar364 = pfVar319[2];
                  fVar365 = pfVar319[3];
                  fVar366 = pfVar319[4];
                  fVar511 = pfVar319[5];
                  fVar512 = pfVar319[6];
                  fVar513 = pfVar319[7];
                  pfVar299 = (float *)((long)pvVar291 + lVar318 + 0x20);
                  fVar514 = pfVar299[1];
                  fVar368 = pfVar299[2];
                  fVar381 = pfVar299[3];
                  fVar382 = pfVar299[4];
                  fVar383 = pfVar299[5];
                  fVar60 = pfVar299[6];
                  pfVar2 = (float *)((long)pvVar291 + lVar318 + 0x40);
                  fVar61 = pfVar2[1];
                  fVar62 = pfVar2[2];
                  fVar63 = pfVar2[3];
                  fVar330 = pfVar2[4];
                  fVar343 = pfVar2[5];
                  fVar64 = pfVar2[6];
                  fVar65 = pfVar2[7];
                  pfVar3 = (float *)((long)pvVar291 + lVar318 + 0x60);
                  fVar66 = pfVar3[1];
                  fVar67 = pfVar3[2];
                  fVar68 = pfVar3[3];
                  fVar502 = pfVar3[4];
                  fVar506 = pfVar3[5];
                  fVar515 = pfVar3[6];
                  pfVar24 = (float *)((long)pvVar291 + lVar318 + 0x80);
                  fVar367 = pfVar24[1];
                  fVar426 = pfVar24[2];
                  fVar427 = pfVar24[3];
                  fVar428 = pfVar24[4];
                  fVar500 = pfVar24[5];
                  fVar501 = pfVar24[6];
                  pfVar323 = (float *)((long)piVar317 + lVar306);
                  fVar505 = pfVar323[1];
                  fVar386 = pfVar323[2];
                  fVar491 = pfVar323[3];
                  fVar492 = pfVar323[4];
                  fVar493 = pfVar323[5];
                  fVar345 = pfVar323[6];
                  pfVar4 = (float *)((long)piVar317 + lVar306 + 0x20);
                  fVar484 = pfVar4[1];
                  fVar485 = pfVar4[2];
                  fVar486 = pfVar4[3];
                  fVar487 = pfVar4[4];
                  fVar69 = pfVar4[5];
                  fVar70 = pfVar4[6];
                  pfVar5 = (float *)((long)piVar317 + lVar306 + 0x40);
                  fVar71 = pfVar5[1];
                  fVar72 = pfVar5[2];
                  fVar73 = pfVar5[3];
                  fVar74 = pfVar5[4];
                  fVar75 = pfVar5[5];
                  fVar76 = pfVar5[6];
                  fVar390 = pfVar299[7] + fVar65;
                  pfVar9 = (float *)((long)piVar317 + lVar306 + 0x60);
                  fVar77 = pfVar9[1];
                  fVar78 = pfVar9[2];
                  fVar79 = pfVar9[3];
                  fVar80 = pfVar9[4];
                  fVar81 = pfVar9[5];
                  fVar82 = pfVar9[6];
                  pfVar25 = (float *)((long)piVar317 + lVar306 + 0x80);
                  fVar83 = pfVar25[1];
                  fVar84 = pfVar25[2];
                  fVar85 = pfVar25[3];
                  fVar86 = pfVar25[4];
                  fVar87 = pfVar25[5];
                  fVar88 = pfVar25[6];
                  pfVar26 = (float *)((long)pvVar291 + lVar318 + 0xa0);
                  fVar89 = pfVar26[1];
                  fVar90 = pfVar26[2];
                  fVar91 = pfVar26[3];
                  fVar92 = pfVar26[4];
                  fVar93 = pfVar26[5];
                  fVar94 = pfVar26[6];
                  fVar95 = pfVar26[7];
                  pfVar27 = (float *)((long)pvVar291 + lVar318 + 0xc0);
                  fVar96 = pfVar27[1];
                  fVar97 = pfVar27[2];
                  fVar98 = pfVar27[3];
                  fVar99 = pfVar27[4];
                  fVar100 = pfVar27[5];
                  fVar101 = pfVar27[6];
                  fVar102 = pfVar27[7];
                  pfVar28 = (float *)((long)pvVar291 + lVar318 + 0xe0);
                  fVar103 = pfVar28[1];
                  fVar104 = pfVar28[2];
                  fVar105 = pfVar28[3];
                  fVar106 = pfVar28[4];
                  fVar107 = pfVar28[5];
                  fVar108 = pfVar28[6];
                  pfVar29 = (float *)((long)pvVar291 + lVar318 + 0x100);
                  fVar109 = pfVar29[1];
                  fVar110 = pfVar29[2];
                  fVar111 = pfVar29[3];
                  fVar112 = pfVar29[4];
                  fVar113 = pfVar29[5];
                  fVar114 = pfVar29[6];
                  pfVar30 = (float *)((long)pvVar291 + lVar318 + 0x120);
                  fVar115 = pfVar30[1];
                  fVar116 = pfVar30[2];
                  fVar117 = pfVar30[3];
                  fVar118 = pfVar30[4];
                  fVar430 = pfVar30[5];
                  fVar465 = pfVar30[6];
                  pfVar325 = (float *)((long)piVar321 + lVar306);
                  fVar119 = pfVar325[1];
                  fVar120 = pfVar325[2];
                  fVar121 = pfVar325[3];
                  fVar122 = pfVar325[4];
                  fVar123 = pfVar325[5];
                  fVar124 = pfVar325[6];
                  pfVar10 = (float *)((long)piVar321 + lVar306 + 0x20);
                  fVar125 = pfVar10[1];
                  fVar126 = pfVar10[2];
                  fVar127 = pfVar10[3];
                  fVar128 = pfVar10[4];
                  fVar129 = pfVar10[5];
                  fVar130 = pfVar10[6];
                  pfVar11 = (float *)((long)piVar321 + lVar306 + 0x40);
                  fVar131 = pfVar11[1];
                  fVar346 = pfVar11[2];
                  fVar132 = pfVar11[3];
                  fVar133 = pfVar11[4];
                  fVar134 = pfVar11[5];
                  fVar135 = pfVar11[6];
                  pfVar12 = (float *)((long)piVar321 + lVar306 + 0x60);
                  fVar136 = pfVar12[1];
                  fVar137 = pfVar12[2];
                  fVar138 = pfVar12[3];
                  fVar139 = pfVar12[4];
                  fVar140 = pfVar12[5];
                  fVar141 = pfVar12[6];
                  pfVar31 = (float *)((long)piVar321 + lVar306 + 0x80);
                  fVar142 = pfVar31[1];
                  fVar143 = pfVar31[2];
                  fVar144 = pfVar31[3];
                  fVar145 = pfVar31[4];
                  fVar146 = pfVar31[5];
                  fVar147 = pfVar31[6];
                  pfVar32 = (float *)((long)pvVar291 + lVar318 + 0x140);
                  fVar148 = pfVar32[1];
                  fVar149 = pfVar32[2];
                  fVar437 = pfVar32[3];
                  fVar464 = pfVar32[4];
                  fVar150 = pfVar32[5];
                  fVar151 = pfVar32[6];
                  fVar152 = pfVar32[7];
                  pfVar33 = (float *)((long)pvVar291 + lVar318 + 0x160);
                  fVar153 = pfVar33[1];
                  fVar154 = pfVar33[2];
                  fVar155 = pfVar33[3];
                  fVar156 = pfVar33[4];
                  fVar157 = pfVar33[5];
                  fVar158 = pfVar33[6];
                  fVar159 = pfVar33[7];
                  pfVar34 = (float *)((long)pvVar291 + lVar318 + 0x180);
                  fVar160 = pfVar34[1];
                  fVar161 = pfVar34[2];
                  fVar162 = pfVar34[3];
                  fVar163 = pfVar34[4];
                  fVar164 = pfVar34[5];
                  fVar165 = pfVar34[6];
                  fVar166 = pfVar34[7];
                  pfVar35 = (float *)((long)pvVar291 + lVar318 + 0x1a0);
                  fVar468 = pfVar35[1];
                  fVar495 = pfVar35[2];
                  fVar167 = pfVar35[3];
                  fVar393 = pfVar35[4];
                  fVar412 = pfVar35[5];
                  fVar414 = pfVar35[6];
                  pfVar36 = (float *)((long)pvVar291 + lVar318 + 0x1c0);
                  fVar416 = pfVar36[1];
                  fVar425 = pfVar36[2];
                  fVar417 = pfVar36[3];
                  fVar418 = pfVar36[4];
                  fVar421 = pfVar36[5];
                  fVar438 = pfVar36[6];
                  pfVar301 = (float *)((long)pvVar322 + lVar306);
                  fVar440 = pfVar301[1];
                  fVar452 = pfVar301[2];
                  fVar454 = pfVar301[3];
                  fVar456 = pfVar301[4];
                  fVar459 = pfVar301[5];
                  fVar461 = pfVar301[6];
                  pfVar13 = (float *)((long)pvVar322 + lVar306 + 0x20);
                  fVar420 = pfVar13[1];
                  fVar490 = pfVar13[2];
                  fVar499 = pfVar13[3];
                  fVar168 = pfVar13[4];
                  fVar169 = pfVar13[5];
                  fVar170 = pfVar13[6];
                  pfVar14 = (float *)((long)pvVar322 + lVar306 + 0x40);
                  fVar384 = pfVar14[1];
                  fVar419 = pfVar14[2];
                  fVar436 = pfVar14[3];
                  fVar470 = pfVar14[4];
                  fVar472 = pfVar14[5];
                  fVar474 = pfVar14[6];
                  pfVar15 = (float *)((long)pvVar322 + lVar306 + 0x60);
                  fVar476 = pfVar15[1];
                  fVar478 = pfVar15[2];
                  fVar480 = pfVar15[3];
                  fVar482 = pfVar15[4];
                  fVar498 = pfVar15[5];
                  fVar171 = pfVar15[6];
                  pfVar37 = (float *)((long)pvVar322 + lVar306 + 0x80);
                  fVar172 = pfVar37[1];
                  fVar173 = pfVar37[2];
                  fVar174 = pfVar37[3];
                  fVar175 = pfVar37[4];
                  fVar176 = pfVar37[5];
                  fVar177 = pfVar37[6];
                  pfVar38 = (float *)((long)pvVar291 + lVar318 + 0x1e0);
                  fVar178 = pfVar38[1];
                  fVar179 = pfVar38[2];
                  fVar180 = pfVar38[3];
                  fVar181 = pfVar38[4];
                  fVar385 = pfVar38[5];
                  fVar431 = pfVar38[6];
                  fVar432 = pfVar38[7];
                  pfVar39 = (float *)((long)pvVar291 + lVar318 + 0x200);
                  fVar433 = pfVar39[1];
                  fVar466 = pfVar39[2];
                  fVar434 = pfVar39[3];
                  fVar439 = pfVar39[4];
                  fVar451 = pfVar39[5];
                  fVar453 = pfVar39[6];
                  fVar455 = pfVar39[7];
                  pfVar40 = (float *)((long)pvVar291 + lVar318 + 0x220);
                  fVar458 = pfVar40[1];
                  fVar497 = pfVar40[2];
                  fVar391 = pfVar40[3];
                  fVar392 = pfVar40[4];
                  fVar410 = pfVar40[5];
                  fVar411 = pfVar40[6];
                  fVar413 = pfVar40[7];
                  pfVar41 = (float *)((long)pvVar291 + lVar318 + 0x240);
                  fVar415 = pfVar41[1];
                  fVar494 = pfVar41[2];
                  fVar457 = pfVar41[3];
                  fVar460 = pfVar41[4];
                  fVar462 = pfVar41[5];
                  fVar463 = pfVar41[6];
                  pfVar42 = (float *)((long)pvVar291 + lVar318 + 0x260);
                  fVar469 = pfVar42[1];
                  fVar471 = pfVar42[2];
                  fVar473 = pfVar42[3];
                  fVar475 = pfVar42[4];
                  fVar477 = pfVar42[5];
                  fVar479 = pfVar42[6];
                  pfVar22 = (float *)((long)pvVar298 + lVar306);
                  fVar481 = pfVar22[1];
                  fVar483 = pfVar22[2];
                  fVar496 = pfVar22[3];
                  fVar182 = pfVar22[4];
                  fVar183 = pfVar22[5];
                  fVar184 = pfVar22[6];
                  pfVar16 = (float *)((long)pvVar298 + lVar306 + 0x20);
                  fVar185 = pfVar16[1];
                  fVar186 = pfVar16[2];
                  fVar187 = pfVar16[3];
                  fVar188 = pfVar16[4];
                  fVar189 = pfVar16[5];
                  fVar190 = pfVar16[6];
                  pfVar17 = (float *)((long)pvVar298 + lVar306 + 0x40);
                  fVar191 = pfVar17[1];
                  fVar192 = pfVar17[2];
                  fVar193 = pfVar17[3];
                  fVar194 = pfVar17[4];
                  fVar195 = pfVar17[5];
                  fVar196 = pfVar17[6];
                  pfVar18 = (float *)((long)pvVar298 + lVar306 + 0x60);
                  fVar197 = pfVar18[1];
                  fVar198 = pfVar18[2];
                  fVar199 = pfVar18[3];
                  fVar200 = pfVar18[4];
                  fVar201 = pfVar18[5];
                  fVar202 = pfVar18[6];
                  pfVar43 = (float *)((long)pvVar298 + lVar306 + 0x80);
                  fVar203 = pfVar43[1];
                  fVar204 = pfVar43[2];
                  fVar205 = pfVar43[3];
                  fVar206 = pfVar43[4];
                  fVar207 = pfVar43[5];
                  fVar208 = pfVar43[6];
                  pfVar44 = (float *)((long)pvVar291 + lVar318 + 0x280);
                  fVar209 = pfVar44[1];
                  fVar210 = pfVar44[2];
                  fVar211 = pfVar44[3];
                  fVar212 = pfVar44[4];
                  fVar213 = pfVar44[5];
                  fVar214 = pfVar44[6];
                  fVar215 = pfVar44[7];
                  pfVar45 = (float *)((long)pvVar291 + lVar318 + 0x2a0);
                  fVar216 = pfVar45[1];
                  fVar217 = pfVar45[2];
                  fVar218 = pfVar45[3];
                  fVar219 = pfVar45[4];
                  fVar220 = pfVar45[5];
                  fVar221 = pfVar45[6];
                  fVar222 = pfVar45[7];
                  pfVar46 = (float *)((long)pvVar291 + lVar318 + 0x2c0);
                  fVar223 = pfVar46[1];
                  fVar224 = pfVar46[2];
                  fVar225 = pfVar46[3];
                  fVar226 = pfVar46[4];
                  fVar227 = pfVar46[5];
                  fVar228 = pfVar46[6];
                  pfVar47 = (float *)((long)pvVar291 + lVar318 + 0x2e0);
                  fVar229 = pfVar47[1];
                  fVar230 = pfVar47[2];
                  fVar231 = pfVar47[3];
                  fVar232 = pfVar47[4];
                  fVar233 = pfVar47[5];
                  fVar234 = pfVar47[6];
                  pfVar48 = (float *)((long)pvVar291 + lVar318 + 0x300);
                  fVar235 = pfVar48[1];
                  fVar236 = pfVar48[2];
                  fVar237 = pfVar48[3];
                  fVar238 = pfVar48[4];
                  fVar239 = pfVar48[5];
                  fVar240 = pfVar48[6];
                  pfVar23 = (float *)((long)piVar324 + lVar306);
                  fVar241 = pfVar23[1];
                  fVar242 = pfVar23[2];
                  fVar243 = pfVar23[3];
                  fVar244 = pfVar23[4];
                  fVar245 = pfVar23[5];
                  fVar246 = pfVar23[6];
                  pfVar19 = (float *)((long)piVar324 + lVar306 + 0x20);
                  fVar247 = pfVar19[1];
                  fVar248 = pfVar19[2];
                  fVar249 = pfVar19[3];
                  fVar250 = pfVar19[4];
                  fVar251 = pfVar19[5];
                  fVar252 = pfVar19[6];
                  pfVar20 = (float *)((long)piVar324 + lVar306 + 0x40);
                  fVar253 = pfVar20[1];
                  fVar254 = pfVar20[2];
                  fVar255 = pfVar20[3];
                  fVar256 = pfVar20[4];
                  fVar257 = pfVar20[5];
                  fVar258 = pfVar20[6];
                  pfVar21 = (float *)((long)piVar324 + lVar306 + 0x60);
                  fVar259 = pfVar21[1];
                  fVar260 = pfVar21[2];
                  fVar261 = pfVar21[3];
                  fVar262 = pfVar21[4];
                  fVar263 = pfVar21[5];
                  fVar264 = pfVar21[6];
                  pfVar49 = (float *)((long)piVar324 + lVar306 + 0x80);
                  fVar265 = pfVar49[1];
                  fVar266 = pfVar49[2];
                  fVar387 = pfVar49[3];
                  fVar388 = pfVar49[4];
                  fVar389 = pfVar49[5];
                  fVar267 = pfVar49[6];
                  *pfVar314 = *pfVar319 * *pfVar323 + auVar360._0_4_ +
                              *pfVar299 * *pfVar4 + *pfVar2 * *pfVar5 +
                              *pfVar3 * *pfVar9 + *pfVar24 * *pfVar25 + *pfVar26 * *pfVar325 +
                              *pfVar27 * *pfVar10 + *pfVar28 * *pfVar11 + *pfVar29 * *pfVar12 +
                              *pfVar30 * *pfVar31 +
                              *pfVar32 * *pfVar301 + *pfVar33 * *pfVar13 + *pfVar34 * *pfVar14 +
                              *pfVar35 * *pfVar15 + *pfVar36 * *pfVar37 +
                              *pfVar38 * *pfVar22 + *pfVar39 * *pfVar16 + *pfVar40 * *pfVar17 +
                              *pfVar41 * *pfVar18 + *pfVar42 * *pfVar43 + *pfVar44 * *pfVar23 +
                              *pfVar45 * *pfVar19 + *pfVar46 * *pfVar20 + *pfVar47 * *pfVar21 +
                              *pfVar48 * *pfVar49;
                  pfVar314[1] = fVar347 * fVar505 + auVar360._4_4_ +
                                fVar514 * fVar484 + fVar61 * fVar71 +
                                fVar66 * fVar77 + fVar367 * fVar83 + fVar89 * fVar119 +
                                fVar96 * fVar125 + fVar103 * fVar131 + fVar109 * fVar136 +
                                fVar115 * fVar142 +
                                fVar148 * fVar440 + fVar153 * fVar420 + fVar160 * fVar384 +
                                fVar468 * fVar476 + fVar416 * fVar172 +
                                fVar178 * fVar481 + fVar433 * fVar185 + fVar458 * fVar191 +
                                fVar415 * fVar197 + fVar469 * fVar203 + fVar209 * fVar241 +
                                fVar216 * fVar247 + fVar223 * fVar253 + fVar229 * fVar259 +
                                fVar235 * fVar265;
                  pfVar314[2] = fVar364 * fVar386 + auVar360._8_4_ +
                                fVar368 * fVar485 + fVar62 * fVar72 +
                                fVar67 * fVar78 + fVar426 * fVar84 + fVar90 * fVar120 +
                                fVar97 * fVar126 + fVar104 * fVar346 + fVar110 * fVar137 +
                                fVar116 * fVar143 +
                                fVar149 * fVar452 + fVar154 * fVar490 + fVar161 * fVar419 +
                                fVar495 * fVar478 + fVar425 * fVar173 +
                                fVar179 * fVar483 + fVar466 * fVar186 + fVar497 * fVar192 +
                                fVar494 * fVar198 + fVar471 * fVar204 + fVar210 * fVar242 +
                                fVar217 * fVar248 + fVar224 * fVar254 + fVar230 * fVar260 +
                                fVar236 * fVar266;
                  pfVar314[3] = fVar365 * fVar491 + auVar360._12_4_ +
                                fVar381 * fVar486 + fVar63 * fVar73 +
                                fVar68 * fVar79 + fVar427 * fVar85 + fVar91 * fVar121 +
                                fVar98 * fVar127 + fVar105 * fVar132 + fVar111 * fVar138 +
                                fVar117 * fVar144 +
                                fVar437 * fVar454 + fVar155 * fVar499 + fVar162 * fVar436 +
                                fVar167 * fVar480 + fVar417 * fVar174 +
                                fVar180 * fVar496 + fVar434 * fVar187 + fVar391 * fVar193 +
                                fVar457 * fVar199 + fVar473 * fVar205 + fVar211 * fVar243 +
                                fVar218 * fVar249 + fVar225 * fVar255 + fVar231 * fVar261 +
                                fVar237 * fVar387;
                  pfVar314[4] = fVar366 * fVar492 + auVar360._16_4_ +
                                fVar382 * fVar487 + fVar330 * fVar74 +
                                fVar502 * fVar80 + fVar428 * fVar86 + fVar92 * fVar122 +
                                fVar99 * fVar128 + fVar106 * fVar133 + fVar112 * fVar139 +
                                fVar118 * fVar145 +
                                fVar464 * fVar456 + fVar156 * fVar168 + fVar163 * fVar470 +
                                fVar393 * fVar482 + fVar418 * fVar175 +
                                fVar181 * fVar182 + fVar439 * fVar188 + fVar392 * fVar194 +
                                fVar460 * fVar200 + fVar475 * fVar206 + fVar212 * fVar244 +
                                fVar219 * fVar250 + fVar226 * fVar256 + fVar232 * fVar262 +
                                fVar238 * fVar388;
                  pfVar314[5] = fVar511 * fVar493 + auVar360._20_4_ +
                                fVar383 * fVar69 + fVar343 * fVar75 +
                                fVar506 * fVar81 + fVar500 * fVar87 + fVar93 * fVar123 +
                                fVar100 * fVar129 + fVar107 * fVar134 + fVar113 * fVar140 +
                                fVar430 * fVar146 +
                                fVar150 * fVar459 + fVar157 * fVar169 + fVar164 * fVar472 +
                                fVar412 * fVar498 + fVar421 * fVar176 +
                                fVar385 * fVar183 + fVar451 * fVar189 + fVar410 * fVar195 +
                                fVar462 * fVar201 + fVar477 * fVar207 + fVar213 * fVar245 +
                                fVar220 * fVar251 + fVar227 * fVar257 + fVar233 * fVar263 +
                                fVar239 * fVar389;
                  pfVar314[6] = fVar512 * fVar345 + auVar360._24_4_ +
                                fVar60 * fVar70 + fVar64 * fVar76 +
                                fVar515 * fVar82 + fVar501 * fVar88 + fVar94 * fVar124 +
                                fVar101 * fVar130 + fVar108 * fVar135 + fVar114 * fVar141 +
                                fVar465 * fVar147 +
                                fVar151 * fVar461 + fVar158 * fVar170 + fVar165 * fVar474 +
                                fVar414 * fVar171 + fVar438 * fVar177 +
                                fVar431 * fVar184 + fVar453 * fVar190 + fVar411 * fVar196 +
                                fVar463 * fVar202 + fVar479 * fVar208 + fVar214 * fVar246 +
                                fVar221 * fVar252 + fVar228 * fVar258 + fVar234 * fVar264 +
                                fVar240 * fVar267;
                  pfVar314[7] = fVar513 + auVar360._28_4_ + fVar390 + fVar65 + fVar390 + fVar95 +
                                fVar95 + fVar102 + fVar95 + fVar95 +
                                fVar152 + fVar159 + fVar166 + fVar159 + fVar159 +
                                fVar432 + fVar455 + fVar413 + fVar455 + fVar455 + fVar215 +
                                fVar215 + fVar222 + fVar215 + fVar215;
                  pfVar314 = pfVar314 + 8;
                  lVar306 = lVar306 + 0x40;
                }
                piVar317 = (pointer)((long)piVar317 + lVar306 + lVar308);
                piVar321 = (pointer)((long)piVar321 + lVar306 + lVar308);
                pvVar322 = (void *)((long)pvVar322 + lVar306 + lVar308);
                pvVar298 = (void *)((long)pvVar298 + lVar306 + lVar308);
                piVar324 = (pointer)((long)piVar324 + lVar306 + lVar308);
              }
            }
          }
        }
      }
      goto LAB_003b5cf8;
    }
    auVar52._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar52._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar52._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar52._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar443 = vpcmpeqd_avx(auVar52,_DAT_00539f40);
    iVar290 = vmovmskps_avx(auVar443);
    iVar289 = (this->super_ConvolutionDepthWise).stride_w;
    iVar293 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar293 == 1 && (iVar289 == 1 && iVar290 == 0xf)) {
      iVar289 = top_blob->w;
      pvVar315 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar310 = 0;
      uVar327 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar327 = uVar310;
      }
      uVar303 = local_368.c;
      if (local_368.c < 1) {
        uVar303 = 0;
      }
      while( true ) {
        local_268 = CONCAT44(local_268._4_4_,(float)local_268);
        local_318 = CONCAT44(local_318._4_4_,(float)local_318);
        local_298 = CONCAT44(local_298._4_4_,(float)local_298);
        if (uVar310 == uVar303) break;
        if (pvVar315 == (void *)0x0) {
          uVar331 = 0;
          uVar344 = 0;
        }
        else {
          puVar1 = (undefined8 *)((long)pvVar315 + uVar310 * 0x10);
          uVar331 = *puVar1;
          uVar344 = puVar1[1];
        }
        pauVar311 = (undefined1 (*) [16])
                    (top_blob->cstep * uVar310 * top_blob->elemsize + (long)top_blob->data);
        pvVar322 = (this->weight_data_tm).data;
        lVar308 = (long)(this->weight_data_tm).w * uVar310 * (this->weight_data_tm).elemsize;
        pfVar323 = (float *)(local_368.cstep * uVar310 *
                             CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) +
                            (long)local_368.data);
        lVar306 = (long)local_368.w *
                  CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
        uVar488 = *(undefined8 *)((long)pvVar322 + lVar308);
        uVar489 = ((undefined8 *)((long)pvVar322 + lVar308))[1];
        local_3b8 = (float)uVar488;
        fStack_3b4 = (float)((ulong)uVar488 >> 0x20);
        fStack_3b0 = (float)uVar489;
        fStack_3ac = (float)((ulong)uVar489 >> 0x20);
        puVar1 = (undefined8 *)((long)pvVar322 + lVar308 + 0x10);
        uVar488 = *puVar1;
        uVar489 = puVar1[1];
        puVar8 = (ulong *)((long)pvVar322 + lVar308 + 0x20);
        piVar321 = (pointer)*puVar8;
        uVar296 = puVar8[1];
        pauVar6 = (undefined1 (*) [12])((long)pvVar322 + lVar308 + 0x30);
        piVar324 = *(pointer *)*pauVar6;
        auVar278 = *pauVar6;
        auVar277 = *pauVar6;
        local_2e8._0_4_ = SUB84(piVar324,0);
        local_2e8._4_4_ = (float)((ulong)piVar324 >> 0x20);
        fStack_2e0 = (float)*(undefined8 *)(*pauVar6 + 8);
        fStack_2dc = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
        pauVar313 = (undefined1 (*) [16])((long)pvVar322 + lVar308 + 0x40);
        uVar268 = *(undefined8 *)*pauVar313;
        auVar443 = *pauVar313;
        pauVar6 = (undefined1 (*) [12])((long)pvVar322 + lVar308 + 0x50);
        auVar279 = *pauVar6;
        auVar276 = *pauVar6;
        local_298._0_4_ = (float)*(undefined8 *)*pauVar6;
        local_298._4_4_ = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
        fStack_290 = (float)*(undefined8 *)(*pauVar6 + 8);
        fStack_28c = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
        pauVar6 = (undefined1 (*) [12])((long)pvVar322 + lVar308 + 0x60);
        auVar280 = *pauVar6;
        local_268._0_4_ = (float)*(undefined8 *)*pauVar6;
        local_268._4_4_ = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
        fStack_260 = (float)*(undefined8 *)(*pauVar6 + 8);
        fStack_25c = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
        pauVar6 = (undefined1 (*) [12])((long)pvVar322 + lVar308 + 0x70);
        auVar281 = *pauVar6;
        local_188 = (float)*(undefined8 *)*pauVar6;
        fStack_184 = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
        fStack_180 = (float)*(undefined8 *)(*pauVar6 + 8);
        fStack_17c = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
        _local_258 = *(undefined1 (*) [16])((long)pvVar322 + lVar308 + 0x80);
        pfVar314 = (float *)(lVar306 + (long)pfVar323);
        pfVar319 = (float *)(lVar306 * 2 + (long)pfVar323);
        for (iVar304 = 0; iVar304 != (int)uVar327; iVar304 = iVar304 + 1) {
          pfVar325 = pfVar323 + 8;
          pfVar301 = pfVar314 + 8;
          pfVar299 = pfVar319 + 8;
          lVar308 = 0;
          iVar309 = 0;
          while( true ) {
            local_398 = (float)uVar488;
            fStack_390 = (float)uVar489;
            local_308._0_4_ = SUB84(piVar321,0);
            uStack_300._0_4_ = (float)uVar296;
            local_2c8._0_4_ = auVar443._0_4_;
            uVar50 = local_2c8._0_4_;
            local_2c8._4_4_ = auVar443._4_4_;
            fStack_2c0 = auVar443._8_4_;
            fStack_2bc = auVar443._12_4_;
            fStack_394 = (float)((ulong)uVar488 >> 0x20);
            fStack_38c = (float)((ulong)uVar489 >> 0x20);
            local_308._4_4_ = (float)((ulong)piVar321 >> 0x20);
            uStack_300._4_4_ = (float)(uVar296 >> 0x20);
            local_3d8._0_4_ = (float)uVar331;
            local_3d8._4_4_ = (float)((ulong)uVar331 >> 0x20);
            fStack_3d0 = (float)uVar344;
            fStack_3cc = (float)((ulong)uVar344 >> 0x20);
            if (iVar289 <= iVar309 + 7) break;
            pfVar4 = (float *)((long)pfVar323 + lVar308);
            fVar347 = pfVar4[1];
            fVar364 = pfVar4[2];
            fVar365 = pfVar4[3];
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x10);
            fVar366 = *pfVar2;
            fVar511 = pfVar2[1];
            fVar512 = pfVar2[2];
            fVar513 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x20);
            fVar514 = *pfVar2;
            fVar368 = pfVar2[1];
            fVar381 = pfVar2[2];
            fVar382 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x30);
            fVar383 = *pfVar2;
            fVar60 = pfVar2[1];
            fVar61 = pfVar2[2];
            fVar62 = pfVar2[3];
            pfVar5 = (float *)((long)pfVar314 + lVar308);
            fVar63 = pfVar5[1];
            fVar330 = pfVar5[2];
            fVar343 = pfVar5[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x10);
            fVar64 = *pfVar2;
            fVar65 = pfVar2[1];
            fVar66 = pfVar2[2];
            fVar67 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x20);
            fVar68 = *pfVar2;
            fVar502 = pfVar2[1];
            fVar506 = pfVar2[2];
            fVar515 = pfVar2[3];
            puVar1 = (undefined8 *)((long)pfVar314 + lVar308 + 0x30);
            uVar269 = *puVar1;
            uVar270 = puVar1[1];
            local_2c8._0_4_ = (undefined4)uVar268;
            pfVar2 = (float *)((long)pfVar319 + lVar308);
            fVar367 = pfVar2[1];
            fVar426 = pfVar2[2];
            fVar427 = pfVar2[3];
            pfVar3 = (float *)((long)pfVar319 + lVar308 + 0x10);
            fVar428 = *pfVar3;
            fVar500 = pfVar3[1];
            fVar501 = pfVar3[2];
            fVar505 = pfVar3[3];
            pfVar3 = (float *)((long)pfVar319 + lVar308 + 0x20);
            fVar386 = *pfVar3;
            fVar491 = pfVar3[1];
            fVar492 = pfVar3[2];
            fVar493 = pfVar3[3];
            pfVar3 = (float *)((long)pfVar319 + lVar308 + 0x30);
            fVar345 = *pfVar3;
            fVar484 = pfVar3[1];
            fVar485 = pfVar3[2];
            fVar486 = pfVar3[3];
            pfVar3 = (float *)((long)*pauVar311 + lVar308);
            *pfVar3 = local_3b8 * *pfVar4 + (float)local_3d8 +
                      fVar366 * local_398 + fVar514 * (float)local_308 +
                      fVar68 * (float)local_298 +
                      fVar64 * (float)local_2c8._0_4_ + (float)local_2e8 * *pfVar5 +
                      (float)local_258._0_4_ * fVar386 +
                      (float)local_268 * *pfVar2 + fVar428 * local_188;
            pfVar3[1] = fStack_3b4 * fVar347 + local_3d8._4_4_ +
                        fVar511 * fStack_394 + fVar368 * local_308._4_4_ +
                        fVar502 * local_298._4_4_ +
                        fVar65 * (float)local_2c8._4_4_ + local_2e8._4_4_ * fVar63 +
                        (float)local_258._4_4_ * fVar491 +
                        local_268._4_4_ * fVar367 + fVar500 * fStack_184;
            pfVar3[2] = fStack_3b0 * fVar364 + fStack_3d0 +
                        fVar512 * fStack_390 + fVar381 * (float)uStack_300 +
                        fVar506 * fStack_290 + fVar66 * fStack_2c0 + fStack_2e0 * fVar330 +
                        fStack_250 * fVar492 + fStack_260 * fVar426 + fVar501 * fStack_180;
            pfVar3[3] = fStack_3ac * fVar365 + fStack_3cc +
                        fVar513 * fStack_38c + fVar382 * uStack_300._4_4_ +
                        fVar515 * fStack_28c + fVar67 * fStack_2bc + fStack_2dc * fVar343 +
                        fStack_24c * fVar493 + fStack_25c * fVar427 + fVar505 * fStack_17c;
            local_2a8._0_4_ = (float)uVar269;
            local_2a8._4_4_ = (float)((ulong)uVar269 >> 0x20);
            uStack_2a0._0_4_ = (float)uVar270;
            uStack_2a0._4_4_ = (float)((ulong)uVar270 >> 0x20);
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x40);
            fVar347 = *pfVar2;
            fVar364 = pfVar2[1];
            fVar365 = pfVar2[2];
            fVar63 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x40);
            fVar330 = *pfVar2;
            fVar343 = pfVar2[1];
            fVar367 = pfVar2[2];
            fVar426 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar319 + lVar308 + 0x40);
            fVar427 = *pfVar2;
            fVar487 = pfVar2[1];
            fVar69 = pfVar2[2];
            fVar70 = pfVar2[3];
            pfVar2 = (float *)(pauVar311[1] + lVar308);
            *pfVar2 = fVar386 * local_188 +
                      fVar428 * (float)local_268 + fVar68 * (float)local_2c8._0_4_ +
                      fVar366 * local_3b8 + (float)local_3d8 +
                      fVar64 * (float)local_2e8 + fVar514 * local_398 +
                      (float)local_2a8 * (float)local_298 + fVar383 * (float)local_308 +
                      fVar345 * (float)local_258._0_4_;
            pfVar2[1] = fVar491 * fStack_184 +
                        fVar500 * local_268._4_4_ + fVar502 * (float)local_2c8._4_4_ +
                        fVar511 * fStack_3b4 + local_3d8._4_4_ +
                        fVar65 * local_2e8._4_4_ + fVar368 * fStack_394 +
                        local_2a8._4_4_ * local_298._4_4_ + fVar60 * local_308._4_4_ +
                        fVar484 * (float)local_258._4_4_;
            pfVar2[2] = fVar492 * fStack_180 + fVar501 * fStack_260 + fVar506 * fStack_2c0 +
                        fVar512 * fStack_3b0 + fStack_3d0 +
                        fVar66 * fStack_2e0 + fVar381 * fStack_390 +
                        (float)uStack_2a0 * fStack_290 + fVar61 * (float)uStack_300 +
                        fVar485 * fStack_250;
            pfVar2[3] = fVar493 * fStack_17c + fVar505 * fStack_25c + fVar515 * fStack_2bc +
                        fVar513 * fStack_3ac + fStack_3cc +
                        fVar67 * fStack_2dc + fVar382 * fStack_38c +
                        uStack_2a0._4_4_ * fStack_28c + fVar62 * uStack_300._4_4_ +
                        fVar486 * fStack_24c;
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x50);
            fVar366 = *pfVar2;
            fVar511 = pfVar2[1];
            fVar512 = pfVar2[2];
            fVar513 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x50);
            fVar64 = *pfVar2;
            fVar65 = pfVar2[1];
            fVar66 = pfVar2[2];
            fVar67 = pfVar2[3];
            puVar1 = (undefined8 *)((long)pfVar319 + lVar308 + 0x50);
            uVar269 = *puVar1;
            uVar270 = puVar1[1];
            local_318._0_4_ = (float)uVar269;
            local_318._4_4_ = (float)((ulong)uVar269 >> 0x20);
            fStack_310 = (float)uVar270;
            fStack_30c = (float)((ulong)uVar270 >> 0x20);
            pfVar2 = (float *)(pauVar311[2] + lVar308);
            *pfVar2 = fVar514 * local_3b8 + (float)local_3d8 +
                      fVar68 * (float)local_2e8 + fVar386 * (float)local_268 +
                      (float)local_2c8._0_4_ * (float)local_2a8 + fVar383 * local_398 +
                      fVar345 * local_188 +
                      fVar347 * (float)local_308 + fVar330 * (float)local_298 +
                      fVar427 * (float)local_258._0_4_;
            pfVar2[1] = fVar368 * fStack_3b4 + local_3d8._4_4_ +
                        fVar502 * local_2e8._4_4_ + fVar491 * local_268._4_4_ +
                        (float)local_2c8._4_4_ * local_2a8._4_4_ + fVar60 * fStack_394 +
                        fVar484 * fStack_184 +
                        fVar364 * local_308._4_4_ + fVar343 * local_298._4_4_ +
                        fVar487 * (float)local_258._4_4_;
            pfVar2[2] = fVar381 * fStack_3b0 + fStack_3d0 +
                        fVar506 * fStack_2e0 + fVar492 * fStack_260 +
                        fStack_2c0 * (float)uStack_2a0 + fVar61 * fStack_390 + fVar485 * fStack_180
                        + fVar365 * (float)uStack_300 + fVar367 * fStack_290 + fVar69 * fStack_250;
            pfVar2[3] = fVar382 * fStack_3ac + fStack_3cc +
                        fVar515 * fStack_2dc + fVar493 * fStack_25c +
                        fStack_2bc * uStack_2a0._4_4_ + fVar62 * fStack_38c + fVar486 * fStack_17c +
                        fVar63 * uStack_300._4_4_ + fVar426 * fStack_28c + fVar70 * fStack_24c;
            fVar386 = (float)local_2a8 * (float)local_2e8;
            fVar491 = local_2a8._4_4_ * local_2e8._4_4_;
            fVar492 = (float)uStack_2a0 * fStack_2e0;
            fVar493 = uStack_2a0._4_4_ * fStack_2dc;
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x60);
            fVar514 = *pfVar2;
            fVar368 = pfVar2[1];
            local_2a8 = *(ulong *)pfVar2;
            fVar381 = pfVar2[2];
            fVar382 = pfVar2[3];
            uStack_2a0 = *(ulong *)(pfVar2 + 2);
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x60);
            fVar68 = *pfVar2;
            fVar502 = pfVar2[1];
            fVar506 = pfVar2[2];
            fVar515 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar319 + lVar308 + 0x60);
            fVar428 = *pfVar2;
            fVar500 = pfVar2[1];
            fVar501 = pfVar2[2];
            fVar505 = pfVar2[3];
            pfVar2 = (float *)(pauVar311[3] + lVar308);
            *pfVar2 = fVar366 * (float)local_308 + (float)local_298 * fVar64 +
                      (float)local_318 * (float)local_258._0_4_ +
                      fVar347 * local_398 + (float)local_2c8._0_4_ * fVar330 + local_188 * fVar427 +
                      fVar386 + (float)local_268 * fVar345 + fVar383 * local_3b8 + (float)local_3d8;
            pfVar2[1] = fVar511 * local_308._4_4_ + local_298._4_4_ * fVar65 +
                        local_318._4_4_ * (float)local_258._4_4_ +
                        fVar364 * fStack_394 + (float)local_2c8._4_4_ * fVar343 +
                        fStack_184 * fVar487 +
                        fVar491 + local_268._4_4_ * fVar484 + fVar60 * fStack_3b4 + local_3d8._4_4_;
            pfVar2[2] = fVar512 * (float)uStack_300 + fStack_290 * fVar66 + fStack_310 * fStack_250
                        + fVar365 * fStack_390 + fStack_2c0 * fVar367 + fStack_180 * fVar69 +
                          fVar492 + fStack_260 * fVar485 + fVar61 * fStack_3b0 + fStack_3d0;
            pfVar2[3] = fVar513 * uStack_300._4_4_ + fStack_28c * fVar67 + fStack_30c * fStack_24c +
                        fVar63 * fStack_38c + fStack_2bc * fVar426 + fStack_17c * fVar70 +
                        fVar493 + fStack_25c * fVar486 + fVar62 * fStack_3ac + fStack_3cc;
            pauVar6 = (undefined1 (*) [12])((long)pfVar323 + lVar308 + 0x70);
            fVar383 = *(float *)*pauVar6;
            fVar60 = *(float *)(*pauVar6 + 4);
            fVar61 = *(float *)(*pauVar6 + 8);
            auVar282 = *pauVar6;
            fVar62 = *(float *)pauVar6[1];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x70);
            fVar386 = *pfVar2;
            fVar491 = pfVar2[1];
            local_278 = *(ulong *)pfVar2;
            fStack_270 = pfVar2[2];
            fStack_26c = pfVar2[3];
            auVar504 = *(undefined1 (*) [16])((long)pfVar319 + lVar308 + 0x70);
            pfVar2 = (float *)(pauVar311[4] + lVar308);
            *pfVar2 = fVar347 * local_3b8 + (float)local_3d8 +
                      (float)local_268 * fVar427 + (float)local_2e8 * fVar330 +
                      fVar64 * (float)local_2c8._0_4_ + fVar366 * local_398 +
                      local_188 * (float)local_318 +
                      fVar514 * (float)local_308 + (float)local_298 * fVar68 +
                      fVar428 * (float)local_258._0_4_;
            pfVar2[1] = fVar364 * fStack_3b4 + local_3d8._4_4_ +
                        local_268._4_4_ * fVar487 + local_2e8._4_4_ * fVar343 +
                        fVar65 * (float)local_2c8._4_4_ + fVar511 * fStack_394 +
                        fStack_184 * local_318._4_4_ +
                        fVar368 * local_308._4_4_ + local_298._4_4_ * fVar502 +
                        fVar500 * (float)local_258._4_4_;
            pfVar2[2] = fVar365 * fStack_3b0 + fStack_3d0 +
                        fStack_260 * fVar69 + fStack_2e0 * fVar367 +
                        fVar66 * fStack_2c0 + fVar512 * fStack_390 + fStack_180 * fStack_310 +
                        fVar381 * (float)uStack_300 + fStack_290 * fVar506 + fVar501 * fStack_250;
            pfVar2[3] = fVar63 * fStack_3ac + fStack_3cc +
                        fStack_25c * fVar70 + fStack_2dc * fVar426 +
                        fVar67 * fStack_2bc + fVar513 * fStack_38c + fStack_17c * fStack_30c +
                        fVar382 * uStack_300._4_4_ + fStack_28c * fVar515 + fVar505 * fStack_24c;
            fVar330 = (float)local_268 * (float)local_318;
            fVar343 = local_268._4_4_ * local_318._4_4_;
            fVar493 = fStack_260 * fStack_310;
            fVar345 = fStack_25c * fStack_30c;
            fVar484 = auVar504._0_4_;
            fVar485 = auVar504._4_4_;
            fVar486 = auVar504._8_4_;
            fVar487 = auVar504._12_4_;
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x80);
            fVar347 = *pfVar2;
            fVar364 = pfVar2[1];
            fVar365 = pfVar2[2];
            fVar63 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x80);
            fVar367 = *pfVar2;
            fVar426 = pfVar2[1];
            fVar427 = pfVar2[2];
            fVar492 = pfVar2[3];
            pauVar6 = (undefined1 (*) [12])((long)pfVar319 + lVar308 + 0x80);
            auVar275 = *pauVar6;
            local_318._0_4_ = (float)*(undefined8 *)*pauVar6;
            local_318._4_4_ = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
            fStack_310 = (float)*(undefined8 *)(*pauVar6 + 8);
            fStack_30c = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
            pfVar2 = (float *)(pauVar311[5] + lVar308);
            *pfVar2 = fVar366 * local_3b8 + (float)local_3d8 + fVar64 * (float)local_2e8 + fVar330 +
                      fVar514 * local_398 + fVar68 * (float)local_2c8._0_4_ + fVar428 * local_188 +
                      (float)local_308 * fVar383 + (float)local_298 * fVar386 +
                      fVar484 * (float)local_258._0_4_;
            pfVar2[1] = fVar511 * fStack_3b4 + local_3d8._4_4_ + fVar65 * local_2e8._4_4_ + fVar343
                        + fVar368 * fStack_394 + fVar502 * (float)local_2c8._4_4_ +
                          fVar500 * fStack_184 +
                        local_308._4_4_ * fVar60 + local_298._4_4_ * fVar491 +
                        fVar485 * (float)local_258._4_4_;
            pfVar2[2] = fVar512 * fStack_3b0 + fStack_3d0 + fVar66 * fStack_2e0 + fVar493 +
                        fVar381 * fStack_390 + fVar506 * fStack_2c0 + fVar501 * fStack_180 +
                        (float)uStack_300 * fVar61 + fStack_290 * fStack_270 + fVar486 * fStack_250;
            pfVar2[3] = fVar513 * fStack_3ac + fStack_3cc + fVar67 * fStack_2dc + fVar345 +
                        fVar382 * fStack_38c + fVar515 * fStack_2bc + fVar505 * fStack_17c +
                        uStack_300._4_4_ * fVar62 + fStack_28c * fStack_26c + fVar487 * fStack_24c;
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x90);
            fVar366 = *pfVar2;
            fVar511 = pfVar2[1];
            fVar512 = pfVar2[2];
            fVar513 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x90);
            fVar383 = *pfVar2;
            fVar60 = pfVar2[1];
            fVar61 = pfVar2[2];
            fVar330 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar319 + lVar308 + 0x90);
            fVar343 = *pfVar2;
            fVar64 = pfVar2[1];
            fVar65 = pfVar2[2];
            fVar66 = pfVar2[3];
            pfVar2 = (float *)(pauVar311[6] + lVar308);
            *pfVar2 = local_3b8 * fVar514 + (float)local_3d8 +
                      fVar428 * (float)local_268 + fVar68 * (float)local_2e8 +
                      local_188 * fVar484 +
                      auVar282._0_4_ * local_398 + fVar386 * (float)local_2c8._0_4_ +
                      (float)local_308 * fVar347 + fVar367 * (float)local_298 +
                      auVar275._0_4_ * (float)local_258._0_4_;
            pfVar2[1] = fStack_3b4 * fVar368 + local_3d8._4_4_ +
                        fVar500 * local_268._4_4_ + fVar502 * local_2e8._4_4_ +
                        fStack_184 * fVar485 +
                        auVar282._4_4_ * fStack_394 + fVar491 * (float)local_2c8._4_4_ +
                        local_308._4_4_ * fVar364 + fVar426 * local_298._4_4_ +
                        auVar275._4_4_ * (float)local_258._4_4_;
            pfVar2[2] = fStack_3b0 * fVar381 + fStack_3d0 +
                        fVar501 * fStack_260 + fVar506 * fStack_2e0 +
                        fStack_180 * fVar486 + auVar282._8_4_ * fStack_390 + fStack_270 * fStack_2c0
                        + (float)uStack_300 * fVar365 + fVar427 * fStack_290 +
                          auVar275._8_4_ * fStack_250;
            pfVar2[3] = fStack_3ac * fVar382 + fStack_3cc +
                        fVar505 * fStack_25c + fVar515 * fStack_2dc +
                        fStack_17c * fVar487 + fVar62 * fStack_38c + fStack_26c * fStack_2bc +
                        uStack_300._4_4_ * fVar63 + fVar492 * fStack_28c + fStack_30c * fStack_24c;
            auVar332._0_4_ =
                 local_3b8 * auVar282._0_4_ + (float)local_3d8 +
                 (float)local_2e8 * fVar386 + fVar484 * (float)local_268 +
                 fVar347 * local_398 + fVar367 * (float)uVar50 + auVar275._0_4_ * local_188 +
                 (float)local_308 * fVar366 + (float)local_298 * fVar383 +
                 (float)local_258._0_4_ * fVar343;
            auVar332._4_4_ =
                 fStack_3b4 * auVar282._4_4_ + local_3d8._4_4_ +
                 local_2e8._4_4_ * fVar491 + fVar485 * local_268._4_4_ +
                 fVar364 * fStack_394 + fVar426 * (float)local_2c8._4_4_ +
                 auVar275._4_4_ * fStack_184 +
                 local_308._4_4_ * fVar511 + local_298._4_4_ * fVar60 +
                 (float)local_258._4_4_ * fVar64;
            auVar332._8_4_ =
                 fStack_3b0 * auVar282._8_4_ + fStack_3d0 +
                 fStack_2e0 * fStack_270 + fVar486 * fStack_260 +
                 fVar365 * fStack_390 + fVar427 * fStack_2c0 + auVar275._8_4_ * fStack_180 +
                 (float)uStack_300 * fVar512 + fStack_290 * fVar61 + fStack_250 * fVar65;
            auVar332._12_4_ =
                 fStack_3ac * fVar62 + fStack_3cc + fStack_2dc * fStack_26c + fVar487 * fStack_25c +
                 fVar63 * fStack_38c + fVar492 * fStack_2bc + fStack_30c * fStack_17c +
                 uStack_300._4_4_ * fVar513 + fStack_28c * fVar330 + fStack_24c * fVar66;
            *(undefined1 (*) [16])(pauVar311[7] + lVar308) = auVar332;
            iVar309 = iVar309 + 8;
            lVar308 = lVar308 + 0x80;
            pfVar325 = pfVar325 + 0x20;
            pfVar301 = pfVar301 + 0x20;
            pfVar299 = pfVar299 + 0x20;
          }
          for (; iVar309 + 3 < iVar289; iVar309 = iVar309 + 4) {
            pfVar4 = (float *)((long)pfVar323 + lVar308);
            fVar366 = pfVar4[1];
            fVar511 = pfVar4[2];
            fVar512 = pfVar4[3];
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x10);
            fVar513 = *pfVar2;
            fVar514 = pfVar2[1];
            fVar368 = pfVar2[2];
            fVar381 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x20);
            fVar382 = *pfVar2;
            fVar383 = pfVar2[1];
            local_278 = *(ulong *)pfVar2;
            fStack_270 = pfVar2[2];
            fStack_26c = pfVar2[3];
            puVar1 = (undefined8 *)((long)pfVar323 + lVar308 + 0x30);
            uVar269 = *puVar1;
            uVar270 = puVar1[1];
            local_318._0_4_ = (float)uVar269;
            local_318._4_4_ = (float)((ulong)uVar269 >> 0x20);
            fStack_310 = (float)uVar270;
            fStack_30c = (float)((ulong)uVar270 >> 0x20);
            pfVar5 = (float *)((long)pfVar314 + lVar308);
            fVar60 = pfVar5[1];
            fVar61 = pfVar5[2];
            fVar62 = pfVar5[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x10);
            fVar63 = *pfVar2;
            fVar330 = pfVar2[1];
            fVar343 = pfVar2[2];
            fVar64 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x20);
            fVar65 = *pfVar2;
            fVar66 = pfVar2[1];
            fVar67 = pfVar2[2];
            fVar68 = pfVar2[3];
            puVar8 = (ulong *)((long)pfVar314 + lVar308 + 0x30);
            uVar300 = *puVar8;
            uVar292 = puVar8[1];
            fVar347 = auVar276._0_4_;
            fVar364 = auVar276._4_4_;
            fVar365 = auVar276._8_4_;
            pfVar2 = (float *)((long)pfVar319 + lVar308);
            fVar502 = pfVar2[1];
            fVar506 = pfVar2[2];
            fVar515 = pfVar2[3];
            pfVar3 = (float *)((long)pfVar319 + lVar308 + 0x10);
            fVar367 = *pfVar3;
            fVar426 = pfVar3[1];
            fVar427 = pfVar3[2];
            fVar428 = pfVar3[3];
            pfVar3 = (float *)((long)pfVar319 + lVar308 + 0x20);
            fVar500 = *pfVar3;
            fVar501 = pfVar3[1];
            fVar505 = pfVar3[2];
            fVar386 = pfVar3[3];
            pfVar3 = (float *)((long)pfVar319 + lVar308 + 0x30);
            fVar491 = *pfVar3;
            fVar492 = pfVar3[1];
            fVar493 = pfVar3[2];
            fVar345 = pfVar3[3];
            pfVar3 = (float *)((long)*pauVar311 + lVar308);
            *pfVar3 = local_3b8 * *pfVar4 + (float)local_3d8 +
                      fVar513 * local_398 + (float)local_308 * fVar382 +
                      (float)local_2e8 * *pfVar5 + fVar63 * (float)local_2c8._0_4_ +
                      fVar65 * fVar347 +
                      fVar500 * (float)local_258._0_4_ +
                      fVar367 * local_188 + (float)local_268 * *pfVar2;
            pfVar3[1] = fStack_3b4 * fVar366 + local_3d8._4_4_ +
                        fVar514 * fStack_394 + local_308._4_4_ * fVar383 +
                        local_2e8._4_4_ * fVar60 + fVar330 * (float)local_2c8._4_4_ +
                        fVar66 * fVar364 +
                        fVar501 * (float)local_258._4_4_ +
                        fVar426 * fStack_184 + local_268._4_4_ * fVar502;
            pfVar3[2] = fStack_3b0 * fVar511 + fStack_3d0 +
                        fVar368 * fStack_390 + (float)uStack_300 * fStack_270 +
                        fStack_2e0 * fVar61 + fVar343 * fStack_2c0 + fVar67 * fVar365 +
                        fVar505 * fStack_250 + fVar427 * fStack_180 + fStack_260 * fVar506;
            pfVar3[3] = fStack_3ac * fVar512 + fStack_3cc +
                        fVar381 * fStack_38c + uStack_300._4_4_ * fStack_26c +
                        fStack_2dc * fVar62 + fVar64 * fStack_2bc + fVar68 * fStack_28c +
                        fVar386 * fStack_24c + fVar428 * fStack_17c + fStack_25c * fVar515;
            local_2a8._0_4_ = (float)uVar300;
            local_2a8._4_4_ = (float)(uVar300 >> 0x20);
            uStack_2a0._0_4_ = (float)uVar292;
            uStack_2a0._4_4_ = (float)(uVar292 >> 0x20);
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x40);
            fVar366 = *pfVar2;
            fVar511 = pfVar2[1];
            fVar512 = pfVar2[2];
            fVar60 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x40);
            fVar61 = *pfVar2;
            fVar62 = pfVar2[1];
            fVar502 = pfVar2[2];
            fVar506 = pfVar2[3];
            puVar1 = (undefined8 *)((long)pfVar319 + lVar308 + 0x40);
            uVar269 = *puVar1;
            uVar270 = puVar1[1];
            pfVar2 = (float *)(pauVar311[1] + lVar308);
            *pfVar2 = fVar513 * local_3b8 + (float)local_3d8 +
                      fVar382 * local_398 + fVar63 * (float)local_2e8 +
                      fVar65 * (float)local_2c8._0_4_ + fVar367 * (float)local_268 +
                      fVar500 * local_188 +
                      (float)local_318 * (float)local_308 + fVar347 * (float)local_2a8 +
                      fVar491 * (float)local_258._0_4_;
            pfVar2[1] = fVar514 * fStack_3b4 + local_3d8._4_4_ +
                        fVar383 * fStack_394 + fVar330 * local_2e8._4_4_ +
                        fVar66 * (float)local_2c8._4_4_ + fVar426 * local_268._4_4_ +
                        fVar501 * fStack_184 +
                        local_318._4_4_ * local_308._4_4_ + fVar364 * local_2a8._4_4_ +
                        fVar492 * (float)local_258._4_4_;
            pfVar2[2] = fVar368 * fStack_3b0 + fStack_3d0 +
                        fStack_270 * fStack_390 + fVar343 * fStack_2e0 +
                        fVar67 * fStack_2c0 + fVar427 * fStack_260 + fVar505 * fStack_180 +
                        fStack_310 * (float)uStack_300 + fVar365 * (float)uStack_2a0 +
                        fVar493 * fStack_250;
            pfVar2[3] = fVar381 * fStack_3ac + fStack_3cc +
                        fStack_26c * fStack_38c + fVar64 * fStack_2dc +
                        fVar68 * fStack_2bc + fVar428 * fStack_25c + fVar386 * fStack_17c +
                        fStack_30c * uStack_300._4_4_ + fStack_28c * uStack_2a0._4_4_ +
                        fVar345 * fStack_24c;
            local_1e8 = (float)uVar269;
            fStack_1e4 = (float)((ulong)uVar269 >> 0x20);
            fStack_1e0 = (float)uVar270;
            fStack_1dc = (float)((ulong)uVar270 >> 0x20);
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x50);
            fVar513 = *pfVar2;
            fVar514 = pfVar2[1];
            fVar368 = pfVar2[2];
            fVar381 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x50);
            fVar63 = *pfVar2;
            fVar330 = pfVar2[1];
            fVar343 = pfVar2[2];
            fVar64 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar319 + lVar308 + 0x50);
            fVar515 = *pfVar2;
            fVar367 = pfVar2[1];
            fVar426 = pfVar2[2];
            fVar427 = pfVar2[3];
            pfVar2 = (float *)(pauVar311[2] + lVar308);
            *pfVar2 = (float)local_3d8 + fVar382 * local_3b8 +
                      fVar65 * auVar277._0_4_ + fVar500 * (float)local_268 +
                      (float)local_2a8 * (float)local_2c8._0_4_ + (float)local_318 * local_398 +
                      fVar491 * local_188 +
                      (float)local_308 * fVar366 + fVar347 * fVar61 +
                      local_1e8 * (float)local_258._0_4_;
            pfVar2[1] = local_3d8._4_4_ + fVar383 * fStack_3b4 +
                        fVar66 * auVar277._4_4_ + fVar501 * local_268._4_4_ +
                        local_2a8._4_4_ * (float)local_2c8._4_4_ + local_318._4_4_ * fStack_394 +
                        fVar492 * fStack_184 +
                        local_308._4_4_ * fVar511 + fVar364 * fVar62 +
                        fStack_1e4 * (float)local_258._4_4_;
            pfVar2[2] = fStack_3d0 + fStack_270 * fStack_3b0 +
                        fVar67 * auVar277._8_4_ + fVar505 * fStack_260 +
                        (float)uStack_2a0 * fStack_2c0 + fStack_310 * fStack_390 +
                        fVar493 * fStack_180 +
                        (float)uStack_300 * fVar512 + fVar365 * fVar502 + fStack_1e0 * fStack_250;
            pfVar2[3] = fStack_3cc + fStack_26c * fStack_3ac +
                        fVar68 * fStack_2dc + fVar386 * fStack_25c +
                        uStack_2a0._4_4_ * fStack_2bc + fStack_30c * fStack_38c +
                        fVar345 * fStack_17c +
                        uStack_300._4_4_ * fVar60 + fStack_28c * fVar506 + fStack_1dc * fStack_24c;
            auVar333._0_4_ =
                 (float)local_3d8 + (float)local_318 * local_3b8 +
                 auVar277._0_4_ * (float)local_2a8 + fVar491 * (float)local_268 +
                 fVar366 * local_398 + fVar61 * (float)local_2c8._0_4_ + local_1e8 * local_188 +
                 (float)local_308 * fVar513 + fVar347 * fVar63 + (float)local_258._0_4_ * fVar515;
            auVar333._4_4_ =
                 local_3d8._4_4_ + local_318._4_4_ * fStack_3b4 +
                 auVar277._4_4_ * local_2a8._4_4_ + fVar492 * local_268._4_4_ +
                 fVar511 * fStack_394 + fVar62 * (float)local_2c8._4_4_ + fStack_1e4 * fStack_184 +
                 local_308._4_4_ * fVar514 + fVar364 * fVar330 + (float)local_258._4_4_ * fVar367;
            auVar333._8_4_ =
                 fStack_3d0 + fStack_310 * fStack_3b0 +
                 auVar277._8_4_ * (float)uStack_2a0 + fVar493 * fStack_260 +
                 fVar512 * fStack_390 + fVar502 * fStack_2c0 + fStack_1e0 * fStack_180 +
                 (float)uStack_300 * fVar368 + fVar365 * fVar343 + fStack_250 * fVar426;
            auVar333._12_4_ =
                 fStack_3cc + fStack_30c * fStack_3ac +
                 fStack_2dc * uStack_2a0._4_4_ + fVar345 * fStack_25c +
                 fVar60 * fStack_38c + fVar506 * fStack_2bc + fStack_1dc * fStack_17c +
                 uStack_300._4_4_ * fVar381 + fStack_28c * fVar64 + fStack_24c * fVar427;
            *(undefined1 (*) [16])(pauVar311[3] + lVar308) = auVar333;
            lVar308 = lVar308 + 0x40;
            pfVar325 = pfVar325 + 0x10;
            pfVar301 = pfVar301 + 0x10;
            pfVar299 = pfVar299 + 0x10;
            local_2a8 = uVar300;
            uStack_2a0 = uVar292;
          }
          for (; iVar309 + 1 < iVar289; iVar309 = iVar309 + 2) {
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x10);
            local_318._0_4_ = *pfVar2;
            local_318._4_4_ = pfVar2[1];
            fStack_310 = pfVar2[2];
            fStack_30c = pfVar2[3];
            pfVar2 = (float *)((long)pfVar323 + lVar308 + 0x20);
            fVar347 = *pfVar2;
            fVar364 = pfVar2[1];
            fVar365 = pfVar2[2];
            fVar366 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x10);
            fVar511 = *pfVar2;
            fVar512 = pfVar2[1];
            fVar513 = pfVar2[2];
            fVar514 = pfVar2[3];
            pfVar2 = (float *)((long)pfVar314 + lVar308 + 0x20);
            fVar368 = *pfVar2;
            fVar381 = pfVar2[1];
            local_2a8 = *(ulong *)pfVar2;
            fVar382 = pfVar2[2];
            fVar383 = pfVar2[3];
            uStack_2a0 = *(ulong *)(pfVar2 + 2);
            pfVar2 = (float *)((long)pfVar319 + lVar308 + 0x10);
            fVar60 = *pfVar2;
            fVar61 = pfVar2[1];
            fVar62 = pfVar2[2];
            fVar63 = pfVar2[3];
            pfVar4 = (float *)((long)pfVar323 + lVar308);
            fVar330 = pfVar4[1];
            fVar343 = pfVar4[2];
            fVar64 = pfVar4[3];
            pfVar2 = (float *)((long)pfVar319 + lVar308 + 0x20);
            fVar65 = *pfVar2;
            fVar66 = pfVar2[1];
            local_278 = *(ulong *)pfVar2;
            fStack_270 = pfVar2[2];
            fStack_26c = pfVar2[3];
            pfVar5 = (float *)((long)pfVar314 + lVar308);
            fVar67 = pfVar5[1];
            fVar68 = pfVar5[2];
            fVar502 = pfVar5[3];
            pfVar2 = (float *)((long)pfVar319 + lVar308);
            fVar506 = pfVar2[1];
            fVar515 = pfVar2[2];
            fVar367 = pfVar2[3];
            pfVar3 = (float *)((long)pfVar323 + lVar308 + 0x30);
            fVar426 = *pfVar3;
            fVar427 = pfVar3[1];
            fVar428 = pfVar3[2];
            fVar500 = pfVar3[3];
            pfVar3 = (float *)((long)pfVar314 + lVar308 + 0x30);
            fVar501 = *pfVar3;
            fVar505 = pfVar3[1];
            fVar386 = pfVar3[2];
            fVar491 = pfVar3[3];
            pfVar3 = (float *)((long)pfVar319 + lVar308 + 0x30);
            fVar492 = *pfVar3;
            fVar493 = pfVar3[1];
            fVar345 = pfVar3[2];
            fVar484 = pfVar3[3];
            pfVar3 = (float *)((long)*pauVar311 + lVar308);
            *pfVar3 = local_3b8 * *pfVar4 + (float)local_3d8 +
                      local_398 * (float)local_318 + fVar347 * (float)local_308 +
                      auVar278._0_4_ * *pfVar5 + (float)local_2c8._0_4_ * fVar511 +
                      auVar279._0_4_ * fVar368 +
                      auVar280._0_4_ * *pfVar2 + fVar60 * auVar281._0_4_ +
                      fVar65 * (float)local_258._0_4_;
            pfVar3[1] = fStack_3b4 * fVar330 + local_3d8._4_4_ +
                        fStack_394 * local_318._4_4_ + fVar364 * local_308._4_4_ +
                        auVar278._4_4_ * fVar67 + (float)local_2c8._4_4_ * fVar512 +
                        auVar279._4_4_ * fVar381 +
                        auVar280._4_4_ * fVar506 + fVar61 * auVar281._4_4_ +
                        fVar66 * (float)local_258._4_4_;
            pfVar3[2] = fStack_3b0 * fVar343 + fStack_3d0 +
                        fStack_390 * fStack_310 + fVar365 * (float)uStack_300 +
                        auVar278._8_4_ * fVar68 + fStack_2c0 * fVar513 + auVar279._8_4_ * fVar382 +
                        auVar280._8_4_ * fVar515 + fVar62 * auVar281._8_4_ + fStack_270 * fStack_250
            ;
            pfVar3[3] = fStack_3ac * fVar64 + fStack_3cc +
                        fStack_38c * fStack_30c + fVar366 * uStack_300._4_4_ +
                        fStack_2dc * fVar502 + fStack_2bc * fVar514 + fStack_28c * fVar383 +
                        fStack_25c * fVar367 + fVar63 * fStack_17c + fStack_26c * fStack_24c;
            auVar334._0_4_ =
                 (float)local_308 * fVar426 + auVar279._0_4_ * fVar501 +
                 (float)local_258._0_4_ * fVar492 +
                 (float)local_3d8 + (float)local_318 * local_3b8 +
                 local_398 * fVar347 + fVar511 * auVar278._0_4_ +
                 (float)local_2c8._0_4_ * fVar368 + auVar280._0_4_ * fVar60 +
                 auVar281._0_4_ * fVar65;
            auVar334._4_4_ =
                 local_308._4_4_ * fVar427 + auVar279._4_4_ * fVar505 +
                 (float)local_258._4_4_ * fVar493 +
                 local_3d8._4_4_ + local_318._4_4_ * fStack_3b4 +
                 fStack_394 * fVar364 + fVar512 * auVar278._4_4_ +
                 (float)local_2c8._4_4_ * fVar381 + auVar280._4_4_ * fVar61 +
                 auVar281._4_4_ * fVar66;
            auVar334._8_4_ =
                 (float)uStack_300 * fVar428 + auVar279._8_4_ * fVar386 + fStack_250 * fVar345 +
                 fStack_3d0 + fStack_310 * fStack_3b0 +
                 fStack_390 * fVar365 + fVar513 * auVar278._8_4_ +
                 fStack_2c0 * fVar382 + auVar280._8_4_ * fVar62 + auVar281._8_4_ * fStack_270;
            auVar334._12_4_ =
                 uStack_300._4_4_ * fVar500 + fStack_28c * fVar491 + fStack_24c * fVar484 +
                 fStack_3cc + fStack_30c * fStack_3ac + fStack_38c * fVar366 + fVar514 * fStack_2dc
                 + fStack_2bc * fVar383 + fStack_25c * fVar63 + fStack_17c * fStack_26c;
            *(undefined1 (*) [16])(pauVar311[1] + lVar308) = auVar334;
            lVar308 = lVar308 + 0x20;
            pfVar325 = pfVar325 + 8;
            pfVar301 = pfVar301 + 8;
            pfVar299 = pfVar299 + 8;
          }
          pauVar311 = (undefined1 (*) [16])((long)*pauVar311 + lVar308);
          pfVar323 = pfVar325;
          for (; iVar309 < iVar289; iVar309 = iVar309 + 1) {
            auVar335._0_4_ =
                 local_3b8 * pfVar323[-8] + (float)local_3d8 +
                 local_398 * pfVar323[-4] + (float)local_308 * *pfVar323 +
                 (float)local_2e8 * pfVar301[-8] + (float)local_2c8._0_4_ * pfVar301[-4] +
                 (float)local_298 * *pfVar301 +
                 (float)local_268 * pfVar299[-8] + local_188 * pfVar299[-4] +
                 (float)local_258._0_4_ * *pfVar299;
            auVar335._4_4_ =
                 fStack_3b4 * pfVar323[-7] + local_3d8._4_4_ +
                 fStack_394 * pfVar323[-3] + local_308._4_4_ * pfVar323[1] +
                 local_2e8._4_4_ * pfVar301[-7] + (float)local_2c8._4_4_ * pfVar301[-3] +
                 local_298._4_4_ * pfVar301[1] +
                 local_268._4_4_ * pfVar299[-7] + fStack_184 * pfVar299[-3] +
                 (float)local_258._4_4_ * pfVar299[1];
            auVar335._8_4_ =
                 fStack_3b0 * pfVar323[-6] + fStack_3d0 +
                 fStack_390 * pfVar323[-2] + (float)uStack_300 * pfVar323[2] +
                 fStack_2e0 * pfVar301[-6] + fStack_2c0 * pfVar301[-2] + fStack_290 * pfVar301[2] +
                 fStack_260 * pfVar299[-6] + fStack_180 * pfVar299[-2] + fStack_250 * pfVar299[2];
            auVar335._12_4_ =
                 fStack_3ac * pfVar323[-5] + fStack_3cc +
                 fStack_38c * pfVar323[-1] + uStack_300._4_4_ * pfVar323[3] +
                 fStack_2dc * pfVar301[-5] + fStack_2bc * pfVar301[-1] + fStack_28c * pfVar301[3] +
                 fStack_25c * pfVar299[-5] + fStack_17c * pfVar299[-1] + fStack_24c * pfVar299[3];
            *pauVar311 = auVar335;
            pauVar311 = pauVar311 + 1;
            pfVar323 = pfVar323 + 4;
            pfVar301 = pfVar301 + 4;
            pfVar299 = pfVar299 + 4;
          }
          pfVar314 = pfVar301;
          pfVar319 = pfVar299;
        }
        uVar310 = uVar310 + 1;
        local_308 = piVar321;
        uStack_300 = uVar296;
        _local_2c8 = auVar443;
        local_2e8 = piVar324;
      }
      goto LAB_003b5cf8;
    }
    bVar288 = (byte)iVar290;
    if ((iVar293 == 2 && iVar289 == 2) && bVar288 == 0xf) {
      iVar289 = top_blob->w;
      pvVar315 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar310 = 0;
      uVar327 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar327 = uVar310;
      }
      uVar296 = (ulong)(uint)local_368.c;
      if (local_368.c < 1) {
        uVar296 = uVar310;
      }
      lVar308 = (long)((local_368.w - iVar289) * 8) * 4;
      for (; local_268 = CONCAT44(local_268._4_4_,(float)local_268),
          local_318 = CONCAT44(local_318._4_4_,(float)local_318),
          local_298 = CONCAT44(local_298._4_4_,(float)local_298), uVar310 != uVar296;
          uVar310 = uVar310 + 1) {
        if (pvVar315 == (void *)0x0) {
          fVar347 = 0.0;
          fVar364 = 0.0;
          fVar365 = 0.0;
          fVar366 = 0.0;
        }
        else {
          pfVar314 = (float *)((long)pvVar315 + uVar310 * 0x10);
          fVar347 = *pfVar314;
          fVar364 = pfVar314[1];
          fVar365 = pfVar314[2];
          fVar366 = pfVar314[3];
        }
        pauVar311 = (undefined1 (*) [16])
                    (top_blob->cstep * uVar310 * top_blob->elemsize + (long)top_blob->data);
        pvVar291 = (this->weight_data_tm).data;
        lVar318 = (long)(this->weight_data_tm).w * uVar310 * (this->weight_data_tm).elemsize;
        piVar317 = (pointer)(local_368.cstep * uVar310 *
                             CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) +
                            (long)local_368.data);
        lVar306 = (long)local_368.w *
                  CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
        piVar321 = (pointer)((long)piVar317 + lVar306);
        pvVar322 = (void *)((long)piVar317 + lVar306 * 2);
        pfVar314 = (float *)((long)pvVar291 + lVar318);
        fVar60 = *pfVar314;
        fVar61 = pfVar314[1];
        fVar62 = pfVar314[2];
        fVar63 = pfVar314[3];
        puVar1 = (undefined8 *)((long)pvVar291 + lVar318 + 0x10);
        uVar331 = *puVar1;
        uVar344 = puVar1[1];
        puVar1 = (undefined8 *)((long)pvVar291 + lVar318 + 0x20);
        uVar488 = *puVar1;
        uVar489 = puVar1[1];
        local_298._0_4_ = (float)uVar488;
        local_298._4_4_ = (float)((ulong)uVar488 >> 0x20);
        fStack_290 = (float)uVar489;
        fStack_28c = (float)((ulong)uVar489 >> 0x20);
        pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x30);
        fVar511 = *pfVar314;
        fVar512 = pfVar314[1];
        fVar513 = pfVar314[2];
        fVar514 = pfVar314[3];
        pfVar314 = (float *)((long)pvVar291 + lVar318 + 0x40);
        fVar368 = *pfVar314;
        fVar381 = pfVar314[1];
        fVar382 = pfVar314[2];
        fVar383 = pfVar314[3];
        pauVar313 = (undefined1 (*) [16])((long)pvVar291 + lVar318 + 0x50);
        uVar488 = *(undefined8 *)*pauVar313;
        uVar489 = *(undefined8 *)(*pauVar313 + 8);
        _local_258 = *pauVar313;
        pauVar6 = (undefined1 (*) [12])((long)pvVar291 + lVar318 + 0x60);
        auVar276 = *pauVar6;
        local_3b8 = (float)*(undefined8 *)*pauVar6;
        fStack_3b4 = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
        fStack_3b0 = (float)*(undefined8 *)(*pauVar6 + 8);
        fStack_3ac = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
        puVar8 = (ulong *)((long)pvVar291 + lVar318 + 0x70);
        piVar324 = (pointer)*puVar8;
        uVar300 = puVar8[1];
        local_2e8._0_4_ = SUB84(piVar324,0);
        local_2e8._4_4_ = (float)((ulong)piVar324 >> 0x20);
        fStack_2e0 = (float)uVar300;
        fStack_2dc = (float)(uVar300 >> 0x20);
        _local_2c8 = *(undefined1 (*) [16])((long)pvVar291 + lVar318 + 0x80);
        local_308 = (pointer)CONCAT44(fVar364,fVar347);
        uStack_300 = CONCAT44(fVar366,fVar365);
        for (iVar304 = 0; iVar304 != (int)uVar327; iVar304 = iVar304 + 1) {
          lVar306 = 0;
          iVar309 = 0;
          while( true ) {
            local_3d8._0_4_ = (float)uVar331;
            fStack_3d0 = (float)uVar344;
            local_3d8._4_4_ = (float)((ulong)uVar331 >> 0x20);
            fStack_3cc = (float)((ulong)uVar344 >> 0x20);
            fVar330 = (float)uVar488;
            fVar343 = (float)((ulong)uVar488 >> 0x20);
            fVar64 = (float)uVar489;
            fVar65 = (float)((ulong)uVar489 >> 0x20);
            if (iVar289 <= iVar309 + 3) break;
            pfVar314 = (float *)((long)piVar317 + lVar306);
            fVar66 = pfVar314[1];
            fVar67 = pfVar314[2];
            fVar68 = pfVar314[3];
            pfVar325 = (float *)((long)piVar317 + lVar306 + 0x10);
            fVar502 = pfVar325[1];
            fVar506 = pfVar325[2];
            fVar515 = pfVar325[3];
            pfVar319 = (float *)((long)piVar317 + lVar306 + 0x20);
            fVar367 = *pfVar319;
            fVar426 = pfVar319[1];
            fVar427 = pfVar319[2];
            fVar428 = pfVar319[3];
            pfVar319 = (float *)((long)piVar317 + lVar306 + 0x40);
            fVar500 = *pfVar319;
            fVar501 = pfVar319[1];
            fVar505 = pfVar319[2];
            fVar386 = pfVar319[3];
            pfVar319 = (float *)((long)piVar321 + lVar306);
            fVar491 = pfVar319[1];
            fVar492 = pfVar319[2];
            fVar493 = pfVar319[3];
            pfVar301 = (float *)((long)piVar321 + lVar306 + 0x10);
            fVar345 = pfVar301[1];
            fVar484 = pfVar301[2];
            fVar485 = pfVar301[3];
            pfVar323 = (float *)((long)piVar321 + lVar306 + 0x20);
            fVar486 = *pfVar323;
            fVar487 = pfVar323[1];
            fVar69 = pfVar323[2];
            fVar70 = pfVar323[3];
            pfVar323 = (float *)((long)piVar321 + lVar306 + 0x40);
            fVar71 = *pfVar323;
            fVar72 = pfVar323[1];
            fVar73 = pfVar323[2];
            fVar74 = pfVar323[3];
            pfVar323 = (float *)((long)pvVar322 + lVar306);
            fVar75 = pfVar323[1];
            fVar76 = pfVar323[2];
            fVar77 = pfVar323[3];
            pfVar299 = (float *)((long)pvVar322 + lVar306 + 0x10);
            fVar78 = pfVar299[1];
            fVar79 = pfVar299[2];
            fVar80 = pfVar299[3];
            pfVar2 = (float *)((long)pvVar322 + lVar306 + 0x20);
            fVar81 = *pfVar2;
            fVar82 = pfVar2[1];
            fVar83 = pfVar2[2];
            fVar84 = pfVar2[3];
            pfVar2 = (float *)((long)pvVar322 + lVar306 + 0x40);
            fVar103 = *pfVar2;
            fVar104 = pfVar2[1];
            fVar105 = pfVar2[2];
            fVar106 = pfVar2[3];
            pfVar2 = (float *)((long)piVar317 + lVar306 + 0x30);
            fVar85 = *pfVar2;
            fVar86 = pfVar2[1];
            fVar87 = pfVar2[2];
            fVar88 = pfVar2[3];
            pfVar2 = (float *)((long)piVar321 + lVar306 + 0x30);
            fVar89 = *pfVar2;
            fVar90 = pfVar2[1];
            fVar91 = pfVar2[2];
            fVar92 = pfVar2[3];
            pfVar2 = (float *)((long)pvVar322 + lVar306 + 0x30);
            fVar93 = *pfVar2;
            fVar94 = pfVar2[1];
            fVar95 = pfVar2[2];
            fVar96 = pfVar2[3];
            *(float *)*pauVar311 =
                 fVar60 * *pfVar314 + fVar347 +
                 (float)local_3d8 * *pfVar325 + fVar367 * (float)local_298 +
                 fVar511 * *pfVar319 + fVar368 * *pfVar301 + fVar486 * fVar330 +
                 local_3b8 * *pfVar323 + (float)local_2e8 * *pfVar299 +
                 fVar81 * (float)local_2c8._0_4_;
            *(float *)((long)*pauVar311 + 4) =
                 fVar61 * fVar66 + fVar364 + local_3d8._4_4_ * fVar502 + fVar426 * local_298._4_4_ +
                 fVar512 * fVar491 + fVar381 * fVar345 + fVar487 * fVar343 +
                 fStack_3b4 * fVar75 + local_2e8._4_4_ * fVar78 + fVar82 * (float)local_2c8._4_4_;
            *(float *)((long)*pauVar311 + 8) =
                 fVar62 * fVar67 + fVar365 + fStack_3d0 * fVar506 + fVar427 * fStack_290 +
                 fVar513 * fVar492 + fVar382 * fVar484 + fVar69 * fVar64 +
                 fStack_3b0 * fVar76 + fStack_2e0 * fVar79 + fVar83 * fStack_2c0;
            *(float *)((long)*pauVar311 + 0xc) =
                 fVar63 * fVar68 + fVar366 + fStack_3cc * fVar515 + fVar428 * fStack_28c +
                 fVar514 * fVar493 + fVar383 * fVar485 + fVar70 * fVar65 +
                 fStack_3ac * fVar77 + fStack_2dc * fVar80 + fVar84 * fStack_2bc;
            pfVar314 = (float *)((long)piVar317 + lVar306 + 0x60);
            fVar99 = *pfVar314;
            fVar100 = pfVar314[1];
            fVar101 = pfVar314[2];
            fVar102 = pfVar314[3];
            pfVar314 = (float *)((long)piVar321 + lVar306 + 0x60);
            fVar66 = *pfVar314;
            fVar67 = pfVar314[1];
            fVar68 = pfVar314[2];
            fVar502 = pfVar314[3];
            pfVar314 = (float *)((long)piVar317 + lVar306 + 0x50);
            fVar506 = *pfVar314;
            fVar515 = pfVar314[1];
            fVar491 = pfVar314[2];
            fVar492 = pfVar314[3];
            pfVar314 = (float *)((long)piVar321 + lVar306 + 0x50);
            fVar493 = *pfVar314;
            fVar345 = pfVar314[1];
            fVar484 = pfVar314[2];
            fVar485 = pfVar314[3];
            pfVar314 = (float *)((long)pvVar322 + lVar306 + 0x60);
            fVar75 = *pfVar314;
            fVar76 = pfVar314[1];
            fVar77 = pfVar314[2];
            fVar78 = pfVar314[3];
            pfVar314 = (float *)((long)pvVar322 + lVar306 + 0x50);
            fVar79 = *pfVar314;
            fVar80 = pfVar314[1];
            fVar97 = pfVar314[2];
            fVar98 = pfVar314[3];
            *(float *)pauVar311[1] =
                 fVar367 * fVar60 + fVar347 + fVar486 * fVar511 + fVar81 * local_3b8 +
                 (float)local_2e8 * fVar93 + fVar368 * fVar89 + (float)local_3d8 * fVar85 +
                 fVar500 * (float)local_298 + fVar71 * fVar330 + fVar103 * (float)local_2c8._0_4_;
            *(float *)(pauVar311[1] + 4) =
                 fVar426 * fVar61 + fVar364 + fVar487 * fVar512 + fVar82 * fStack_3b4 +
                 local_2e8._4_4_ * fVar94 + fVar381 * fVar90 + local_3d8._4_4_ * fVar86 +
                 fVar501 * local_298._4_4_ + fVar72 * fVar343 + fVar104 * (float)local_2c8._4_4_;
            *(float *)(pauVar311[1] + 8) =
                 fVar427 * fVar62 + fVar365 + fVar69 * fVar513 + fVar83 * fStack_3b0 +
                 fStack_2e0 * fVar95 + fVar382 * fVar91 + fStack_3d0 * fVar87 +
                 fVar505 * fStack_290 + fVar73 * fVar64 + fVar105 * fStack_2c0;
            *(float *)(pauVar311[1] + 0xc) =
                 fVar428 * fVar63 + fVar366 + fVar70 * fVar514 + fVar84 * fStack_3ac +
                 fStack_2dc * fVar96 + fVar383 * fVar92 + fStack_3cc * fVar88 +
                 fVar386 * fStack_28c + fVar74 * fVar65 + fVar106 * fStack_2bc;
            pfVar314 = (float *)((long)piVar317 + lVar306 + 0x70);
            fVar367 = *pfVar314;
            fVar426 = pfVar314[1];
            fVar427 = pfVar314[2];
            fVar428 = pfVar314[3];
            pfVar314 = (float *)((long)piVar317 + lVar306 + 0x80);
            fVar486 = *pfVar314;
            fVar487 = pfVar314[1];
            fVar69 = pfVar314[2];
            fVar70 = pfVar314[3];
            pfVar314 = (float *)((long)piVar321 + lVar306 + 0x70);
            fVar81 = *pfVar314;
            fVar82 = pfVar314[1];
            fVar83 = pfVar314[2];
            fVar84 = pfVar314[3];
            pfVar314 = (float *)((long)piVar321 + lVar306 + 0x80);
            fVar85 = *pfVar314;
            fVar86 = pfVar314[1];
            fVar87 = pfVar314[2];
            fVar88 = pfVar314[3];
            pfVar314 = (float *)((long)pvVar322 + lVar306 + 0x70);
            fVar89 = *pfVar314;
            fVar90 = pfVar314[1];
            fVar91 = pfVar314[2];
            fVar92 = pfVar314[3];
            pfVar314 = (float *)((long)pvVar322 + lVar306 + 0x80);
            fVar93 = *pfVar314;
            fVar94 = pfVar314[1];
            fVar95 = pfVar314[2];
            fVar96 = pfVar314[3];
            *(float *)pauVar311[2] =
                 fVar71 * fVar511 + fVar103 * local_3b8 + fVar500 * fVar60 + fVar347 +
                 (float)local_3d8 * fVar506 + fVar368 * fVar493 + (float)local_2e8 * fVar79 +
                 fVar99 * (float)local_298 + fVar66 * fVar330 + fVar75 * (float)local_2c8._0_4_;
            *(float *)(pauVar311[2] + 4) =
                 fVar72 * fVar512 + fVar104 * fStack_3b4 + fVar501 * fVar61 + fVar364 +
                 local_3d8._4_4_ * fVar515 + fVar381 * fVar345 + local_2e8._4_4_ * fVar80 +
                 fVar100 * local_298._4_4_ + fVar67 * fVar343 + fVar76 * (float)local_2c8._4_4_;
            *(float *)(pauVar311[2] + 8) =
                 fVar73 * fVar513 + fVar105 * fStack_3b0 + fVar505 * fVar62 + fVar365 +
                 fStack_3d0 * fVar491 + fVar382 * fVar484 + fStack_2e0 * fVar97 +
                 fVar101 * fStack_290 + fVar68 * fVar64 + fVar77 * fStack_2c0;
            *(float *)(pauVar311[2] + 0xc) =
                 fVar74 * fVar514 + fVar106 * fStack_3ac + fVar386 * fVar63 + fVar366 +
                 fStack_3cc * fVar492 + fVar383 * fVar485 + fStack_2dc * fVar98 +
                 fVar102 * fStack_28c + fVar502 * fVar65 + fVar78 * fStack_2bc;
            auVar336._0_4_ =
                 fVar99 * fVar60 + fVar347 + fVar75 * local_3b8 + fVar66 * fVar511 +
                 (float)local_2e8 * fVar89 + fVar368 * fVar81 + (float)local_3d8 * fVar367 +
                 (float)local_2c8._0_4_ * fVar93 + (float)local_298 * fVar486 + fVar330 * fVar85;
            auVar336._4_4_ =
                 fVar100 * fVar61 + fVar364 + fVar76 * fStack_3b4 + fVar67 * fVar512 +
                 local_2e8._4_4_ * fVar90 + fVar381 * fVar82 + local_3d8._4_4_ * fVar426 +
                 (float)local_2c8._4_4_ * fVar94 + local_298._4_4_ * fVar487 + fVar343 * fVar86;
            auVar336._8_4_ =
                 fVar101 * fVar62 + fVar365 + fVar77 * fStack_3b0 + fVar68 * fVar513 +
                 fStack_2e0 * fVar91 + fVar382 * fVar83 + fStack_3d0 * fVar427 +
                 fStack_2c0 * fVar95 + fStack_290 * fVar69 + fVar64 * fVar87;
            auVar336._12_4_ =
                 fVar102 * fVar63 + fVar366 + fVar78 * fStack_3ac + fVar502 * fVar514 +
                 fStack_2dc * fVar92 + fVar383 * fVar84 + fStack_3cc * fVar428 +
                 fStack_2bc * fVar96 + fStack_28c * fVar70 + fVar65 * fVar88;
            pauVar311[3] = auVar336;
            pauVar311 = pauVar311 + 4;
            iVar309 = iVar309 + 4;
            lVar306 = lVar306 + 0x80;
          }
          for (; iVar309 + 1 < iVar289; iVar309 = iVar309 + 2) {
            pfVar314 = (float *)((long)piVar317 + lVar306 + 0x20);
            fVar66 = *pfVar314;
            fVar67 = pfVar314[1];
            fVar68 = pfVar314[2];
            fVar502 = pfVar314[3];
            pfVar314 = (float *)((long)piVar321 + lVar306 + 0x20);
            fVar506 = *pfVar314;
            fVar515 = pfVar314[1];
            fVar367 = pfVar314[2];
            fVar426 = pfVar314[3];
            pfVar314 = (float *)((long)piVar317 + lVar306);
            fVar427 = pfVar314[1];
            fVar428 = pfVar314[2];
            fVar500 = pfVar314[3];
            pfVar319 = (float *)((long)pvVar322 + lVar306 + 0x20);
            fVar97 = *pfVar319;
            fVar98 = pfVar319[1];
            fVar99 = pfVar319[2];
            fVar100 = pfVar319[3];
            pfVar325 = (float *)((long)piVar317 + lVar306 + 0x10);
            fVar501 = pfVar325[1];
            fVar505 = pfVar325[2];
            fVar386 = pfVar325[3];
            pfVar319 = (float *)((long)piVar321 + lVar306);
            fVar491 = pfVar319[1];
            fVar492 = pfVar319[2];
            fVar493 = pfVar319[3];
            pfVar301 = (float *)((long)piVar321 + lVar306 + 0x10);
            fVar345 = pfVar301[1];
            fVar484 = pfVar301[2];
            fVar485 = pfVar301[3];
            pfVar323 = (float *)((long)pvVar322 + lVar306);
            fVar486 = pfVar323[1];
            fVar487 = pfVar323[2];
            fVar69 = pfVar323[3];
            pfVar299 = (float *)((long)pvVar322 + lVar306 + 0x10);
            fVar70 = pfVar299[1];
            fVar71 = pfVar299[2];
            fVar72 = pfVar299[3];
            pfVar2 = (float *)((long)piVar317 + lVar306 + 0x30);
            fVar73 = *pfVar2;
            fVar74 = pfVar2[1];
            fVar75 = pfVar2[2];
            fVar76 = pfVar2[3];
            pfVar2 = (float *)((long)piVar317 + lVar306 + 0x40);
            fVar77 = *pfVar2;
            fVar78 = pfVar2[1];
            fVar79 = pfVar2[2];
            fVar80 = pfVar2[3];
            pfVar2 = (float *)((long)piVar321 + lVar306 + 0x30);
            fVar81 = *pfVar2;
            fVar82 = pfVar2[1];
            fVar83 = pfVar2[2];
            fVar84 = pfVar2[3];
            pfVar2 = (float *)((long)piVar321 + lVar306 + 0x40);
            fVar85 = *pfVar2;
            fVar86 = pfVar2[1];
            fVar87 = pfVar2[2];
            fVar88 = pfVar2[3];
            pfVar2 = (float *)((long)pvVar322 + lVar306 + 0x30);
            fVar89 = *pfVar2;
            fVar90 = pfVar2[1];
            fVar91 = pfVar2[2];
            fVar92 = pfVar2[3];
            pfVar2 = (float *)((long)pvVar322 + lVar306 + 0x40);
            fVar93 = *pfVar2;
            fVar94 = pfVar2[1];
            fVar95 = pfVar2[2];
            fVar96 = pfVar2[3];
            *(float *)*pauVar311 =
                 fVar347 + fVar60 * *pfVar314 +
                 (float)local_3d8 * *pfVar325 + fVar66 * (float)local_298 +
                 fVar511 * *pfVar319 + fVar368 * *pfVar301 + fVar506 * fVar330 +
                 auVar276._0_4_ * *pfVar323 + (float)local_2e8 * *pfVar299 +
                 fVar97 * (float)local_2c8._0_4_;
            *(float *)((long)*pauVar311 + 4) =
                 fVar364 + fVar61 * fVar427 + local_3d8._4_4_ * fVar501 + fVar67 * local_298._4_4_ +
                 fVar512 * fVar491 + fVar381 * fVar345 + fVar515 * fVar343 +
                 auVar276._4_4_ * fVar486 + local_2e8._4_4_ * fVar70 +
                 fVar98 * (float)local_2c8._4_4_;
            *(float *)((long)*pauVar311 + 8) =
                 fVar365 + fVar62 * fVar428 + fStack_3d0 * fVar505 + fVar68 * fStack_290 +
                 fVar513 * fVar492 + fVar382 * fVar484 + fVar367 * fVar64 +
                 auVar276._8_4_ * fVar487 + fStack_2e0 * fVar71 + fVar99 * fStack_2c0;
            *(float *)((long)*pauVar311 + 0xc) =
                 fVar366 + fVar63 * fVar500 + fStack_3cc * fVar386 + fVar502 * fStack_28c +
                 fVar514 * fVar493 + fVar383 * fVar485 + fVar426 * fVar65 +
                 fStack_3ac * fVar69 + fStack_2dc * fVar72 + fVar100 * fStack_2bc;
            auVar337._0_4_ =
                 fVar66 * fVar60 + fVar347 + fVar97 * auVar276._0_4_ + fVar506 * fVar511 +
                 (float)local_2e8 * fVar89 + fVar368 * fVar81 + (float)local_3d8 * fVar73 +
                 (float)local_2c8._0_4_ * fVar93 + (float)local_298 * fVar77 + fVar330 * fVar85;
            auVar337._4_4_ =
                 fVar67 * fVar61 + fVar364 + fVar98 * auVar276._4_4_ + fVar515 * fVar512 +
                 local_2e8._4_4_ * fVar90 + fVar381 * fVar82 + local_3d8._4_4_ * fVar74 +
                 (float)local_2c8._4_4_ * fVar94 + local_298._4_4_ * fVar78 + fVar343 * fVar86;
            auVar337._8_4_ =
                 fVar68 * fVar62 + fVar365 + fVar99 * auVar276._8_4_ + fVar367 * fVar513 +
                 fStack_2e0 * fVar91 + fVar382 * fVar83 + fStack_3d0 * fVar75 +
                 fStack_2c0 * fVar95 + fStack_290 * fVar79 + fVar64 * fVar87;
            auVar337._12_4_ =
                 fVar502 * fVar63 + fVar366 + fVar100 * fStack_3ac + fVar426 * fVar514 +
                 fStack_2dc * fVar92 + fVar383 * fVar84 + fStack_3cc * fVar76 +
                 fStack_2bc * fVar96 + fStack_28c * fVar80 + fVar65 * fVar88;
            pauVar311[1] = auVar337;
            pauVar311 = pauVar311 + 2;
            lVar306 = lVar306 + 0x40;
          }
          for (; iVar309 < iVar289; iVar309 = iVar309 + 1) {
            pfVar314 = (float *)((long)piVar317 + lVar306);
            pfVar325 = (float *)((long)piVar317 + lVar306 + 0x10);
            pfVar301 = (float *)((long)piVar317 + lVar306 + 0x20);
            pfVar319 = (float *)((long)piVar321 + lVar306);
            pfVar299 = (float *)((long)piVar321 + lVar306 + 0x10);
            pfVar2 = (float *)((long)piVar321 + lVar306 + 0x20);
            pfVar323 = (float *)((long)pvVar322 + lVar306);
            pfVar3 = (float *)((long)pvVar322 + lVar306 + 0x10);
            pfVar4 = (float *)((long)pvVar322 + lVar306 + 0x20);
            auVar338._0_4_ =
                 fVar347 + fVar60 * *pfVar314 +
                 (float)local_3d8 * *pfVar325 + (float)local_298 * *pfVar301 +
                 fVar330 * *pfVar2 + fVar511 * *pfVar319 + fVar368 * *pfVar299 +
                 local_3b8 * *pfVar323 + (float)local_2e8 * *pfVar3 +
                 (float)local_2c8._0_4_ * *pfVar4;
            auVar338._4_4_ =
                 fVar364 + fVar61 * pfVar314[1] +
                 local_3d8._4_4_ * pfVar325[1] + local_298._4_4_ * pfVar301[1] +
                 fVar343 * pfVar2[1] + fVar512 * pfVar319[1] + fVar381 * pfVar299[1] +
                 fStack_3b4 * pfVar323[1] + local_2e8._4_4_ * pfVar3[1] +
                 (float)local_2c8._4_4_ * pfVar4[1];
            auVar338._8_4_ =
                 fVar365 + fVar62 * pfVar314[2] +
                 fStack_3d0 * pfVar325[2] + fStack_290 * pfVar301[2] +
                 fVar64 * pfVar2[2] + fVar513 * pfVar319[2] + fVar382 * pfVar299[2] +
                 fStack_3b0 * pfVar323[2] + fStack_2e0 * pfVar3[2] + fStack_2c0 * pfVar4[2];
            auVar338._12_4_ =
                 fVar366 + fVar63 * pfVar314[3] +
                 fStack_3cc * pfVar325[3] + fStack_28c * pfVar301[3] +
                 fVar65 * pfVar2[3] + fVar514 * pfVar319[3] + fVar383 * pfVar299[3] +
                 fStack_3ac * pfVar323[3] + fStack_2dc * pfVar3[3] + fStack_2bc * pfVar4[3];
            *pauVar311 = auVar338;
            pauVar311 = pauVar311 + 1;
            lVar306 = lVar306 + 0x20;
          }
          piVar317 = (pointer)((long)piVar317 + lVar306 + lVar308);
          piVar321 = (pointer)((long)piVar321 + lVar306 + lVar308);
          pvVar322 = (void *)((long)pvVar322 + lVar306 + lVar308);
        }
        local_2e8 = piVar324;
      }
      goto LAB_003b5cf8;
    }
    bVar288 = bVar288 >> 2 & bVar288 >> 3 & (auVar52._4_4_ == 5 && auVar52._0_4_ == 5);
    if (((iVar289 == 1 && iVar293 == 1) & bVar288) == 1) {
      uVar303 = top_blob->w;
      iVar289 = top_blob->h;
      local_2c8 = (undefined1  [8])(this->super_ConvolutionDepthWise).bias_data.data;
      uVar295 = uVar303;
      if ((int)uVar303 < 1) {
        uVar295 = 0;
      }
      uVar294 = local_368.c;
      if (local_368.c < 1) {
        uVar294 = 0;
      }
      local_308 = (pointer)(ulong)uVar294;
      lVar308 = (long)(int)(uVar303 * 4) * 4;
      lVar306 = (long)(local_368.w * 4 + 0x10) * 4;
      piVar321 = (pointer)0x0;
      while (piVar324 = piVar321, local_268 = CONCAT44(local_268._4_4_,(float)local_268),
            local_318 = CONCAT44(local_318._4_4_,(float)local_318),
            local_298 = CONCAT44(local_298._4_4_,(float)local_298), piVar324 != local_308) {
        if (local_2c8 == (undefined1  [8])0x0) {
          fVar347 = 0.0;
          fVar364 = 0.0;
          fVar365 = 0.0;
          fVar366 = 0.0;
        }
        else {
          pfVar314 = (float *)((long)local_2c8 + (long)piVar324 * 0x10);
          fVar347 = *pfVar314;
          fVar364 = pfVar314[1];
          fVar365 = pfVar314[2];
          fVar366 = pfVar314[3];
        }
        pvVar316 = (void *)(top_blob->cstep * (long)piVar324 * top_blob->elemsize +
                           (long)top_blob->data);
        pvVar322 = (this->weight_data_tm).data;
        lVar302 = (long)(this->weight_data_tm).w * (long)piVar324 * (this->weight_data_tm).elemsize;
        pvVar307 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar316);
        piVar328 = (pointer)(local_368.cstep * (long)piVar324 *
                             CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) +
                            (long)local_368.data);
        lVar318 = (long)local_368.w *
                  CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
        piVar321 = (pointer)((long)piVar328 + lVar318);
        pvVar315 = (void *)((long)piVar328 + lVar318 * 2);
        pvVar298 = (void *)(lVar318 * 3 + (long)piVar328);
        piVar317 = piVar328 + lVar318;
        pvVar291 = (void *)(lVar318 * 5 + (long)piVar328);
        for (uVar303 = 0; (int)(uVar303 | 1) < iVar289; uVar303 = uVar303 + 2) {
          lVar318 = 0;
          uVar294 = uVar295;
          while (bVar329 = uVar294 != 0, uVar294 = uVar294 - 1, bVar329) {
            pfVar314 = (float *)((long)pvVar322 + lVar302);
            pfVar301 = (float *)((long)pvVar322 + lVar302 + 0x10);
            pfVar299 = (float *)((long)pvVar322 + lVar302 + 0x20);
            pfVar2 = (float *)((long)pvVar322 + lVar302 + 0x30);
            pfVar319 = (float *)((long)piVar328 + lVar318);
            pfVar3 = (float *)((long)pvVar322 + lVar302 + 0x40);
            pfVar4 = (float *)((long)piVar328 + lVar318 + 0x10);
            pfVar5 = (float *)((long)piVar328 + lVar318 + 0x20);
            pfVar9 = (float *)((long)piVar328 + lVar318 + 0x30);
            pfVar10 = (float *)((long)piVar328 + lVar318 + 0x40);
            pfVar323 = (float *)((long)piVar321 + lVar318);
            pfVar11 = (float *)((long)piVar321 + lVar318 + 0x10);
            pfVar12 = (float *)((long)piVar321 + lVar318 + 0x20);
            pfVar13 = (float *)((long)piVar321 + lVar318 + 0x30);
            pfVar14 = (float *)((long)piVar321 + lVar318 + 0x40);
            pfVar15 = (float *)((long)pvVar322 + lVar302 + 0x50);
            pfVar16 = (float *)((long)pvVar322 + lVar302 + 0x60);
            pfVar17 = (float *)((long)pvVar322 + lVar302 + 0x70);
            pfVar31 = (float *)((long)pvVar322 + lVar302 + 0x80);
            pfVar32 = (float *)((long)pvVar322 + lVar302 + 0x90);
            pfVar29 = (float *)((long)pvVar315 + lVar318);
            pfVar18 = (float *)((long)pvVar315 + lVar318 + 0x10);
            pfVar19 = (float *)((long)pvVar315 + lVar318 + 0x20);
            pfVar20 = (float *)((long)pvVar315 + lVar318 + 0x30);
            pfVar21 = (float *)((long)pvVar315 + lVar318 + 0x40);
            pfVar33 = (float *)((long)pvVar322 + lVar302 + 0xa0);
            pfVar34 = (float *)((long)pvVar322 + lVar302 + 0xb0);
            pfVar35 = (float *)((long)pvVar322 + lVar302 + 0xc0);
            pfVar36 = (float *)((long)pvVar322 + lVar302 + 0xd0);
            pfVar37 = (float *)((long)pvVar322 + lVar302 + 0xe0);
            pfVar30 = (float *)((long)pvVar298 + lVar318);
            pfVar22 = (float *)((long)pvVar298 + lVar318 + 0x10);
            pfVar23 = (float *)((long)pvVar298 + lVar318 + 0x20);
            pfVar24 = (float *)((long)pvVar298 + lVar318 + 0x30);
            pfVar25 = (float *)((long)pvVar298 + lVar318 + 0x40);
            pfVar38 = (float *)((long)pvVar322 + lVar302 + 0xf0);
            pfVar39 = (float *)((long)pvVar322 + lVar302 + 0x100);
            pfVar40 = (float *)((long)pvVar322 + lVar302 + 0x110);
            pfVar41 = (float *)((long)pvVar322 + lVar302 + 0x120);
            pfVar42 = (float *)((long)pvVar322 + lVar302 + 0x130);
            pfVar325 = (float *)((long)piVar317 + lVar318);
            pfVar26 = (float *)((long)piVar317 + lVar318 + 0x10);
            auVar443 = *(undefined1 (*) [16])((long)piVar317 + lVar318 + 0x20);
            pfVar27 = (float *)((long)piVar317 + lVar318 + 0x30);
            pfVar28 = (float *)((long)piVar317 + lVar318 + 0x40);
            pfVar43 = (float *)((long)pvVar322 + lVar302 + 0x140);
            pfVar44 = (float *)((long)pvVar322 + lVar302 + 0x150);
            pfVar45 = (float *)((long)pvVar322 + lVar302 + 0x160);
            pfVar46 = (float *)((long)pvVar322 + lVar302 + 0x170);
            pfVar47 = (float *)((long)pvVar322 + lVar302 + 0x180);
            auVar353._0_4_ =
                 *pfVar314 * *pfVar319 + fVar347 + *pfVar299 * *pfVar5 + *pfVar301 * *pfVar4 +
                 *pfVar323 * *pfVar15 + *pfVar3 * *pfVar10 + *pfVar2 * *pfVar9 +
                 *pfVar32 * *pfVar14 +
                 *pfVar31 * *pfVar13 + *pfVar12 * *pfVar17 + *pfVar11 * *pfVar16 +
                 *pfVar33 * *pfVar29 + *pfVar18 * *pfVar34 + *pfVar19 * *pfVar35 +
                 *pfVar36 * *pfVar20 + *pfVar37 * *pfVar21 +
                 *pfVar38 * *pfVar30 + *pfVar39 * *pfVar22 + *pfVar23 * *pfVar40 +
                 *pfVar41 * *pfVar24 + *pfVar42 * *pfVar25 + *pfVar43 * *pfVar325 +
                 *pfVar26 * *pfVar44 + *pfVar45 * auVar443._0_4_ + *pfVar46 * *pfVar27 +
                 *pfVar47 * *pfVar28;
            auVar353._4_4_ =
                 pfVar314[1] * pfVar319[1] + fVar364 +
                 pfVar299[1] * pfVar5[1] + pfVar301[1] * pfVar4[1] +
                 pfVar323[1] * pfVar15[1] + pfVar3[1] * pfVar10[1] + pfVar2[1] * pfVar9[1] +
                 pfVar32[1] * pfVar14[1] +
                 pfVar31[1] * pfVar13[1] + pfVar12[1] * pfVar17[1] + pfVar11[1] * pfVar16[1] +
                 pfVar33[1] * pfVar29[1] + pfVar18[1] * pfVar34[1] + pfVar19[1] * pfVar35[1] +
                 pfVar36[1] * pfVar20[1] + pfVar37[1] * pfVar21[1] +
                 pfVar38[1] * pfVar30[1] + pfVar39[1] * pfVar22[1] + pfVar23[1] * pfVar40[1] +
                 pfVar41[1] * pfVar24[1] + pfVar42[1] * pfVar25[1] + pfVar43[1] * pfVar325[1] +
                 pfVar26[1] * pfVar44[1] + pfVar45[1] * auVar443._4_4_ + pfVar46[1] * pfVar27[1] +
                 pfVar47[1] * pfVar28[1];
            auVar353._8_4_ =
                 pfVar314[2] * pfVar319[2] + fVar365 +
                 pfVar299[2] * pfVar5[2] + pfVar301[2] * pfVar4[2] +
                 pfVar323[2] * pfVar15[2] + pfVar3[2] * pfVar10[2] + pfVar2[2] * pfVar9[2] +
                 pfVar32[2] * pfVar14[2] +
                 pfVar31[2] * pfVar13[2] + pfVar12[2] * pfVar17[2] + pfVar11[2] * pfVar16[2] +
                 pfVar33[2] * pfVar29[2] + pfVar18[2] * pfVar34[2] + pfVar19[2] * pfVar35[2] +
                 pfVar36[2] * pfVar20[2] + pfVar37[2] * pfVar21[2] +
                 pfVar38[2] * pfVar30[2] + pfVar39[2] * pfVar22[2] + pfVar23[2] * pfVar40[2] +
                 pfVar41[2] * pfVar24[2] + pfVar42[2] * pfVar25[2] + pfVar43[2] * pfVar325[2] +
                 pfVar26[2] * pfVar44[2] + pfVar45[2] * auVar443._8_4_ + pfVar46[2] * pfVar27[2] +
                 pfVar47[2] * pfVar28[2];
            auVar353._12_4_ =
                 pfVar314[3] * pfVar319[3] + fVar366 +
                 pfVar299[3] * pfVar5[3] + pfVar301[3] * pfVar4[3] +
                 pfVar323[3] * pfVar15[3] + pfVar3[3] * pfVar10[3] + pfVar2[3] * pfVar9[3] +
                 pfVar32[3] * pfVar14[3] +
                 pfVar31[3] * pfVar13[3] + pfVar12[3] * pfVar17[3] + pfVar11[3] * pfVar16[3] +
                 pfVar33[3] * pfVar29[3] + pfVar18[3] * pfVar34[3] + pfVar19[3] * pfVar35[3] +
                 pfVar36[3] * pfVar20[3] + pfVar37[3] * pfVar21[3] +
                 pfVar38[3] * pfVar30[3] + pfVar39[3] * pfVar22[3] + pfVar23[3] * pfVar40[3] +
                 pfVar41[3] * pfVar24[3] + pfVar42[3] * pfVar25[3] + pfVar43[3] * pfVar325[3] +
                 pfVar26[3] * pfVar44[3] + pfVar45[3] * auVar443._12_4_ + pfVar46[3] * pfVar27[3] +
                 pfVar47[3] * pfVar28[3];
            pfVar319 = (float *)((long)pvVar291 + lVar318);
            pfVar4 = (float *)((long)pvVar291 + lVar318 + 0x10);
            pfVar5 = (float *)((long)pvVar291 + lVar318 + 0x20);
            pfVar9 = (float *)((long)pvVar291 + lVar318 + 0x30);
            pfVar10 = (float *)((long)pvVar291 + lVar318 + 0x40);
            auVar370._0_4_ =
                 *pfVar323 * *pfVar314 + fVar347 + *pfVar11 * *pfVar301 + *pfVar12 * *pfVar299 +
                 *pfVar13 * *pfVar2 + *pfVar14 * *pfVar3 + *pfVar29 * *pfVar15 +
                 *pfVar18 * *pfVar16 + *pfVar19 * *pfVar17 + *pfVar20 * *pfVar31 +
                 *pfVar21 * *pfVar32 +
                 *pfVar30 * *pfVar33 + *pfVar22 * *pfVar34 + *pfVar23 * *pfVar35 +
                 *pfVar24 * *pfVar36 + *pfVar25 * *pfVar37 +
                 *pfVar325 * *pfVar38 + *pfVar26 * *pfVar39 + auVar443._0_4_ * *pfVar40 +
                 *pfVar27 * *pfVar41 + *pfVar28 * *pfVar42 + *pfVar43 * *pfVar319 +
                 *pfVar44 * *pfVar4 + *pfVar45 * *pfVar5 + *pfVar46 * *pfVar9 + *pfVar47 * *pfVar10;
            auVar370._4_4_ =
                 pfVar323[1] * pfVar314[1] + fVar364 +
                 pfVar11[1] * pfVar301[1] + pfVar12[1] * pfVar299[1] +
                 pfVar13[1] * pfVar2[1] + pfVar14[1] * pfVar3[1] + pfVar29[1] * pfVar15[1] +
                 pfVar18[1] * pfVar16[1] + pfVar19[1] * pfVar17[1] + pfVar20[1] * pfVar31[1] +
                 pfVar21[1] * pfVar32[1] +
                 pfVar30[1] * pfVar33[1] + pfVar22[1] * pfVar34[1] + pfVar23[1] * pfVar35[1] +
                 pfVar24[1] * pfVar36[1] + pfVar25[1] * pfVar37[1] +
                 pfVar325[1] * pfVar38[1] + pfVar26[1] * pfVar39[1] + auVar443._4_4_ * pfVar40[1] +
                 pfVar27[1] * pfVar41[1] + pfVar28[1] * pfVar42[1] + pfVar43[1] * pfVar319[1] +
                 pfVar44[1] * pfVar4[1] + pfVar45[1] * pfVar5[1] + pfVar46[1] * pfVar9[1] +
                 pfVar47[1] * pfVar10[1];
            auVar370._8_4_ =
                 pfVar323[2] * pfVar314[2] + fVar365 +
                 pfVar11[2] * pfVar301[2] + pfVar12[2] * pfVar299[2] +
                 pfVar13[2] * pfVar2[2] + pfVar14[2] * pfVar3[2] + pfVar29[2] * pfVar15[2] +
                 pfVar18[2] * pfVar16[2] + pfVar19[2] * pfVar17[2] + pfVar20[2] * pfVar31[2] +
                 pfVar21[2] * pfVar32[2] +
                 pfVar30[2] * pfVar33[2] + pfVar22[2] * pfVar34[2] + pfVar23[2] * pfVar35[2] +
                 pfVar24[2] * pfVar36[2] + pfVar25[2] * pfVar37[2] +
                 pfVar325[2] * pfVar38[2] + pfVar26[2] * pfVar39[2] + auVar443._8_4_ * pfVar40[2] +
                 pfVar27[2] * pfVar41[2] + pfVar28[2] * pfVar42[2] + pfVar43[2] * pfVar319[2] +
                 pfVar44[2] * pfVar4[2] + pfVar45[2] * pfVar5[2] + pfVar46[2] * pfVar9[2] +
                 pfVar47[2] * pfVar10[2];
            auVar370._12_4_ =
                 pfVar323[3] * pfVar314[3] + fVar366 +
                 pfVar11[3] * pfVar301[3] + pfVar12[3] * pfVar299[3] +
                 pfVar13[3] * pfVar2[3] + pfVar14[3] * pfVar3[3] + pfVar29[3] * pfVar15[3] +
                 pfVar18[3] * pfVar16[3] + pfVar19[3] * pfVar17[3] + pfVar20[3] * pfVar31[3] +
                 pfVar21[3] * pfVar32[3] +
                 pfVar30[3] * pfVar33[3] + pfVar22[3] * pfVar34[3] + pfVar23[3] * pfVar35[3] +
                 pfVar24[3] * pfVar36[3] + pfVar25[3] * pfVar37[3] +
                 pfVar325[3] * pfVar38[3] + pfVar26[3] * pfVar39[3] + auVar443._12_4_ * pfVar40[3] +
                 pfVar27[3] * pfVar41[3] + pfVar28[3] * pfVar42[3] + pfVar43[3] * pfVar319[3] +
                 pfVar44[3] * pfVar4[3] + pfVar45[3] * pfVar5[3] + pfVar46[3] * pfVar9[3] +
                 pfVar47[3] * pfVar10[3];
            *(undefined1 (*) [16])((long)pvVar316 + lVar318) = auVar353;
            *(undefined1 (*) [16])((long)pvVar307 + lVar318) = auVar370;
            lVar318 = lVar318 + 0x10;
          }
          piVar328 = (pointer)((long)piVar328 + lVar318 + lVar306);
          piVar321 = (pointer)((long)piVar321 + lVar318 + lVar306);
          pvVar315 = (void *)((long)pvVar315 + lVar318 + lVar306);
          pvVar298 = (void *)((long)pvVar298 + lVar318 + lVar306);
          piVar317 = (pointer)((long)piVar317 + lVar318 + lVar306);
          pvVar291 = (void *)((long)pvVar291 + lVar318 + lVar306);
          pvVar316 = (void *)((long)pvVar316 + lVar318 + lVar308);
          pvVar307 = (void *)((long)pvVar307 + lVar318 + lVar308);
        }
        for (; (int)uVar303 < iVar289; uVar303 = uVar303 + 1) {
          lVar318 = 0;
          uVar294 = uVar295;
          while (bVar329 = uVar294 != 0, uVar294 = uVar294 - 1, bVar329) {
            pfVar314 = (float *)((long)pvVar322 + lVar302);
            pfVar301 = (float *)((long)pvVar322 + lVar302 + 0x10);
            pfVar299 = (float *)((long)pvVar322 + lVar302 + 0x20);
            pfVar2 = (float *)((long)pvVar322 + lVar302 + 0x30);
            pfVar319 = (float *)((long)piVar328 + lVar318);
            pfVar3 = (float *)((long)pvVar322 + lVar302 + 0x40);
            pfVar4 = (float *)((long)piVar328 + lVar318 + 0x10);
            pfVar5 = (float *)((long)piVar328 + lVar318 + 0x20);
            pfVar9 = (float *)((long)piVar328 + lVar318 + 0x30);
            pfVar10 = (float *)((long)piVar328 + lVar318 + 0x40);
            pfVar11 = (float *)((long)pvVar322 + lVar302 + 0x50);
            pfVar12 = (float *)((long)pvVar322 + lVar302 + 0x60);
            pfVar13 = (float *)((long)pvVar322 + lVar302 + 0x70);
            pfVar32 = (float *)((long)pvVar322 + lVar302 + 0x80);
            pfVar33 = (float *)((long)pvVar322 + lVar302 + 0x90);
            pfVar323 = (float *)((long)piVar321 + lVar318);
            pfVar14 = (float *)((long)piVar321 + lVar318 + 0x10);
            pfVar15 = (float *)((long)piVar321 + lVar318 + 0x20);
            pfVar16 = (float *)((long)piVar321 + lVar318 + 0x30);
            pfVar17 = (float *)((long)piVar321 + lVar318 + 0x40);
            pfVar34 = (float *)((long)pvVar322 + lVar302 + 0xa0);
            pfVar35 = (float *)((long)pvVar322 + lVar302 + 0xb0);
            pfVar36 = (float *)((long)pvVar322 + lVar302 + 0xc0);
            pfVar37 = (float *)((long)pvVar322 + lVar302 + 0xd0);
            pfVar30 = (float *)((long)pvVar315 + lVar318);
            pfVar38 = (float *)((long)pvVar322 + lVar302 + 0xe0);
            pfVar18 = (float *)((long)pvVar315 + lVar318 + 0x10);
            pfVar19 = (float *)((long)pvVar315 + lVar318 + 0x20);
            pfVar20 = (float *)((long)pvVar315 + lVar318 + 0x30);
            pfVar21 = (float *)((long)pvVar315 + lVar318 + 0x40);
            pfVar39 = (float *)((long)pvVar322 + lVar302 + 0xf0);
            pfVar40 = (float *)((long)pvVar322 + lVar302 + 0x100);
            pfVar41 = (float *)((long)pvVar322 + lVar302 + 0x110);
            pfVar42 = (float *)((long)pvVar322 + lVar302 + 0x120);
            pfVar31 = (float *)((long)pvVar298 + lVar318);
            pfVar43 = (float *)((long)pvVar322 + lVar302 + 0x130);
            pfVar22 = (float *)((long)pvVar298 + lVar318 + 0x10);
            pfVar23 = (float *)((long)pvVar298 + lVar318 + 0x20);
            pfVar24 = (float *)((long)pvVar298 + lVar318 + 0x30);
            pfVar25 = (float *)((long)pvVar298 + lVar318 + 0x40);
            pfVar44 = (float *)((long)pvVar322 + lVar302 + 0x140);
            pfVar45 = (float *)((long)pvVar322 + lVar302 + 0x150);
            pfVar46 = (float *)((long)pvVar322 + lVar302 + 0x160);
            pfVar47 = (float *)((long)pvVar322 + lVar302 + 0x170);
            auVar443 = *(undefined1 (*) [16])((long)pvVar322 + lVar302 + 0x180);
            pfVar325 = (float *)((long)piVar317 + lVar318);
            pfVar26 = (float *)((long)piVar317 + lVar318 + 0x10);
            pfVar27 = (float *)((long)piVar317 + lVar318 + 0x20);
            pfVar28 = (float *)((long)piVar317 + lVar318 + 0x30);
            pfVar29 = (float *)((long)piVar317 + lVar318 + 0x40);
            auVar354._0_4_ =
                 *pfVar314 * *pfVar319 + fVar347 + *pfVar301 * *pfVar4 + *pfVar299 * *pfVar5 +
                 *pfVar2 * *pfVar9 + *pfVar3 * *pfVar10 + *pfVar11 * *pfVar323 +
                 *pfVar12 * *pfVar14 + *pfVar13 * *pfVar15 + *pfVar32 * *pfVar16 +
                 *pfVar33 * *pfVar17 +
                 *pfVar34 * *pfVar30 + *pfVar35 * *pfVar18 + *pfVar36 * *pfVar19 +
                 *pfVar37 * *pfVar20 + *pfVar38 * *pfVar21 +
                 *pfVar39 * *pfVar31 + *pfVar40 * *pfVar22 + *pfVar41 * *pfVar23 +
                 *pfVar42 * *pfVar24 + *pfVar43 * *pfVar25 + *pfVar44 * *pfVar325 +
                 *pfVar45 * *pfVar26 + *pfVar46 * *pfVar27 + *pfVar47 * *pfVar28 +
                 auVar443._0_4_ * *pfVar29;
            auVar354._4_4_ =
                 pfVar314[1] * pfVar319[1] + fVar364 +
                 pfVar301[1] * pfVar4[1] + pfVar299[1] * pfVar5[1] +
                 pfVar2[1] * pfVar9[1] + pfVar3[1] * pfVar10[1] + pfVar11[1] * pfVar323[1] +
                 pfVar12[1] * pfVar14[1] + pfVar13[1] * pfVar15[1] + pfVar32[1] * pfVar16[1] +
                 pfVar33[1] * pfVar17[1] +
                 pfVar34[1] * pfVar30[1] + pfVar35[1] * pfVar18[1] + pfVar36[1] * pfVar19[1] +
                 pfVar37[1] * pfVar20[1] + pfVar38[1] * pfVar21[1] +
                 pfVar39[1] * pfVar31[1] + pfVar40[1] * pfVar22[1] + pfVar41[1] * pfVar23[1] +
                 pfVar42[1] * pfVar24[1] + pfVar43[1] * pfVar25[1] + pfVar44[1] * pfVar325[1] +
                 pfVar45[1] * pfVar26[1] + pfVar46[1] * pfVar27[1] + pfVar47[1] * pfVar28[1] +
                 auVar443._4_4_ * pfVar29[1];
            auVar354._8_4_ =
                 pfVar314[2] * pfVar319[2] + fVar365 +
                 pfVar301[2] * pfVar4[2] + pfVar299[2] * pfVar5[2] +
                 pfVar2[2] * pfVar9[2] + pfVar3[2] * pfVar10[2] + pfVar11[2] * pfVar323[2] +
                 pfVar12[2] * pfVar14[2] + pfVar13[2] * pfVar15[2] + pfVar32[2] * pfVar16[2] +
                 pfVar33[2] * pfVar17[2] +
                 pfVar34[2] * pfVar30[2] + pfVar35[2] * pfVar18[2] + pfVar36[2] * pfVar19[2] +
                 pfVar37[2] * pfVar20[2] + pfVar38[2] * pfVar21[2] +
                 pfVar39[2] * pfVar31[2] + pfVar40[2] * pfVar22[2] + pfVar41[2] * pfVar23[2] +
                 pfVar42[2] * pfVar24[2] + pfVar43[2] * pfVar25[2] + pfVar44[2] * pfVar325[2] +
                 pfVar45[2] * pfVar26[2] + pfVar46[2] * pfVar27[2] + pfVar47[2] * pfVar28[2] +
                 auVar443._8_4_ * pfVar29[2];
            auVar354._12_4_ =
                 pfVar314[3] * pfVar319[3] + fVar366 +
                 pfVar301[3] * pfVar4[3] + pfVar299[3] * pfVar5[3] +
                 pfVar2[3] * pfVar9[3] + pfVar3[3] * pfVar10[3] + pfVar11[3] * pfVar323[3] +
                 pfVar12[3] * pfVar14[3] + pfVar13[3] * pfVar15[3] + pfVar32[3] * pfVar16[3] +
                 pfVar33[3] * pfVar17[3] +
                 pfVar34[3] * pfVar30[3] + pfVar35[3] * pfVar18[3] + pfVar36[3] * pfVar19[3] +
                 pfVar37[3] * pfVar20[3] + pfVar38[3] * pfVar21[3] +
                 pfVar39[3] * pfVar31[3] + pfVar40[3] * pfVar22[3] + pfVar41[3] * pfVar23[3] +
                 pfVar42[3] * pfVar24[3] + pfVar43[3] * pfVar25[3] + pfVar44[3] * pfVar325[3] +
                 pfVar45[3] * pfVar26[3] + pfVar46[3] * pfVar27[3] + pfVar47[3] * pfVar28[3] +
                 auVar443._12_4_ * pfVar29[3];
            *(undefined1 (*) [16])((long)pvVar316 + lVar318) = auVar354;
            lVar318 = lVar318 + 0x10;
          }
          piVar328 = (pointer)((long)piVar328 + lVar318 + 0x40);
          piVar321 = (pointer)((long)piVar321 + lVar318 + 0x40);
          pvVar315 = (void *)((long)pvVar315 + lVar318 + 0x40);
          pvVar298 = (void *)((long)pvVar298 + lVar318 + 0x40);
          piVar317 = (pointer)((long)piVar317 + lVar318 + 0x40);
          pvVar316 = (void *)((long)pvVar316 + lVar318);
        }
        local_2e8 = piVar324;
        piVar321 = (pointer)((long)piVar324 + 1);
      }
      goto LAB_003b5cf8;
    }
    if ((bVar288 & (iVar289 == 2 && iVar293 == 2)) == 1) {
      uVar303 = top_blob->w;
      pvVar315 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar310 = 0;
      uVar327 = (ulong)uVar303;
      if ((int)uVar303 < 1) {
        uVar327 = uVar310;
      }
      uVar296 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar296 = uVar310;
      }
      uVar300 = (ulong)(uint)local_368.c;
      if (local_368.c < 1) {
        uVar300 = uVar310;
      }
      lVar308 = (long)(int)((local_368.w - uVar303) * 8) * 4;
      for (; local_268 = CONCAT44(local_268._4_4_,(float)local_268),
          local_318 = CONCAT44(local_318._4_4_,(float)local_318), uVar310 != uVar300;
          uVar310 = uVar310 + 1) {
        if (pvVar315 == (void *)0x0) {
          fVar347 = 0.0;
          fVar364 = 0.0;
          fVar365 = 0.0;
          fVar366 = 0.0;
        }
        else {
          pfVar314 = (float *)((long)pvVar315 + uVar310 * 0x10);
          fVar347 = *pfVar314;
          fVar364 = pfVar314[1];
          fVar365 = pfVar314[2];
          fVar366 = pfVar314[3];
        }
        pauVar313 = (undefined1 (*) [16])
                    (top_blob->cstep * uVar310 * top_blob->elemsize + (long)top_blob->data);
        pvVar291 = (this->weight_data_tm).data;
        lVar318 = (long)(this->weight_data_tm).w * uVar310 * (this->weight_data_tm).elemsize;
        piVar317 = (pointer)(local_368.cstep * uVar310 *
                             CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) +
                            (long)local_368.data);
        lVar306 = (long)local_368.w *
                  CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
        piVar321 = (pointer)((long)piVar317 + lVar306);
        pvVar322 = (void *)((long)piVar317 + lVar306 * 2);
        pvVar298 = (void *)(lVar306 * 3 + (long)piVar317);
        piVar324 = piVar317 + lVar306;
        for (iVar289 = 0; iVar289 != (int)uVar296; iVar289 = iVar289 + 1) {
          lVar306 = 0;
          uVar292 = uVar327;
          while (iVar304 = (int)uVar292, uVar292 = (ulong)(iVar304 - 1), iVar304 != 0) {
            pfVar314 = (float *)((long)pvVar291 + lVar318);
            pfVar301 = (float *)((long)pvVar291 + lVar318 + 0x10);
            pfVar299 = (float *)((long)pvVar291 + lVar318 + 0x20);
            pfVar2 = (float *)((long)pvVar291 + lVar318 + 0x30);
            pfVar3 = (float *)((long)pvVar291 + lVar318 + 0x40);
            pfVar319 = (float *)((long)piVar317 + lVar306);
            pfVar4 = (float *)((long)piVar317 + lVar306 + 0x10);
            pfVar5 = (float *)((long)piVar317 + lVar306 + 0x20);
            pfVar9 = (float *)((long)piVar317 + lVar306 + 0x30);
            pfVar10 = (float *)((long)piVar317 + lVar306 + 0x40);
            pfVar11 = (float *)((long)pvVar291 + lVar318 + 0x50);
            pfVar12 = (float *)((long)pvVar291 + lVar318 + 0x60);
            pfVar13 = (float *)((long)pvVar291 + lVar318 + 0x70);
            pfVar32 = (float *)((long)pvVar291 + lVar318 + 0x80);
            pfVar33 = (float *)((long)pvVar291 + lVar318 + 0x90);
            pfVar323 = (float *)((long)piVar321 + lVar306);
            pfVar14 = (float *)((long)piVar321 + lVar306 + 0x10);
            pfVar15 = (float *)((long)piVar321 + lVar306 + 0x20);
            pfVar16 = (float *)((long)piVar321 + lVar306 + 0x30);
            pfVar17 = (float *)((long)piVar321 + lVar306 + 0x40);
            pfVar34 = (float *)((long)pvVar291 + lVar318 + 0xa0);
            pfVar35 = (float *)((long)pvVar291 + lVar318 + 0xb0);
            pfVar36 = (float *)((long)pvVar291 + lVar318 + 0xc0);
            pfVar37 = (float *)((long)pvVar291 + lVar318 + 0xd0);
            pfVar38 = (float *)((long)pvVar291 + lVar318 + 0xe0);
            pfVar325 = (float *)((long)pvVar322 + lVar306);
            pfVar18 = (float *)((long)pvVar322 + lVar306 + 0x10);
            pfVar19 = (float *)((long)pvVar322 + lVar306 + 0x20);
            pfVar20 = (float *)((long)pvVar322 + lVar306 + 0x30);
            pfVar21 = (float *)((long)pvVar322 + lVar306 + 0x40);
            pfVar39 = (float *)((long)pvVar291 + lVar318 + 0xf0);
            pfVar40 = (float *)((long)pvVar291 + lVar318 + 0x100);
            pfVar41 = (float *)((long)pvVar291 + lVar318 + 0x110);
            pfVar42 = (float *)((long)pvVar291 + lVar318 + 0x120);
            pfVar43 = (float *)((long)pvVar291 + lVar318 + 0x130);
            pfVar30 = (float *)((long)pvVar298 + lVar306);
            pfVar22 = (float *)((long)pvVar298 + lVar306 + 0x10);
            pfVar23 = (float *)((long)pvVar298 + lVar306 + 0x20);
            pfVar24 = (float *)((long)pvVar298 + lVar306 + 0x30);
            pfVar25 = (float *)((long)pvVar298 + lVar306 + 0x40);
            pfVar44 = (float *)((long)pvVar291 + lVar318 + 0x140);
            pfVar45 = (float *)((long)pvVar291 + lVar318 + 0x150);
            pfVar46 = (float *)((long)pvVar291 + lVar318 + 0x160);
            pfVar47 = (float *)((long)pvVar291 + lVar318 + 0x170);
            auVar443 = *(undefined1 (*) [16])((long)pvVar291 + lVar318 + 0x180);
            pfVar31 = (float *)((long)piVar324 + lVar306);
            pfVar26 = (float *)((long)piVar324 + lVar306 + 0x10);
            pfVar27 = (float *)((long)piVar324 + lVar306 + 0x20);
            pfVar28 = (float *)((long)piVar324 + lVar306 + 0x30);
            pfVar29 = (float *)((long)piVar324 + lVar306 + 0x40);
            auVar355._0_4_ =
                 *pfVar314 * *pfVar319 + fVar347 + *pfVar301 * *pfVar4 + *pfVar299 * *pfVar5 +
                 *pfVar2 * *pfVar9 + *pfVar3 * *pfVar10 + *pfVar11 * *pfVar323 +
                 *pfVar12 * *pfVar14 + *pfVar13 * *pfVar15 + *pfVar32 * *pfVar16 +
                 *pfVar33 * *pfVar17 +
                 *pfVar34 * *pfVar325 + *pfVar35 * *pfVar18 + *pfVar36 * *pfVar19 +
                 *pfVar37 * *pfVar20 + *pfVar38 * *pfVar21 +
                 *pfVar39 * *pfVar30 + *pfVar40 * *pfVar22 + *pfVar41 * *pfVar23 +
                 *pfVar42 * *pfVar24 + *pfVar43 * *pfVar25 + *pfVar44 * *pfVar31 +
                 *pfVar45 * *pfVar26 + *pfVar46 * *pfVar27 + *pfVar47 * *pfVar28 +
                 auVar443._0_4_ * *pfVar29;
            auVar355._4_4_ =
                 pfVar314[1] * pfVar319[1] + fVar364 +
                 pfVar301[1] * pfVar4[1] + pfVar299[1] * pfVar5[1] +
                 pfVar2[1] * pfVar9[1] + pfVar3[1] * pfVar10[1] + pfVar11[1] * pfVar323[1] +
                 pfVar12[1] * pfVar14[1] + pfVar13[1] * pfVar15[1] + pfVar32[1] * pfVar16[1] +
                 pfVar33[1] * pfVar17[1] +
                 pfVar34[1] * pfVar325[1] + pfVar35[1] * pfVar18[1] + pfVar36[1] * pfVar19[1] +
                 pfVar37[1] * pfVar20[1] + pfVar38[1] * pfVar21[1] +
                 pfVar39[1] * pfVar30[1] + pfVar40[1] * pfVar22[1] + pfVar41[1] * pfVar23[1] +
                 pfVar42[1] * pfVar24[1] + pfVar43[1] * pfVar25[1] + pfVar44[1] * pfVar31[1] +
                 pfVar45[1] * pfVar26[1] + pfVar46[1] * pfVar27[1] + pfVar47[1] * pfVar28[1] +
                 auVar443._4_4_ * pfVar29[1];
            auVar355._8_4_ =
                 pfVar314[2] * pfVar319[2] + fVar365 +
                 pfVar301[2] * pfVar4[2] + pfVar299[2] * pfVar5[2] +
                 pfVar2[2] * pfVar9[2] + pfVar3[2] * pfVar10[2] + pfVar11[2] * pfVar323[2] +
                 pfVar12[2] * pfVar14[2] + pfVar13[2] * pfVar15[2] + pfVar32[2] * pfVar16[2] +
                 pfVar33[2] * pfVar17[2] +
                 pfVar34[2] * pfVar325[2] + pfVar35[2] * pfVar18[2] + pfVar36[2] * pfVar19[2] +
                 pfVar37[2] * pfVar20[2] + pfVar38[2] * pfVar21[2] +
                 pfVar39[2] * pfVar30[2] + pfVar40[2] * pfVar22[2] + pfVar41[2] * pfVar23[2] +
                 pfVar42[2] * pfVar24[2] + pfVar43[2] * pfVar25[2] + pfVar44[2] * pfVar31[2] +
                 pfVar45[2] * pfVar26[2] + pfVar46[2] * pfVar27[2] + pfVar47[2] * pfVar28[2] +
                 auVar443._8_4_ * pfVar29[2];
            auVar355._12_4_ =
                 pfVar314[3] * pfVar319[3] + fVar366 +
                 pfVar301[3] * pfVar4[3] + pfVar299[3] * pfVar5[3] +
                 pfVar2[3] * pfVar9[3] + pfVar3[3] * pfVar10[3] + pfVar11[3] * pfVar323[3] +
                 pfVar12[3] * pfVar14[3] + pfVar13[3] * pfVar15[3] + pfVar32[3] * pfVar16[3] +
                 pfVar33[3] * pfVar17[3] +
                 pfVar34[3] * pfVar325[3] + pfVar35[3] * pfVar18[3] + pfVar36[3] * pfVar19[3] +
                 pfVar37[3] * pfVar20[3] + pfVar38[3] * pfVar21[3] +
                 pfVar39[3] * pfVar30[3] + pfVar40[3] * pfVar22[3] + pfVar41[3] * pfVar23[3] +
                 pfVar42[3] * pfVar24[3] + pfVar43[3] * pfVar25[3] + pfVar44[3] * pfVar31[3] +
                 pfVar45[3] * pfVar26[3] + pfVar46[3] * pfVar27[3] + pfVar47[3] * pfVar28[3] +
                 auVar443._12_4_ * pfVar29[3];
            *pauVar313 = auVar355;
            pauVar313 = pauVar313 + 1;
            lVar306 = lVar306 + 0x20;
          }
          piVar317 = (pointer)((long)piVar317 + lVar306 + lVar308);
          piVar321 = (pointer)((long)piVar321 + lVar306 + lVar308);
          pvVar322 = (void *)((long)pvVar322 + lVar306 + lVar308);
          pvVar298 = (void *)((long)pvVar298 + lVar306 + lVar308);
          piVar324 = (pointer)((long)piVar324 + lVar306 + lVar308);
        }
      }
      goto LAB_003b5cf8;
    }
    uVar303 = auVar52._4_4_ * auVar52._0_4_;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(long)(int)uVar303,(allocator_type *)&opt_p);
    iVar289 = (this->super_ConvolutionDepthWise).dilation_h;
    iVar293 = (this->super_ConvolutionDepthWise).kernel_w;
    iVar290 = (this->super_ConvolutionDepthWise).dilation_w * iVar293;
    lVar308 = 0;
    iVar297 = 0;
    for (iVar305 = 0; iVar305 < (this->super_ConvolutionDepthWise).kernel_h; iVar305 = iVar305 + 1)
    {
      for (lVar306 = 0; (int)lVar306 < iVar293; lVar306 = lVar306 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar308 + lVar306] = iVar297;
        iVar297 = iVar297 + (this->super_ConvolutionDepthWise).dilation_w;
        iVar293 = (this->super_ConvolutionDepthWise).kernel_w;
      }
      iVar297 = iVar297 + (iVar284 * iVar289 - iVar290);
      lVar308 = (int)lVar308 + lVar306;
    }
    local_298._0_4_ = (float)(uVar303 * 4);
    piVar324 = (pointer)0x0;
    piVar321 = (pointer)(ulong)uVar303;
    if ((int)uVar303 < 1) {
      piVar321 = piVar324;
    }
    iVar289 = (int)local_308;
    local_308 = (pointer)((ulong)local_308 & 0xffffffff);
    if (iVar289 < 1) {
      local_308 = piVar324;
    }
    auVar342 = ZEXT1664((undefined1  [16])0x0);
    auVar363 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
    auVar435._8_4_ = 0x3f800000;
    auVar435._0_8_ = 0x3f8000003f800000;
    auVar435._12_4_ = 0x3f800000;
    piVar317 = (pointer)0x0;
    while (piVar328 = piVar317, piVar328 != local_308) {
      pvVar315 = (void *)(top_blob->cstep * (long)piVar328 * top_blob->elemsize +
                         (long)top_blob->data);
      pvVar322 = (this->weight_data_tm).data;
      for (iVar289 = 0; iVar289 <= iVar309; iVar289 = iVar289 + 1) {
        for (lVar308 = 0; lVar308 <= iVar304; lVar308 = lVar308 + 1) {
          if ((this->super_ConvolutionDepthWise).bias_term == 0) {
            auVar356 = ZEXT816(0) << 0x40;
          }
          else {
            auVar356 = *(undefined1 (*) [16])
                        ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                        (long)piVar328 * 0x10);
          }
          lVar306 = 0;
          while( true ) {
            fVar347 = auVar356._0_4_;
            fVar364 = auVar356._4_4_;
            fVar365 = auVar356._8_4_;
            fVar366 = auVar356._12_4_;
            if ((long)piVar321 * 4 == lVar306) break;
            pfVar314 = (float *)((long)pvVar322 + lVar306 * 4 + (long)(int)piVar324 * 4);
            pfVar319 = (float *)((long)local_368.data +
                                (long)*(int *)((long)_space_ofs.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start +
                                              lVar306) * 0x10 +
                                (long)((this->super_ConvolutionDepthWise).stride_w * (int)lVar308 *
                                      4) * 4 +
                                (long)iVar289 * (long)(this->super_ConvolutionDepthWise).stride_h *
                                (long)local_368.w *
                                CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) +
                                local_368.cstep * (long)piVar328 *
                                CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize));
            auVar356._0_4_ = *pfVar314 * *pfVar319 + fVar347;
            auVar356._4_4_ = pfVar314[1] * pfVar319[1] + fVar364;
            auVar356._8_4_ = pfVar314[2] * pfVar319[2] + fVar365;
            auVar356._12_4_ = pfVar314[3] * pfVar319[3] + fVar366;
            lVar306 = lVar306 + 4;
          }
          iVar293 = (this->super_ConvolutionDepthWise).activation_type;
          auVar450 = auVar356;
          if (5 < iVar293 - 1U) goto switchD_003b5fd4_caseD_1;
          auVar443 = auVar342._0_16_;
          auVar450 = vmaxps_avx(auVar356,auVar443);
          fVar512 = auVar363._4_4_;
          fVar513 = auVar363._8_4_;
          fVar514 = auVar363._12_4_;
          fVar511 = auVar363._0_4_;
          switch(iVar293) {
          case 2:
            auVar443 = vminps_avx(auVar356,auVar443);
            fVar347 = *(this->super_ConvolutionDepthWise).activation_params.data;
            auVar441._0_4_ = fVar347 * auVar443._0_4_ + auVar450._0_4_;
            auVar441._4_4_ = fVar347 * auVar443._4_4_ + auVar450._4_4_;
            auVar441._8_4_ = fVar347 * auVar443._8_4_ + auVar450._8_4_;
            auVar441._12_4_ = fVar347 * auVar443._12_4_ + auVar450._12_4_;
            auVar450 = auVar441;
            break;
          case 3:
            puVar58 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
            uVar50 = *puVar58;
            auVar447._4_4_ = uVar50;
            auVar447._0_4_ = uVar50;
            auVar447._8_4_ = uVar50;
            auVar447._12_4_ = uVar50;
            uVar50 = puVar58[1];
            auVar509._4_4_ = uVar50;
            auVar509._0_4_ = uVar50;
            auVar509._8_4_ = uVar50;
            auVar509._12_4_ = uVar50;
            auVar443 = vmaxps_avx(auVar356,auVar447);
            auVar450 = vminps_avx(auVar509,auVar443);
            break;
          case 4:
            auVar357._0_8_ = auVar356._0_8_ ^ 0x8000000080000000;
            auVar357._8_4_ = -fVar365;
            auVar357._12_4_ = -fVar366;
            auVar375._8_4_ = 0x42b0c0a5;
            auVar375._0_8_ = 0x42b0c0a542b0c0a5;
            auVar375._12_4_ = 0x42b0c0a5;
            auVar443 = vminps_avx(auVar357,auVar375);
            auVar376._8_4_ = 0xc2b0c0a5;
            auVar376._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar376._12_4_ = 0xc2b0c0a5;
            auVar352 = vmaxps_avx(auVar443,auVar376);
            auVar448._0_4_ = auVar352._0_4_ * 1.442695 + fVar511;
            auVar448._4_4_ = auVar352._4_4_ * 1.442695 + fVar512;
            auVar448._8_4_ = auVar352._8_4_ * 1.442695 + fVar513;
            auVar448._12_4_ = auVar352._12_4_ * 1.442695 + fVar514;
            auVar510._0_4_ = (int)auVar448._0_4_;
            auVar510._4_4_ = (int)auVar448._4_4_;
            auVar510._8_4_ = (int)auVar448._8_4_;
            auVar510._12_4_ = (int)auVar448._12_4_;
            auVar504 = vcvtdq2ps_avx(auVar510);
            auVar443 = vcmpps_avx(auVar448,auVar504,1);
            auVar443 = vandps_avx(auVar443,auVar435);
            auVar443 = vsubps_avx(auVar504,auVar443);
            fVar347 = auVar443._0_4_ * -0.6931472 + auVar352._0_4_;
            fVar364 = auVar443._4_4_ * -0.6931472 + auVar352._4_4_;
            fVar365 = auVar443._8_4_ * -0.6931472 + auVar352._8_4_;
            fVar366 = auVar443._12_4_ * -0.6931472 + auVar352._12_4_;
            auVar449._0_4_ = (int)auVar443._0_4_;
            auVar449._4_4_ = (int)auVar443._4_4_;
            auVar449._8_4_ = (int)auVar443._8_4_;
            auVar449._12_4_ = (int)auVar443._12_4_;
            auVar443 = vpslld_avx(auVar449,0x17);
            auVar443 = vpaddd_avx(auVar443,auVar435);
            auVar358._0_4_ =
                 (fVar347 * fVar347 *
                  (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                    0.041665796) * fVar347 + 0.16666666) * fVar347 + fVar511) + fVar347 + 1.0) *
                 auVar443._0_4_ + 1.0;
            auVar358._4_4_ =
                 (fVar364 * fVar364 *
                  (((((fVar364 * 0.00019875691 + 0.0013981999) * fVar364 + 0.008333452) * fVar364 +
                    0.041665796) * fVar364 + 0.16666666) * fVar364 + fVar512) + fVar364 + 1.0) *
                 auVar443._4_4_ + 1.0;
            auVar358._8_4_ =
                 (fVar365 * fVar365 *
                  (((((fVar365 * 0.00019875691 + 0.0013981999) * fVar365 + 0.008333452) * fVar365 +
                    0.041665796) * fVar365 + 0.16666666) * fVar365 + fVar513) + fVar365 + 1.0) *
                 auVar443._8_4_ + 1.0;
            auVar358._12_4_ =
                 (fVar366 * fVar366 *
                  (((((fVar366 * 0.00019875691 + 0.0013981999) * fVar366 + 0.008333452) * fVar366 +
                    0.041665796) * fVar366 + 0.16666666) * fVar366 + fVar514) + fVar366 + 1.0) *
                 auVar443._12_4_ + 1.0;
            auVar450 = vdivps_avx(auVar435,auVar358);
            break;
          case 5:
            auVar424._8_4_ = 0x42b0c0a5;
            auVar424._0_8_ = 0x42b0c0a542b0c0a5;
            auVar424._12_4_ = 0x42b0c0a5;
            auVar443 = vminps_avx(auVar356,auVar424);
            auVar467._8_4_ = 0xc2b0c0a5;
            auVar467._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar467._12_4_ = 0xc2b0c0a5;
            auVar352 = vmaxps_avx(auVar467,auVar443);
            auVar503._0_4_ = auVar352._0_4_ * 1.442695 + fVar511;
            auVar503._4_4_ = auVar352._4_4_ * 1.442695 + fVar512;
            auVar503._8_4_ = auVar352._8_4_ * 1.442695 + fVar513;
            auVar503._12_4_ = auVar352._12_4_ * 1.442695 + fVar514;
            auVar507._0_4_ = (int)auVar503._0_4_;
            auVar507._4_4_ = (int)auVar503._4_4_;
            auVar507._8_4_ = (int)auVar503._8_4_;
            auVar507._12_4_ = (int)auVar503._12_4_;
            auVar504 = vcvtdq2ps_avx(auVar507);
            auVar443 = vcmpps_avx(auVar503,auVar504,1);
            auVar443 = vandps_avx(auVar443,auVar435);
            auVar443 = vsubps_avx(auVar504,auVar443);
            auVar508._0_4_ = auVar443._0_4_ * 0.6931472;
            auVar508._4_4_ = auVar443._4_4_ * 0.6931472;
            auVar508._8_4_ = auVar443._8_4_ * 0.6931472;
            auVar508._12_4_ = auVar443._12_4_ * 0.6931472;
            auVar504 = vsubps_avx(auVar352,auVar508);
            fVar368 = auVar504._0_4_;
            fVar381 = auVar504._4_4_;
            fVar382 = auVar504._8_4_;
            fVar383 = auVar504._12_4_;
            auVar442._0_4_ = (int)auVar443._0_4_;
            auVar442._4_4_ = (int)auVar443._4_4_;
            auVar442._8_4_ = (int)auVar443._8_4_;
            auVar442._12_4_ = (int)auVar443._12_4_;
            auVar443 = vpslld_avx(auVar442,0x17);
            auVar443 = vpaddd_avx(auVar443,auVar435);
            auVar444._0_4_ =
                 (fVar368 + 1.0 +
                 fVar368 * fVar368 *
                 (((((fVar368 * 0.00019875691 + 0.0013981999) * fVar368 + 0.008333452) * fVar368 +
                   0.041665796) * fVar368 + 0.16666666) * fVar368 + fVar511)) * auVar443._0_4_ + 1.0
            ;
            auVar444._4_4_ =
                 (fVar381 + 1.0 +
                 fVar381 * fVar381 *
                 (((((fVar381 * 0.00019875691 + 0.0013981999) * fVar381 + 0.008333452) * fVar381 +
                   0.041665796) * fVar381 + 0.16666666) * fVar381 + fVar512)) * auVar443._4_4_ + 1.0
            ;
            auVar444._8_4_ =
                 (fVar382 + 1.0 +
                 fVar382 * fVar382 *
                 (((((fVar382 * 0.00019875691 + 0.0013981999) * fVar382 + 0.008333452) * fVar382 +
                   0.041665796) * fVar382 + 0.16666666) * fVar382 + fVar513)) * auVar443._8_4_ + 1.0
            ;
            auVar444._12_4_ =
                 (fVar383 + 1.0 +
                 fVar383 * fVar383 *
                 (((((fVar383 * 0.00019875691 + 0.0013981999) * fVar383 + 0.008333452) * fVar383 +
                   0.041665796) * fVar383 + 0.16666666) * fVar383 + fVar514)) * auVar443._12_4_ +
                 1.0;
            auVar371._8_4_ = 0x800000;
            auVar371._0_8_ = 0x80000000800000;
            auVar371._12_4_ = 0x800000;
            auVar443 = vmaxps_avx(auVar444,auVar371);
            auVar504 = vpsrld_avx(auVar443,0x17);
            auVar395._8_4_ = 0xffffff82;
            auVar395._0_8_ = 0xffffff82ffffff82;
            auVar395._12_4_ = 0xffffff82;
            auVar504 = vpaddd_avx(auVar504,auVar395);
            auVar396._8_4_ = 0x807fffff;
            auVar396._0_8_ = 0x807fffff807fffff;
            auVar396._12_4_ = 0x807fffff;
            auVar443 = vandps_avx(auVar443,auVar396);
            auVar348 = vorps_avx(auVar443,auVar363._0_16_);
            auVar352 = vcvtdq2ps_avx(auVar504);
            auVar397._8_4_ = 0x3f3504f3;
            auVar397._0_8_ = 0x3f3504f33f3504f3;
            auVar397._12_4_ = 0x3f3504f3;
            auVar504 = vcmpps_avx(auVar348,auVar397,1);
            auVar443 = vandps_avx(auVar504,auVar348);
            fVar368 = auVar348._0_4_ + -1.0 + auVar443._0_4_;
            fVar381 = auVar348._4_4_ + -1.0 + auVar443._4_4_;
            fVar382 = auVar348._8_4_ + -1.0 + auVar443._8_4_;
            fVar383 = auVar348._12_4_ + -1.0 + auVar443._12_4_;
            auVar443 = vandps_avx(auVar504,auVar435);
            auVar504 = vsubps_avx(auVar352,auVar443);
            auVar443 = vcmpps_avx(auVar444,_DAT_005381d0,2);
            auVar372._0_4_ =
                 (fVar368 * fVar368 *
                  (((((((((fVar368 * 0.070376836 + -0.1151461) * fVar368 + 0.116769984) * fVar368 +
                        -0.12420141) * fVar368 + 0.14249323) * fVar368 + -0.16668057) * fVar368 +
                     0.20000714) * fVar368 + -0.24999994) * fVar368 + 0.3333333) * fVar368 + -0.5) +
                 auVar504._0_4_ * 0.6931472 + fVar368) * -2.0;
            auVar372._4_4_ =
                 (fVar381 * fVar381 *
                  (((((((((fVar381 * 0.070376836 + -0.1151461) * fVar381 + 0.116769984) * fVar381 +
                        -0.12420141) * fVar381 + 0.14249323) * fVar381 + -0.16668057) * fVar381 +
                     0.20000714) * fVar381 + -0.24999994) * fVar381 + 0.3333333) * fVar381 + -0.5) +
                 auVar504._4_4_ * 0.6931472 + fVar381) * -2.0;
            auVar372._8_4_ =
                 (fVar382 * fVar382 *
                  (((((((((fVar382 * 0.070376836 + -0.1151461) * fVar382 + 0.116769984) * fVar382 +
                        -0.12420141) * fVar382 + 0.14249323) * fVar382 + -0.16668057) * fVar382 +
                     0.20000714) * fVar382 + -0.24999994) * fVar382 + 0.3333333) * fVar382 + -0.5) +
                 auVar504._8_4_ * 0.6931472 + fVar382) * -2.0;
            auVar372._12_4_ =
                 (fVar383 * fVar383 *
                  (((((((((fVar383 * 0.070376836 + -0.1151461) * fVar383 + 0.116769984) * fVar383 +
                        -0.12420141) * fVar383 + 0.14249323) * fVar383 + -0.16668057) * fVar383 +
                     0.20000714) * fVar383 + -0.24999994) * fVar383 + 0.3333333) * fVar383 + -0.5) +
                 auVar504._12_4_ * 0.6931472 + fVar383) * -2.0;
            auVar398._8_4_ = 0x7fffffff;
            auVar398._0_8_ = 0x7fffffff7fffffff;
            auVar398._12_4_ = 0x7fffffff;
            auVar443 = vblendvps_avx(auVar372,auVar398,auVar443);
            auVar399._8_4_ = 0x42b0c0a5;
            auVar399._0_8_ = 0x42b0c0a542b0c0a5;
            auVar399._12_4_ = 0x42b0c0a5;
            auVar443 = vminps_avx(auVar443,auVar399);
            auVar400._8_4_ = 0xc2b0c0a5;
            auVar400._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar400._12_4_ = 0xc2b0c0a5;
            auVar352 = vmaxps_avx(auVar443,auVar400);
            auVar401._0_4_ = auVar352._0_4_ * 1.442695 + fVar511;
            auVar401._4_4_ = auVar352._4_4_ * 1.442695 + fVar512;
            auVar401._8_4_ = auVar352._8_4_ * 1.442695 + fVar513;
            auVar401._12_4_ = auVar352._12_4_ * 1.442695 + fVar514;
            auVar445._0_4_ = (int)auVar401._0_4_;
            auVar445._4_4_ = (int)auVar401._4_4_;
            auVar445._8_4_ = (int)auVar401._8_4_;
            auVar445._12_4_ = (int)auVar401._12_4_;
            auVar504 = vcvtdq2ps_avx(auVar445);
            auVar443 = vcmpps_avx(auVar401,auVar504,1);
            auVar443 = vandps_avx(auVar443,auVar435);
            auVar443 = vsubps_avx(auVar504,auVar443);
            auVar446._0_4_ = auVar443._0_4_ * 0.6931472;
            auVar446._4_4_ = auVar443._4_4_ * 0.6931472;
            auVar446._8_4_ = auVar443._8_4_ * 0.6931472;
            auVar446._12_4_ = auVar443._12_4_ * 0.6931472;
            auVar504 = vsubps_avx(auVar352,auVar446);
            fVar368 = auVar504._0_4_;
            fVar381 = auVar504._4_4_;
            fVar382 = auVar504._8_4_;
            fVar383 = auVar504._12_4_;
            auVar363 = ZEXT1664(auVar363._0_16_);
            auVar342 = ZEXT864(0) << 0x20;
            auVar402._0_4_ = (int)auVar443._0_4_;
            auVar402._4_4_ = (int)auVar443._4_4_;
            auVar402._8_4_ = (int)auVar443._8_4_;
            auVar402._12_4_ = (int)auVar443._12_4_;
            auVar443 = vpslld_avx(auVar402,0x17);
            auVar443 = vpaddd_avx(auVar443,auVar435);
            auVar373._0_4_ =
                 (fVar368 + 1.0 +
                 (((((fVar368 * 0.00019875691 + 0.0013981999) * fVar368 + 0.008333452) * fVar368 +
                   0.041665796) * fVar368 + 0.16666666) * fVar368 + fVar511) * fVar368 * fVar368) *
                 auVar443._0_4_ + 1.0;
            auVar373._4_4_ =
                 (fVar381 + 1.0 +
                 (((((fVar381 * 0.00019875691 + 0.0013981999) * fVar381 + 0.008333452) * fVar381 +
                   0.041665796) * fVar381 + 0.16666666) * fVar381 + fVar512) * fVar381 * fVar381) *
                 auVar443._4_4_ + 1.0;
            auVar373._8_4_ =
                 (fVar382 + 1.0 +
                 (((((fVar382 * 0.00019875691 + 0.0013981999) * fVar382 + 0.008333452) * fVar382 +
                   0.041665796) * fVar382 + 0.16666666) * fVar382 + fVar513) * fVar382 * fVar382) *
                 auVar443._8_4_ + 1.0;
            auVar373._12_4_ =
                 (fVar383 + 1.0 +
                 (((((fVar383 * 0.00019875691 + 0.0013981999) * fVar383 + 0.008333452) * fVar383 +
                   0.041665796) * fVar383 + 0.16666666) * fVar383 + fVar514) * fVar383 * fVar383) *
                 auVar443._12_4_ + 1.0;
            auVar403._8_4_ = 0x40000000;
            auVar403._0_8_ = 0x4000000040000000;
            auVar403._12_4_ = 0x40000000;
            auVar443 = vdivps_avx(auVar403,auVar373);
            auVar374._0_4_ = auVar443._0_4_ + -1.0;
            auVar374._4_4_ = auVar443._4_4_ + -1.0;
            auVar374._8_4_ = auVar443._8_4_ + -1.0;
            auVar374._12_4_ = auVar443._12_4_ + -1.0;
            goto LAB_003b63af;
          case 6:
            pfVar314 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
            fVar511 = *pfVar314;
            fVar512 = pfVar314[1];
            auVar377._0_4_ = fVar511 * fVar347 + fVar512;
            auVar377._4_4_ = fVar511 * fVar364 + fVar512;
            auVar377._8_4_ = fVar511 * fVar365 + fVar512;
            auVar377._12_4_ = fVar511 * fVar366 + fVar512;
            auVar443 = vmaxps_avx(auVar377,auVar443);
            auVar374 = vminps_avx(auVar443,auVar435);
LAB_003b63af:
            auVar450._0_4_ = auVar374._0_4_ * fVar347;
            auVar450._4_4_ = auVar374._4_4_ * fVar364;
            auVar450._8_4_ = auVar374._8_4_ * fVar365;
            auVar450._12_4_ = auVar374._12_4_ * fVar366;
          }
switchD_003b5fd4_caseD_1:
          *(undefined1 (*) [16])((long)pvVar315 + lVar308 * 0x10) = auVar450;
        }
        pvVar315 = (void *)((long)pvVar315 + (long)(int)(local_2c8._0_4_ << 2) * 4);
      }
      piVar324 = (pointer)(ulong)(uint)((int)piVar324 + (int)(float)local_298);
      local_2e8 = piVar328;
      piVar317 = (pointer)((long)piVar328 + 1);
    }
LAB_003b6585:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  iVar297 = 0;
LAB_003b666a:
  piVar55 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
  if (piVar55 != (int *)0x0) {
    LOCK();
    *piVar55 = *piVar55 + -1;
    UNLOCK();
    if (*piVar55 == 0) {
      if (local_368.allocator == (Allocator *)0x0) {
        free(local_368.data);
      }
      else {
        (*(local_368.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar297;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}